

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Primitive PVar22;
  Geometry *pGVar23;
  __int_type_conflict _Var24;
  long lVar25;
  RTCRayQueryContext *pRVar26;
  RTCFilterFunctionN p_Var27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  ulong uVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  byte bVar105;
  uint uVar106;
  undefined1 (*pauVar107) [32];
  ulong uVar108;
  uint uVar109;
  uint uVar110;
  int iVar111;
  ulong uVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  bool bVar116;
  bool bVar117;
  float fVar118;
  float fVar144;
  float fVar145;
  __m128 a;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar146;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar121 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar147;
  float fVar179;
  float fVar181;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar186;
  float fVar188;
  float fVar189;
  undefined1 auVar163 [32];
  float fVar148;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar187;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar190;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar217;
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar204 [32];
  float fVar223;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar219;
  float fVar224;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar225;
  float fVar249;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [28];
  float fVar248;
  float fVar250;
  float fVar251;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar252;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar253;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar254;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar261 [28];
  float fVar271;
  float fVar273;
  float fVar275;
  undefined1 auVar262 [32];
  float fVar272;
  float fVar274;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar260 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar276;
  float fVar285;
  float fVar286;
  undefined1 auVar277 [16];
  float fVar287;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar291;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar302;
  float fVar303;
  float fVar305;
  float fVar306;
  float fVar308;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar304;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar307;
  float fVar309;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar310;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar324;
  float fVar325;
  float fVar329;
  float fVar331;
  float fVar333;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar327;
  float fVar335;
  undefined1 auVar318 [32];
  float fVar326;
  float fVar328;
  float fVar330;
  float fVar332;
  float fVar334;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar336;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [64];
  float s;
  float fVar352;
  float fVar358;
  float fVar359;
  float fVar361;
  float fVar363;
  float fVar365;
  float fVar367;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar360;
  float fVar362;
  float fVar364;
  float fVar366;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar357 [32];
  float fVar371;
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  float fVar382;
  float fVar383;
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar385 [16];
  float fVar384;
  float fVar393;
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  float fVar394;
  undefined1 auVar391 [32];
  undefined1 auVar392 [64];
  undefined1 auVar399 [16];
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float in_register_0000151c;
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  undefined1 auVar434 [16];
  float fVar440;
  float fVar444;
  float fVar453;
  float fVar456;
  float fVar459;
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  float fVar441;
  float fVar442;
  float fVar443;
  float fVar445;
  float fVar446;
  float fVar448;
  float fVar449;
  float fVar450;
  float fVar451;
  float fVar454;
  float fVar455;
  float fVar457;
  float fVar458;
  float fVar460;
  float fVar461;
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  float fVar447;
  float fVar452;
  float fVar462;
  undefined1 auVar439 [32];
  undefined1 auVar463 [16];
  float in_register_0000159c;
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  float in_register_000015dc;
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_ce4;
  undefined1 local_ca0 [8];
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 (*local_a70) [16];
  undefined1 (*local_a68) [16];
  uint *local_a60;
  ulong local_a58;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [16];
  undefined1 auStack_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  RTCHitN local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  uint local_5c0;
  uint uStack_5bc;
  uint uStack_5b8;
  uint uStack_5b4;
  uint uStack_5b0;
  uint uStack_5ac;
  uint uStack_5a8;
  uint uStack_5a4;
  uint local_5a0;
  uint uStack_59c;
  uint uStack_598;
  uint uStack_594;
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar22 = prim[1];
  uVar112 = (ulong)(byte)PVar22;
  lVar115 = uVar112 * 0x25;
  auVar152 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar152 = vsubps_avx(auVar152,*(undefined1 (*) [16])(prim + lVar115 + 6));
  fVar225 = *(float *)(prim + lVar115 + 0x12);
  auVar149._0_4_ = fVar225 * auVar152._0_4_;
  auVar149._4_4_ = fVar225 * auVar152._4_4_;
  auVar149._8_4_ = fVar225 * auVar152._8_4_;
  auVar149._12_4_ = fVar225 * auVar152._12_4_;
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 4 + 6)));
  auVar277._0_4_ = fVar225 * auVar33._0_4_;
  auVar277._4_4_ = fVar225 * auVar33._4_4_;
  auVar277._8_4_ = fVar225 * auVar33._8_4_;
  auVar277._12_4_ = fVar225 * auVar33._12_4_;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 4 + 10)));
  auVar128._16_16_ = auVar33;
  auVar128._0_16_ = auVar152;
  auVar128 = vcvtdq2ps_avx(auVar128);
  lVar25 = uVar112 * 5;
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar25 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar25 + 10)));
  auVar204._16_16_ = auVar33;
  auVar204._0_16_ = auVar152;
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 6 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 6 + 10)));
  auVar175 = vcvtdq2ps_avx(auVar204);
  auVar239._16_16_ = auVar33;
  auVar239._0_16_ = auVar152;
  auVar28 = vcvtdq2ps_avx(auVar239);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 0xf + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 0xf + 10)));
  auVar240._16_16_ = auVar33;
  auVar240._0_16_ = auVar152;
  auVar29 = vcvtdq2ps_avx(auVar240);
  lVar113 = (ulong)(byte)PVar22 * 0x10;
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar113 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar113 + 10)));
  auVar295._16_16_ = auVar33;
  auVar295._0_16_ = auVar152;
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar113 + uVar112 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar295);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar113 + uVar112 + 10)));
  auVar313._16_16_ = auVar33;
  auVar313._0_16_ = auVar152;
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 0x1a + 6)));
  auVar166 = vcvtdq2ps_avx(auVar313);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 0x1a + 10)));
  auVar314._16_16_ = auVar33;
  auVar314._0_16_ = auVar152;
  auVar31 = vcvtdq2ps_avx(auVar314);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 0x1b + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 0x1b + 10)));
  auVar353._16_16_ = auVar33;
  auVar353._0_16_ = auVar152;
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 0x1c + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 * 0x1c + 10)));
  auVar32 = vcvtdq2ps_avx(auVar353);
  auVar374._16_16_ = auVar33;
  auVar374._0_16_ = auVar152;
  auVar244 = vcvtdq2ps_avx(auVar374);
  auVar152 = vshufps_avx(auVar277,auVar277,0);
  auVar33 = vshufps_avx(auVar277,auVar277,0x55);
  auVar36 = vshufps_avx(auVar277,auVar277,0xaa);
  fVar225 = auVar36._0_4_;
  fVar148 = auVar36._4_4_;
  fVar248 = auVar36._8_4_;
  fVar182 = auVar36._12_4_;
  fVar223 = auVar33._0_4_;
  fVar186 = auVar33._4_4_;
  fVar249 = auVar33._8_4_;
  fVar146 = auVar33._12_4_;
  fVar250 = auVar152._0_4_;
  fVar251 = auVar152._4_4_;
  fVar252 = auVar152._8_4_;
  fVar254 = auVar152._12_4_;
  auVar400._0_4_ = fVar250 * auVar128._0_4_ + fVar223 * auVar175._0_4_ + fVar225 * auVar28._0_4_;
  auVar400._4_4_ = fVar251 * auVar128._4_4_ + fVar186 * auVar175._4_4_ + fVar148 * auVar28._4_4_;
  auVar400._8_4_ = fVar252 * auVar128._8_4_ + fVar249 * auVar175._8_4_ + fVar248 * auVar28._8_4_;
  auVar400._12_4_ = fVar254 * auVar128._12_4_ + fVar146 * auVar175._12_4_ + fVar182 * auVar28._12_4_
  ;
  auVar400._16_4_ = fVar250 * auVar128._16_4_ + fVar223 * auVar175._16_4_ + fVar225 * auVar28._16_4_
  ;
  auVar400._20_4_ = fVar251 * auVar128._20_4_ + fVar186 * auVar175._20_4_ + fVar148 * auVar28._20_4_
  ;
  auVar400._24_4_ = fVar252 * auVar128._24_4_ + fVar249 * auVar175._24_4_ + fVar248 * auVar28._24_4_
  ;
  auVar400._28_4_ = fVar146 + in_register_000015dc + in_register_0000151c;
  auVar386._0_4_ = fVar250 * auVar29._0_4_ + fVar223 * auVar30._0_4_ + auVar166._0_4_ * fVar225;
  auVar386._4_4_ = fVar251 * auVar29._4_4_ + fVar186 * auVar30._4_4_ + auVar166._4_4_ * fVar148;
  auVar386._8_4_ = fVar252 * auVar29._8_4_ + fVar249 * auVar30._8_4_ + auVar166._8_4_ * fVar248;
  auVar386._12_4_ = fVar254 * auVar29._12_4_ + fVar146 * auVar30._12_4_ + auVar166._12_4_ * fVar182;
  auVar386._16_4_ = fVar250 * auVar29._16_4_ + fVar223 * auVar30._16_4_ + auVar166._16_4_ * fVar225;
  auVar386._20_4_ = fVar251 * auVar29._20_4_ + fVar186 * auVar30._20_4_ + auVar166._20_4_ * fVar148;
  auVar386._24_4_ = fVar252 * auVar29._24_4_ + fVar249 * auVar30._24_4_ + auVar166._24_4_ * fVar248;
  auVar386._28_4_ = fVar146 + in_register_000015dc + in_register_0000159c;
  auVar281._0_4_ = fVar250 * auVar31._0_4_ + fVar223 * auVar32._0_4_ + auVar244._0_4_ * fVar225;
  auVar281._4_4_ = fVar251 * auVar31._4_4_ + fVar186 * auVar32._4_4_ + auVar244._4_4_ * fVar148;
  auVar281._8_4_ = fVar252 * auVar31._8_4_ + fVar249 * auVar32._8_4_ + auVar244._8_4_ * fVar248;
  auVar281._12_4_ = fVar254 * auVar31._12_4_ + fVar146 * auVar32._12_4_ + auVar244._12_4_ * fVar182;
  auVar281._16_4_ = fVar250 * auVar31._16_4_ + fVar223 * auVar32._16_4_ + auVar244._16_4_ * fVar225;
  auVar281._20_4_ = fVar251 * auVar31._20_4_ + fVar186 * auVar32._20_4_ + auVar244._20_4_ * fVar148;
  auVar281._24_4_ = fVar252 * auVar31._24_4_ + fVar249 * auVar32._24_4_ + auVar244._24_4_ * fVar248;
  auVar281._28_4_ = fVar254 + fVar146 + fVar182;
  auVar152 = vshufps_avx(auVar149,auVar149,0);
  auVar33 = vshufps_avx(auVar149,auVar149,0x55);
  auVar36 = vshufps_avx(auVar149,auVar149,0xaa);
  fVar225 = auVar36._0_4_;
  fVar148 = auVar36._4_4_;
  fVar248 = auVar36._8_4_;
  fVar182 = auVar36._12_4_;
  fVar251 = auVar33._0_4_;
  fVar252 = auVar33._4_4_;
  fVar254 = auVar33._8_4_;
  fVar268 = auVar33._12_4_;
  fVar223 = auVar175._28_4_ + auVar28._28_4_;
  fVar186 = auVar152._0_4_;
  fVar249 = auVar152._4_4_;
  fVar146 = auVar152._8_4_;
  fVar250 = auVar152._12_4_;
  auVar163._0_4_ = fVar186 * auVar128._0_4_ + fVar251 * auVar175._0_4_ + fVar225 * auVar28._0_4_;
  auVar163._4_4_ = fVar249 * auVar128._4_4_ + fVar252 * auVar175._4_4_ + fVar148 * auVar28._4_4_;
  auVar163._8_4_ = fVar146 * auVar128._8_4_ + fVar254 * auVar175._8_4_ + fVar248 * auVar28._8_4_;
  auVar163._12_4_ = fVar250 * auVar128._12_4_ + fVar268 * auVar175._12_4_ + fVar182 * auVar28._12_4_
  ;
  auVar163._16_4_ = fVar186 * auVar128._16_4_ + fVar251 * auVar175._16_4_ + fVar225 * auVar28._16_4_
  ;
  auVar163._20_4_ = fVar249 * auVar128._20_4_ + fVar252 * auVar175._20_4_ + fVar148 * auVar28._20_4_
  ;
  auVar163._24_4_ = fVar146 * auVar128._24_4_ + fVar254 * auVar175._24_4_ + fVar248 * auVar28._24_4_
  ;
  auVar163._28_4_ = auVar128._28_4_ + fVar223;
  auVar129._0_4_ = fVar186 * auVar29._0_4_ + auVar166._0_4_ * fVar225 + fVar251 * auVar30._0_4_;
  auVar129._4_4_ = fVar249 * auVar29._4_4_ + auVar166._4_4_ * fVar148 + fVar252 * auVar30._4_4_;
  auVar129._8_4_ = fVar146 * auVar29._8_4_ + auVar166._8_4_ * fVar248 + fVar254 * auVar30._8_4_;
  auVar129._12_4_ = fVar250 * auVar29._12_4_ + auVar166._12_4_ * fVar182 + fVar268 * auVar30._12_4_;
  auVar129._16_4_ = fVar186 * auVar29._16_4_ + auVar166._16_4_ * fVar225 + fVar251 * auVar30._16_4_;
  auVar129._20_4_ = fVar249 * auVar29._20_4_ + auVar166._20_4_ * fVar148 + fVar252 * auVar30._20_4_;
  auVar129._24_4_ = fVar146 * auVar29._24_4_ + auVar166._24_4_ * fVar248 + fVar254 * auVar30._24_4_;
  auVar129._28_4_ = auVar128._28_4_ + auVar166._28_4_ + auVar28._28_4_;
  auVar315._8_4_ = 0x7fffffff;
  auVar315._0_8_ = 0x7fffffff7fffffff;
  auVar315._12_4_ = 0x7fffffff;
  auVar315._16_4_ = 0x7fffffff;
  auVar315._20_4_ = 0x7fffffff;
  auVar315._24_4_ = 0x7fffffff;
  auVar315._28_4_ = 0x7fffffff;
  auVar337._8_4_ = 0x219392ef;
  auVar337._0_8_ = 0x219392ef219392ef;
  auVar337._12_4_ = 0x219392ef;
  auVar337._16_4_ = 0x219392ef;
  auVar337._20_4_ = 0x219392ef;
  auVar337._24_4_ = 0x219392ef;
  auVar337._28_4_ = 0x219392ef;
  auVar128 = vandps_avx(auVar400,auVar315);
  auVar128 = vcmpps_avx(auVar128,auVar337,1);
  auVar175 = vblendvps_avx(auVar400,auVar337,auVar128);
  auVar128 = vandps_avx(auVar386,auVar315);
  auVar128 = vcmpps_avx(auVar128,auVar337,1);
  auVar28 = vblendvps_avx(auVar386,auVar337,auVar128);
  auVar128 = vandps_avx(auVar281,auVar315);
  auVar128 = vcmpps_avx(auVar128,auVar337,1);
  auVar128 = vblendvps_avx(auVar281,auVar337,auVar128);
  auVar205._0_4_ = fVar186 * auVar31._0_4_ + fVar251 * auVar32._0_4_ + auVar244._0_4_ * fVar225;
  auVar205._4_4_ = fVar249 * auVar31._4_4_ + fVar252 * auVar32._4_4_ + auVar244._4_4_ * fVar148;
  auVar205._8_4_ = fVar146 * auVar31._8_4_ + fVar254 * auVar32._8_4_ + auVar244._8_4_ * fVar248;
  auVar205._12_4_ = fVar250 * auVar31._12_4_ + fVar268 * auVar32._12_4_ + auVar244._12_4_ * fVar182;
  auVar205._16_4_ = fVar186 * auVar31._16_4_ + fVar251 * auVar32._16_4_ + auVar244._16_4_ * fVar225;
  auVar205._20_4_ = fVar249 * auVar31._20_4_ + fVar252 * auVar32._20_4_ + auVar244._20_4_ * fVar148;
  auVar205._24_4_ = fVar146 * auVar31._24_4_ + fVar254 * auVar32._24_4_ + auVar244._24_4_ * fVar248;
  auVar205._28_4_ = fVar223 + auVar30._28_4_ + fVar182;
  auVar29 = vrcpps_avx(auVar175);
  fVar225 = auVar29._0_4_;
  fVar248 = auVar29._4_4_;
  auVar30._4_4_ = auVar175._4_4_ * fVar248;
  auVar30._0_4_ = auVar175._0_4_ * fVar225;
  fVar223 = auVar29._8_4_;
  auVar30._8_4_ = auVar175._8_4_ * fVar223;
  fVar249 = auVar29._12_4_;
  auVar30._12_4_ = auVar175._12_4_ * fVar249;
  fVar250 = auVar29._16_4_;
  auVar30._16_4_ = auVar175._16_4_ * fVar250;
  fVar251 = auVar29._20_4_;
  auVar30._20_4_ = auVar175._20_4_ * fVar251;
  fVar252 = auVar29._24_4_;
  auVar30._24_4_ = auVar175._24_4_ * fVar252;
  auVar30._28_4_ = auVar175._28_4_;
  auVar338._8_4_ = 0x3f800000;
  auVar338._0_8_ = 0x3f8000003f800000;
  auVar338._12_4_ = 0x3f800000;
  auVar338._16_4_ = 0x3f800000;
  auVar338._20_4_ = 0x3f800000;
  auVar338._24_4_ = 0x3f800000;
  auVar338._28_4_ = 0x3f800000;
  auVar166 = vsubps_avx(auVar338,auVar30);
  auVar30 = vrcpps_avx(auVar28);
  fVar225 = fVar225 + fVar225 * auVar166._0_4_;
  fVar248 = fVar248 + fVar248 * auVar166._4_4_;
  fVar223 = fVar223 + fVar223 * auVar166._8_4_;
  fVar249 = fVar249 + fVar249 * auVar166._12_4_;
  fVar250 = fVar250 + fVar250 * auVar166._16_4_;
  fVar251 = fVar251 + fVar251 * auVar166._20_4_;
  fVar252 = fVar252 + fVar252 * auVar166._24_4_;
  fVar254 = auVar30._0_4_;
  fVar268 = auVar30._4_4_;
  auVar175._4_4_ = fVar268 * auVar28._4_4_;
  auVar175._0_4_ = fVar254 * auVar28._0_4_;
  fVar269 = auVar30._8_4_;
  auVar175._8_4_ = fVar269 * auVar28._8_4_;
  fVar270 = auVar30._12_4_;
  auVar175._12_4_ = fVar270 * auVar28._12_4_;
  fVar271 = auVar30._16_4_;
  auVar175._16_4_ = fVar271 * auVar28._16_4_;
  fVar273 = auVar30._20_4_;
  auVar175._20_4_ = fVar273 * auVar28._20_4_;
  fVar275 = auVar30._24_4_;
  auVar175._24_4_ = fVar275 * auVar28._24_4_;
  auVar175._28_4_ = auVar28._28_4_;
  auVar28 = vsubps_avx(auVar338,auVar175);
  fVar254 = fVar254 + fVar254 * auVar28._0_4_;
  fVar268 = fVar268 + fVar268 * auVar28._4_4_;
  fVar269 = fVar269 + fVar269 * auVar28._8_4_;
  fVar270 = fVar270 + fVar270 * auVar28._12_4_;
  fVar271 = fVar271 + fVar271 * auVar28._16_4_;
  fVar273 = fVar273 + fVar273 * auVar28._20_4_;
  fVar275 = fVar275 + fVar275 * auVar28._24_4_;
  auVar175 = vrcpps_avx(auVar128);
  fVar276 = auVar175._0_4_;
  fVar285 = auVar175._4_4_;
  auVar31._4_4_ = fVar285 * auVar128._4_4_;
  auVar31._0_4_ = fVar276 * auVar128._0_4_;
  fVar286 = auVar175._8_4_;
  auVar31._8_4_ = fVar286 * auVar128._8_4_;
  fVar287 = auVar175._12_4_;
  auVar31._12_4_ = fVar287 * auVar128._12_4_;
  fVar288 = auVar175._16_4_;
  auVar31._16_4_ = fVar288 * auVar128._16_4_;
  fVar289 = auVar175._20_4_;
  auVar31._20_4_ = fVar289 * auVar128._20_4_;
  fVar290 = auVar175._24_4_;
  auVar31._24_4_ = fVar290 * auVar128._24_4_;
  auVar31._28_4_ = auVar128._28_4_;
  auVar128 = vsubps_avx(auVar338,auVar31);
  fVar276 = fVar276 + fVar276 * auVar128._0_4_;
  fVar285 = fVar285 + fVar285 * auVar128._4_4_;
  fVar286 = fVar286 + fVar286 * auVar128._8_4_;
  fVar287 = fVar287 + fVar287 * auVar128._12_4_;
  fVar288 = fVar288 + fVar288 * auVar128._16_4_;
  fVar289 = fVar289 + fVar289 * auVar128._20_4_;
  fVar290 = fVar290 + fVar290 * auVar128._24_4_;
  auVar152 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar115 + 0x16)) *
                           *(float *)(prim + lVar115 + 0x1a)));
  auVar37 = vshufps_avx(auVar152,auVar152,0);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar112 * 7 + 6);
  auVar152 = vpmovsxwd_avx(auVar152);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar112 * 7 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar316._16_16_ = auVar33;
  auVar316._0_16_ = auVar152;
  auVar128 = vcvtdq2ps_avx(auVar316);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar112 * 0xb + 6);
  auVar152 = vpmovsxwd_avx(auVar36);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar112 * 0xb + 0xe);
  auVar33 = vpmovsxwd_avx(auVar9);
  auVar339._16_16_ = auVar33;
  auVar339._0_16_ = auVar152;
  auVar175 = vcvtdq2ps_avx(auVar339);
  auVar175 = vsubps_avx(auVar175,auVar128);
  fVar148 = auVar37._0_4_;
  fVar182 = auVar37._4_4_;
  fVar186 = auVar37._8_4_;
  fVar146 = auVar37._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar112 * 9 + 6);
  auVar152 = vpmovsxwd_avx(auVar37);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar112 * 9 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar201);
  auVar317._0_4_ = auVar175._0_4_ * fVar148 + auVar128._0_4_;
  auVar317._4_4_ = auVar175._4_4_ * fVar182 + auVar128._4_4_;
  auVar317._8_4_ = auVar175._8_4_ * fVar186 + auVar128._8_4_;
  auVar317._12_4_ = auVar175._12_4_ * fVar146 + auVar128._12_4_;
  auVar317._16_4_ = auVar175._16_4_ * fVar148 + auVar128._16_4_;
  auVar317._20_4_ = auVar175._20_4_ * fVar182 + auVar128._20_4_;
  auVar317._24_4_ = auVar175._24_4_ * fVar186 + auVar128._24_4_;
  auVar317._28_4_ = auVar175._28_4_ + auVar128._28_4_;
  auVar340._16_16_ = auVar33;
  auVar340._0_16_ = auVar152;
  auVar128 = vcvtdq2ps_avx(auVar340);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar112 * 0xd + 6);
  auVar152 = vpmovsxwd_avx(auVar198);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + uVar112 * 0xd + 0xe);
  auVar33 = vpmovsxwd_avx(auVar125);
  auVar354._16_16_ = auVar33;
  auVar354._0_16_ = auVar152;
  auVar175 = vcvtdq2ps_avx(auVar354);
  auVar175 = vsubps_avx(auVar175,auVar128);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar112 * 0x12 + 6);
  auVar152 = vpmovsxwd_avx(auVar157);
  auVar385._8_8_ = 0;
  auVar385._0_8_ = *(ulong *)(prim + uVar112 * 0x12 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar385);
  auVar341._0_4_ = auVar128._0_4_ + auVar175._0_4_ * fVar148;
  auVar341._4_4_ = auVar128._4_4_ + auVar175._4_4_ * fVar182;
  auVar341._8_4_ = auVar128._8_4_ + auVar175._8_4_ * fVar186;
  auVar341._12_4_ = auVar128._12_4_ + auVar175._12_4_ * fVar146;
  auVar341._16_4_ = auVar128._16_4_ + auVar175._16_4_ * fVar148;
  auVar341._20_4_ = auVar128._20_4_ + auVar175._20_4_ * fVar182;
  auVar341._24_4_ = auVar128._24_4_ + auVar175._24_4_ * fVar186;
  auVar341._28_4_ = auVar128._28_4_ + auVar175._28_4_;
  auVar355._16_16_ = auVar33;
  auVar355._0_16_ = auVar152;
  auVar128 = vcvtdq2ps_avx(auVar355);
  uVar108 = (ulong)(uint)((int)lVar25 << 2);
  lVar115 = uVar112 * 2 + uVar108;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + lVar115 + 6);
  auVar152 = vpmovsxwd_avx(auVar158);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar115 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar10);
  auVar375._16_16_ = auVar33;
  auVar375._0_16_ = auVar152;
  auVar175 = vcvtdq2ps_avx(auVar375);
  auVar175 = vsubps_avx(auVar175,auVar128);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar108 + 6);
  auVar152 = vpmovsxwd_avx(auVar11);
  auVar356._0_4_ = auVar128._0_4_ + auVar175._0_4_ * fVar148;
  auVar356._4_4_ = auVar128._4_4_ + auVar175._4_4_ * fVar182;
  auVar356._8_4_ = auVar128._8_4_ + auVar175._8_4_ * fVar186;
  auVar356._12_4_ = auVar128._12_4_ + auVar175._12_4_ * fVar146;
  auVar356._16_4_ = auVar128._16_4_ + auVar175._16_4_ * fVar148;
  auVar356._20_4_ = auVar128._20_4_ + auVar175._20_4_ * fVar182;
  auVar356._24_4_ = auVar128._24_4_ + auVar175._24_4_ * fVar186;
  auVar356._28_4_ = auVar128._28_4_ + auVar175._28_4_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar108 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar127);
  auVar376._16_16_ = auVar33;
  auVar376._0_16_ = auVar152;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar112 * 0x18 + 6);
  auVar152 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar112 * 0x18 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar13);
  auVar128 = vcvtdq2ps_avx(auVar376);
  auVar387._16_16_ = auVar33;
  auVar387._0_16_ = auVar152;
  auVar175 = vcvtdq2ps_avx(auVar387);
  auVar175 = vsubps_avx(auVar175,auVar128);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar112 * 0x1d + 6);
  auVar152 = vpmovsxwd_avx(auVar14);
  auVar377._0_4_ = auVar128._0_4_ + auVar175._0_4_ * fVar148;
  auVar377._4_4_ = auVar128._4_4_ + auVar175._4_4_ * fVar182;
  auVar377._8_4_ = auVar128._8_4_ + auVar175._8_4_ * fVar186;
  auVar377._12_4_ = auVar128._12_4_ + auVar175._12_4_ * fVar146;
  auVar377._16_4_ = auVar128._16_4_ + auVar175._16_4_ * fVar148;
  auVar377._20_4_ = auVar128._20_4_ + auVar175._20_4_ * fVar182;
  auVar377._24_4_ = auVar128._24_4_ + auVar175._24_4_ * fVar186;
  auVar377._28_4_ = auVar128._28_4_ + auVar175._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar112 * 0x1d + 0xe);
  auVar33 = vpmovsxwd_avx(auVar15);
  lVar115 = uVar112 + (ulong)(byte)PVar22 * 0x20;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar115 + 6);
  auVar36 = vpmovsxwd_avx(auVar16);
  auVar388._16_16_ = auVar33;
  auVar388._0_16_ = auVar152;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar115 + 0xe);
  auVar152 = vpmovsxwd_avx(auVar17);
  auVar401._16_16_ = auVar152;
  auVar401._0_16_ = auVar36;
  auVar128 = vcvtdq2ps_avx(auVar388);
  auVar175 = vcvtdq2ps_avx(auVar401);
  auVar175 = vsubps_avx(auVar175,auVar128);
  auVar389._0_4_ = auVar128._0_4_ + auVar175._0_4_ * fVar148;
  auVar389._4_4_ = auVar128._4_4_ + auVar175._4_4_ * fVar182;
  auVar389._8_4_ = auVar128._8_4_ + auVar175._8_4_ * fVar186;
  auVar389._12_4_ = auVar128._12_4_ + auVar175._12_4_ * fVar146;
  auVar389._16_4_ = auVar128._16_4_ + auVar175._16_4_ * fVar148;
  auVar389._20_4_ = auVar128._20_4_ + auVar175._20_4_ * fVar182;
  auVar389._24_4_ = auVar128._24_4_ + auVar175._24_4_ * fVar186;
  auVar389._28_4_ = auVar128._28_4_ + auVar175._28_4_;
  lVar115 = (ulong)(byte)PVar22 * 0x20 - uVar112;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar115 + 6);
  auVar152 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar115 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar19);
  auVar402._16_16_ = auVar33;
  auVar402._0_16_ = auVar152;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar112 * 0x23 + 6);
  auVar152 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar112 * 0x23 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar21);
  auVar435._16_16_ = auVar33;
  auVar435._0_16_ = auVar152;
  auVar128 = vcvtdq2ps_avx(auVar402);
  auVar175 = vcvtdq2ps_avx(auVar435);
  auVar175 = vsubps_avx(auVar175,auVar128);
  auVar403._0_4_ = auVar128._0_4_ + auVar175._0_4_ * fVar148;
  auVar403._4_4_ = auVar128._4_4_ + auVar175._4_4_ * fVar182;
  auVar403._8_4_ = auVar128._8_4_ + auVar175._8_4_ * fVar186;
  auVar403._12_4_ = auVar128._12_4_ + auVar175._12_4_ * fVar146;
  auVar403._16_4_ = auVar128._16_4_ + auVar175._16_4_ * fVar148;
  auVar403._20_4_ = auVar128._20_4_ + auVar175._20_4_ * fVar182;
  auVar403._24_4_ = auVar128._24_4_ + auVar175._24_4_ * fVar186;
  auVar403._28_4_ = auVar128._28_4_ + fVar146;
  auVar128 = vsubps_avx(auVar317,auVar163);
  auVar292._0_4_ = fVar225 * auVar128._0_4_;
  auVar292._4_4_ = fVar248 * auVar128._4_4_;
  auVar292._8_4_ = fVar223 * auVar128._8_4_;
  auVar292._12_4_ = fVar249 * auVar128._12_4_;
  auVar32._16_4_ = fVar250 * auVar128._16_4_;
  auVar32._0_16_ = auVar292;
  auVar32._20_4_ = fVar251 * auVar128._20_4_;
  auVar32._24_4_ = fVar252 * auVar128._24_4_;
  auVar32._28_4_ = auVar128._28_4_;
  auVar128 = vsubps_avx(auVar341,auVar163);
  auVar226._0_4_ = fVar225 * auVar128._0_4_;
  auVar226._4_4_ = fVar248 * auVar128._4_4_;
  auVar226._8_4_ = fVar223 * auVar128._8_4_;
  auVar226._12_4_ = fVar249 * auVar128._12_4_;
  auVar244._16_4_ = fVar250 * auVar128._16_4_;
  auVar244._0_16_ = auVar226;
  auVar244._20_4_ = fVar251 * auVar128._20_4_;
  auVar244._24_4_ = fVar252 * auVar128._24_4_;
  auVar244._28_4_ = auVar29._28_4_ + auVar166._28_4_;
  auVar128 = vsubps_avx(auVar356,auVar129);
  auVar150._0_4_ = fVar254 * auVar128._0_4_;
  auVar150._4_4_ = fVar268 * auVar128._4_4_;
  auVar150._8_4_ = fVar269 * auVar128._8_4_;
  auVar150._12_4_ = fVar270 * auVar128._12_4_;
  auVar29._16_4_ = fVar271 * auVar128._16_4_;
  auVar29._0_16_ = auVar150;
  auVar29._20_4_ = fVar273 * auVar128._20_4_;
  auVar29._24_4_ = fVar275 * auVar128._24_4_;
  auVar29._28_4_ = auVar128._28_4_;
  auVar128 = vsubps_avx(auVar377,auVar129);
  auVar255._0_4_ = fVar254 * auVar128._0_4_;
  auVar255._4_4_ = fVar268 * auVar128._4_4_;
  auVar255._8_4_ = fVar269 * auVar128._8_4_;
  auVar255._12_4_ = fVar270 * auVar128._12_4_;
  auVar166._16_4_ = fVar271 * auVar128._16_4_;
  auVar166._0_16_ = auVar255;
  auVar166._20_4_ = fVar273 * auVar128._20_4_;
  auVar166._24_4_ = fVar275 * auVar128._24_4_;
  auVar166._28_4_ = auVar30._28_4_ + auVar28._28_4_;
  auVar128 = vsubps_avx(auVar389,auVar205);
  auVar119._0_4_ = fVar276 * auVar128._0_4_;
  auVar119._4_4_ = fVar285 * auVar128._4_4_;
  auVar119._8_4_ = fVar286 * auVar128._8_4_;
  auVar119._12_4_ = fVar287 * auVar128._12_4_;
  auVar28._16_4_ = fVar288 * auVar128._16_4_;
  auVar28._0_16_ = auVar119;
  auVar28._20_4_ = fVar289 * auVar128._20_4_;
  auVar28._24_4_ = fVar290 * auVar128._24_4_;
  auVar28._28_4_ = auVar128._28_4_;
  auVar128 = vsubps_avx(auVar403,auVar205);
  auVar191._0_4_ = fVar276 * auVar128._0_4_;
  auVar191._4_4_ = fVar285 * auVar128._4_4_;
  auVar191._8_4_ = fVar286 * auVar128._8_4_;
  auVar191._12_4_ = fVar287 * auVar128._12_4_;
  auVar38._16_4_ = fVar288 * auVar128._16_4_;
  auVar38._0_16_ = auVar191;
  auVar38._20_4_ = fVar289 * auVar128._20_4_;
  auVar38._24_4_ = fVar290 * auVar128._24_4_;
  auVar38._28_4_ = auVar128._28_4_;
  auVar152 = vpminsd_avx(auVar32._16_16_,auVar244._16_16_);
  auVar33 = vpminsd_avx(auVar292,auVar226);
  auVar342._16_16_ = auVar152;
  auVar342._0_16_ = auVar33;
  auVar152 = vpminsd_avx(auVar29._16_16_,auVar166._16_16_);
  auVar33 = vpminsd_avx(auVar150,auVar255);
  auVar390._16_16_ = auVar152;
  auVar390._0_16_ = auVar33;
  auVar128 = vmaxps_avx(auVar342,auVar390);
  auVar152 = vpminsd_avx(auVar28._16_16_,auVar38._16_16_);
  auVar33 = vpminsd_avx(auVar119,auVar191);
  auVar436._16_16_ = auVar152;
  auVar436._0_16_ = auVar33;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar464._4_4_ = uVar7;
  auVar464._0_4_ = uVar7;
  auVar464._8_4_ = uVar7;
  auVar464._12_4_ = uVar7;
  auVar464._16_4_ = uVar7;
  auVar464._20_4_ = uVar7;
  auVar464._24_4_ = uVar7;
  auVar464._28_4_ = uVar7;
  auVar175 = vmaxps_avx(auVar436,auVar464);
  auVar128 = vmaxps_avx(auVar128,auVar175);
  local_2e0._4_4_ = auVar128._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar128._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar128._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar128._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar128._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar128._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar128._24_4_ * 0.99999964;
  local_2e0._28_4_ = auVar128._28_4_;
  auVar152 = vpmaxsd_avx(auVar32._16_16_,auVar244._16_16_);
  auVar33 = vpmaxsd_avx(auVar292,auVar226);
  auVar241._16_16_ = auVar152;
  auVar241._0_16_ = auVar33;
  auVar152 = vpmaxsd_avx(auVar29._16_16_,auVar166._16_16_);
  auVar33 = vpmaxsd_avx(auVar150,auVar255);
  auVar164._16_16_ = auVar152;
  auVar164._0_16_ = auVar33;
  auVar128 = vminps_avx(auVar241,auVar164);
  auVar152 = vpmaxsd_avx(auVar28._16_16_,auVar38._16_16_);
  auVar33 = vpmaxsd_avx(auVar119,auVar191);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar206._4_4_ = uVar7;
  auVar206._0_4_ = uVar7;
  auVar206._8_4_ = uVar7;
  auVar206._12_4_ = uVar7;
  auVar206._16_4_ = uVar7;
  auVar206._20_4_ = uVar7;
  auVar206._24_4_ = uVar7;
  auVar206._28_4_ = uVar7;
  auVar130._16_16_ = auVar152;
  auVar130._0_16_ = auVar33;
  auVar175 = vminps_avx(auVar130,auVar206);
  auVar128 = vminps_avx(auVar128,auVar175);
  auVar39._4_4_ = auVar128._4_4_ * 1.0000004;
  auVar39._0_4_ = auVar128._0_4_ * 1.0000004;
  auVar39._8_4_ = auVar128._8_4_ * 1.0000004;
  auVar39._12_4_ = auVar128._12_4_ * 1.0000004;
  auVar39._16_4_ = auVar128._16_4_ * 1.0000004;
  auVar39._20_4_ = auVar128._20_4_ * 1.0000004;
  auVar39._24_4_ = auVar128._24_4_ * 1.0000004;
  auVar39._28_4_ = auVar128._28_4_;
  auVar128 = vcmpps_avx(local_2e0,auVar39,2);
  auVar152 = vpshufd_avx(ZEXT116((byte)PVar22),0);
  auVar165._16_16_ = auVar152;
  auVar165._0_16_ = auVar152;
  auVar175 = vcvtdq2ps_avx(auVar165);
  auVar175 = vcmpps_avx(_DAT_01faff40,auVar175,1);
  auVar128 = vandps_avx(auVar128,auVar175);
  uVar106 = vmovmskps_avx(auVar128);
  if (uVar106 == 0) {
    return false;
  }
  uVar106 = uVar106 & 0xff;
  auVar131._16_16_ = mm_lookupmask_ps._240_16_;
  auVar131._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar131,ZEXT832(0) << 0x20,0x80);
  local_a60 = &local_5c0;
  uVar110 = 1 << ((byte)k & 0x1f);
  local_a68 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar110 & 0xf) << 4));
  local_a70 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar110 >> 4) * 0x10);
  local_8d0 = prim;
LAB_011aefa9:
  local_8c8 = (ulong)uVar106;
  lVar115 = 0;
  if (local_8c8 != 0) {
    for (; (uVar106 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
    }
  }
  local_a58 = (ulong)*(uint *)(local_8d0 + 2);
  pGVar23 = (context->scene->geometries).items[local_a58].ptr;
  uVar112 = (ulong)*(uint *)(*(long *)&pGVar23->field_0x58 +
                            (ulong)*(uint *)(local_8d0 + lVar115 * 4 + 6) *
                            pGVar23[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar225 = (pGVar23->time_range).lower;
  fVar225 = pGVar23->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar225) / ((pGVar23->time_range).upper - fVar225));
  auVar152 = vroundss_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),9);
  auVar152 = vminss_avx(auVar152,ZEXT416((uint)(pGVar23->fnumTimeSegments + -1.0)));
  auVar152 = vmaxss_avx(ZEXT816(0) << 0x20,auVar152);
  fVar225 = fVar225 - auVar152._0_4_;
  _Var24 = pGVar23[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar114 = (long)(int)auVar152._0_4_ * 0x38;
  lVar25 = *(long *)(_Var24 + lVar114);
  lVar113 = *(long *)(_Var24 + 0x10 + lVar114);
  auVar152 = vshufps_avx(ZEXT416((uint)(1.0 - fVar225)),ZEXT416((uint)(1.0 - fVar225)),0);
  pfVar1 = (float *)(lVar25 + lVar113 * uVar112);
  fVar223 = auVar152._0_4_;
  fVar186 = auVar152._4_4_;
  fVar249 = auVar152._8_4_;
  fVar146 = auVar152._12_4_;
  pfVar2 = (float *)(lVar25 + lVar113 * (uVar112 + 1));
  pfVar3 = (float *)(lVar25 + lVar113 * (uVar112 + 2));
  pfVar4 = (float *)(lVar25 + lVar113 * (uVar112 + 3));
  lVar25 = *(long *)(_Var24 + 0x38 + lVar114);
  lVar113 = *(long *)(_Var24 + 0x48 + lVar114);
  auVar152 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
  pfVar5 = (float *)(lVar25 + uVar112 * lVar113);
  fVar250 = auVar152._0_4_;
  fVar251 = auVar152._4_4_;
  fVar252 = auVar152._8_4_;
  fVar254 = auVar152._12_4_;
  pfVar6 = (float *)(lVar25 + (uVar112 + 1) * lVar113);
  auVar256._0_4_ = fVar250 * *pfVar5 + fVar223 * *pfVar1;
  auVar256._4_4_ = fVar251 * pfVar5[1] + fVar186 * pfVar1[1];
  auVar256._8_4_ = fVar252 * pfVar5[2] + fVar249 * pfVar1[2];
  auVar256._12_4_ = fVar254 * pfVar5[3] + fVar146 * pfVar1[3];
  auVar152 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar33 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar225 = *(float *)(ray + k * 4 + 0x80);
  auVar399._4_4_ = fVar225;
  auVar399._0_4_ = fVar225;
  auVar399._8_4_ = fVar225;
  auVar399._12_4_ = fVar225;
  fStack_a90 = fVar225;
  _local_aa0 = auVar399;
  fStack_a8c = fVar225;
  fStack_a88 = fVar225;
  fStack_a84 = fVar225;
  fVar148 = *(float *)(ray + k * 4 + 0xa0);
  auVar434._4_4_ = fVar148;
  auVar434._0_4_ = fVar148;
  auVar434._8_4_ = fVar148;
  auVar434._12_4_ = fVar148;
  fStack_850 = fVar148;
  _local_860 = auVar434;
  fStack_84c = fVar148;
  fStack_848 = fVar148;
  fStack_844 = fVar148;
  auVar278._0_4_ = fVar223 * *pfVar2 + fVar250 * *pfVar6;
  auVar278._4_4_ = fVar186 * pfVar2[1] + fVar251 * pfVar6[1];
  auVar278._8_4_ = fVar249 * pfVar2[2] + fVar252 * pfVar6[2];
  auVar278._12_4_ = fVar146 * pfVar2[3] + fVar254 * pfVar6[3];
  auVar152 = vunpcklps_avx(auVar399,auVar434);
  fVar248 = *(float *)(ray + k * 4 + 0xc0);
  auVar463._4_4_ = fVar248;
  auVar463._0_4_ = fVar248;
  auVar463._8_4_ = fVar248;
  auVar463._12_4_ = fVar248;
  fStack_a10 = fVar248;
  _local_a20 = auVar463;
  fStack_a0c = fVar248;
  fStack_a08 = fVar248;
  fStack_a04 = fVar248;
  _local_950 = vinsertps_avx(auVar152,auVar463,0x28);
  auVar120._0_4_ = (auVar256._0_4_ + auVar278._0_4_) * 0.5;
  auVar120._4_4_ = (auVar256._4_4_ + auVar278._4_4_) * 0.5;
  auVar120._8_4_ = (auVar256._8_4_ + auVar278._8_4_) * 0.5;
  auVar120._12_4_ = (auVar256._12_4_ + auVar278._12_4_) * 0.5;
  auVar152 = vsubps_avx(auVar120,auVar33);
  auVar152 = vdpps_avx(auVar152,_local_950,0x7f);
  local_960 = vdpps_avx(_local_950,_local_950,0x7f);
  auVar392 = ZEXT1664(local_960);
  pfVar1 = (float *)(lVar25 + (uVar112 + 2) * lVar113);
  auVar227._0_4_ = fVar223 * *pfVar3 + fVar250 * *pfVar1;
  auVar227._4_4_ = fVar186 * pfVar3[1] + fVar251 * pfVar1[1];
  auVar227._8_4_ = fVar249 * pfVar3[2] + fVar252 * pfVar1[2];
  auVar227._12_4_ = fVar146 * pfVar3[3] + fVar254 * pfVar1[3];
  auVar36 = vrcpss_avx(local_960,local_960);
  fVar182 = auVar152._0_4_ * (2.0 - local_960._0_4_ * auVar36._0_4_) * auVar36._0_4_;
  auVar345 = ZEXT464((uint)fVar182);
  auVar36 = vshufps_avx(ZEXT416((uint)fVar182),ZEXT416((uint)fVar182),0);
  auVar293._0_4_ = auVar33._0_4_ + local_950._0_4_ * auVar36._0_4_;
  auVar293._4_4_ = auVar33._4_4_ + local_950._4_4_ * auVar36._4_4_;
  auVar293._8_4_ = auVar33._8_4_ + local_950._8_4_ * auVar36._8_4_;
  auVar293._12_4_ = auVar33._12_4_ + local_950._12_4_ * auVar36._12_4_;
  auVar152 = vblendps_avx(auVar293,_DAT_01f7aa10,8);
  _local_b10 = vsubps_avx(auVar256,auVar152);
  _local_b20 = vsubps_avx(auVar227,auVar152);
  pfVar1 = (float *)(lVar25 + lVar113 * (uVar112 + 3));
  auVar151._0_4_ = fVar223 * *pfVar4 + fVar250 * *pfVar1;
  auVar151._4_4_ = fVar186 * pfVar4[1] + fVar251 * pfVar1[1];
  auVar151._8_4_ = fVar249 * pfVar4[2] + fVar252 * pfVar1[2];
  auVar151._12_4_ = fVar146 * pfVar4[3] + fVar254 * pfVar1[3];
  _local_b30 = vsubps_avx(auVar278,auVar152);
  _local_b40 = vsubps_avx(auVar151,auVar152);
  auVar152 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001250 = auVar152;
  _local_3e0 = auVar152;
  auVar152 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001250 = auVar152;
  _local_1e0 = auVar152;
  auVar152 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001250 = auVar152;
  _local_200 = auVar152;
  auVar152 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar152;
  _local_220 = auVar152;
  auVar152 = vshufps_avx(_local_b30,_local_b30,0);
  register0x00001290 = auVar152;
  _local_400 = auVar152;
  auVar152 = vshufps_avx(_local_b30,_local_b30,0x55);
  register0x00001290 = auVar152;
  _local_420 = auVar152;
  auVar152 = vshufps_avx(_local_b30,_local_b30,0xaa);
  register0x00001290 = auVar152;
  _local_440 = auVar152;
  auVar152 = vshufps_avx(_local_b30,_local_b30,0xff);
  register0x00001290 = auVar152;
  _local_460 = auVar152;
  auVar33 = vshufps_avx(_local_b20,_local_b20,0);
  auVar152 = vshufps_avx(_local_b20,_local_b20,0x55);
  register0x00001290 = auVar152;
  _local_480 = auVar152;
  auVar152 = vshufps_avx(_local_b20,_local_b20,0xaa);
  register0x00001290 = auVar152;
  _local_4a0 = auVar152;
  auVar152 = vshufps_avx(_local_b20,_local_b20,0xff);
  register0x00001290 = auVar152;
  _local_4c0 = auVar152;
  auVar9 = vshufps_avx(_local_b40,_local_b40,0);
  auVar37 = vshufps_avx(_local_b40,_local_b40,0x55);
  auVar152 = vshufps_avx(_local_b40,_local_b40,0xaa);
  register0x00001290 = auVar152;
  _local_4e0 = auVar152;
  auVar152 = vshufps_avx(_local_b40,_local_b40,0xff);
  register0x00001290 = auVar152;
  _local_240 = auVar152;
  auVar152 = ZEXT416((uint)(fVar225 * fVar225 + fVar148 * fVar148 + fVar248 * fVar248));
  auVar152 = vshufps_avx(auVar152,auVar152,0);
  local_260._16_16_ = auVar152;
  local_260._0_16_ = auVar152;
  fVar225 = *(float *)(ray + k * 4 + 0x60);
  local_8e0 = ZEXT416((uint)fVar182);
  auVar152 = vshufps_avx(ZEXT416((uint)(fVar225 - fVar182)),ZEXT416((uint)(fVar225 - fVar182)),0);
  local_2c0._16_16_ = auVar152;
  local_2c0._0_16_ = auVar152;
  auVar152 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + 2)),0);
  local_520._16_16_ = auVar152;
  local_520._0_16_ = auVar152;
  auVar152 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + lVar115 * 4 + 6)),0);
  local_540._16_16_ = auVar152;
  local_540._0_16_ = auVar152;
  register0x00001210 = auVar36;
  _local_b00 = auVar36;
  uVar112 = 0;
  bVar116 = false;
  local_ce4 = 1;
  auVar132._8_4_ = 0x7fffffff;
  auVar132._0_8_ = 0x7fffffff7fffffff;
  auVar132._12_4_ = 0x7fffffff;
  auVar132._16_4_ = 0x7fffffff;
  auVar132._20_4_ = 0x7fffffff;
  auVar132._24_4_ = 0x7fffffff;
  auVar132._28_4_ = 0x7fffffff;
  local_500 = vandps_avx(local_260,auVar132);
  auVar152 = vsqrtss_avx(local_960,local_960);
  auVar36 = vsqrtss_avx(local_960,local_960);
  local_6b0 = ZEXT816(0x3f80000000000000);
  do {
    auVar262._8_4_ = 0x3f800000;
    auVar262._0_8_ = 0x3f8000003f800000;
    auVar262._12_4_ = 0x3f800000;
    auVar262._16_4_ = 0x3f800000;
    auVar262._20_4_ = 0x3f800000;
    auVar262._24_4_ = 0x3f800000;
    auVar262._28_4_ = 0x3f800000;
    iVar111 = (int)uVar112;
    auVar201 = vmovshdup_avx(local_6b0);
    auVar125 = vsubps_avx(auVar201,local_6b0);
    auVar201 = vshufps_avx(local_6b0,local_6b0,0);
    local_820._16_16_ = auVar201;
    local_820._0_16_ = auVar201;
    auVar198 = vshufps_avx(auVar125,auVar125,0);
    local_840._16_16_ = auVar198;
    local_840._0_16_ = auVar198;
    fVar147 = auVar198._0_4_;
    fVar179 = auVar198._4_4_;
    fVar181 = auVar198._8_4_;
    fVar184 = auVar198._12_4_;
    fVar118 = auVar201._0_4_;
    auVar242._0_4_ = fVar118 + fVar147 * 0.0;
    fVar144 = auVar201._4_4_;
    auVar242._4_4_ = fVar144 + fVar179 * 0.14285715;
    fVar145 = auVar201._8_4_;
    auVar242._8_4_ = fVar145 + fVar181 * 0.2857143;
    fStack_c84 = auVar201._12_4_;
    auVar242._12_4_ = fStack_c84 + fVar184 * 0.42857146;
    auVar242._16_4_ = fVar118 + fVar147 * 0.5714286;
    auVar242._20_4_ = fVar144 + fVar179 * 0.71428573;
    auVar242._24_4_ = fVar145 + fVar181 * 0.8571429;
    auVar242._28_4_ = fStack_c84 + fVar184;
    auVar128 = vsubps_avx(auVar262,auVar242);
    local_ca0._4_4_ = auVar242._4_4_ * auVar242._4_4_;
    local_ca0._0_4_ = auVar242._0_4_ * auVar242._0_4_;
    fStack_c98 = auVar242._8_4_ * auVar242._8_4_;
    fStack_c94 = auVar242._12_4_ * auVar242._12_4_;
    fStack_c90 = auVar242._16_4_ * auVar242._16_4_;
    fStack_c8c = auVar242._20_4_ * auVar242._20_4_;
    fStack_c88 = auVar242._24_4_ * auVar242._24_4_;
    fVar251 = auVar242._0_4_ * 3.0;
    fVar252 = auVar242._4_4_ * 3.0;
    fVar254 = auVar242._8_4_ * 3.0;
    fVar268 = auVar242._12_4_ * 3.0;
    fVar269 = auVar242._16_4_ * 3.0;
    fVar270 = auVar242._20_4_ * 3.0;
    fVar273 = auVar242._24_4_ * 3.0;
    fVar148 = auVar128._0_4_;
    auVar178._0_4_ = fVar148 * fVar148;
    fVar248 = auVar128._4_4_;
    auVar178._4_4_ = fVar248 * fVar248;
    fVar182 = auVar128._8_4_;
    auVar178._8_4_ = fVar182 * fVar182;
    fVar223 = auVar128._12_4_;
    auVar178._12_4_ = fVar223 * fVar223;
    fVar186 = auVar128._16_4_;
    auVar178._16_4_ = fVar186 * fVar186;
    fVar249 = auVar128._20_4_;
    auVar178._20_4_ = fVar249 * fVar249;
    fVar146 = auVar128._24_4_;
    auVar178._28_36_ = auVar345._28_36_;
    auVar178._24_4_ = fVar146 * fVar146;
    fVar250 = auVar128._28_4_;
    fVar271 = (auVar178._0_4_ * (fVar148 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar275 = (auVar178._4_4_ * (fVar248 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar276 = (auVar178._8_4_ * (fVar182 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar285 = (auVar178._12_4_ * (fVar223 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar286 = (auVar178._16_4_ * (fVar186 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar287 = (auVar178._20_4_ * (fVar249 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar288 = (auVar178._24_4_ * (fVar146 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar289 = -fVar148 * auVar242._0_4_ * auVar242._0_4_ * 0.5;
    fVar290 = -fVar248 * auVar242._4_4_ * auVar242._4_4_ * 0.5;
    fVar359 = -fVar182 * auVar242._8_4_ * auVar242._8_4_ * 0.5;
    fVar361 = -fVar223 * auVar242._12_4_ * auVar242._12_4_ * 0.5;
    fVar363 = -fVar186 * auVar242._16_4_ * auVar242._16_4_ * 0.5;
    fVar365 = -fVar249 * auVar242._20_4_ * auVar242._20_4_ * 0.5;
    fVar367 = -fVar146 * auVar242._24_4_ * auVar242._24_4_ * 0.5;
    fVar371 = auVar9._0_4_;
    fVar382 = auVar9._4_4_;
    fVar383 = auVar9._8_4_;
    fVar447 = auVar9._12_4_;
    fVar452 = auVar37._0_4_;
    fVar272 = auVar37._4_4_;
    fVar274 = auVar37._8_4_;
    fVar412 = auVar37._12_4_;
    fVar462 = auVar33._0_4_;
    fVar440 = auVar33._4_4_;
    fVar307 = auVar33._8_4_;
    fVar448 = auVar33._12_4_;
    fVar394 = auVar392._28_4_ + fVar448;
    fVar431 = (auVar242._0_4_ * auVar242._0_4_ * (fVar251 + -5.0) + 2.0) * 0.5;
    fVar441 = (auVar242._4_4_ * auVar242._4_4_ * (fVar252 + -5.0) + 2.0) * 0.5;
    fVar444 = (auVar242._8_4_ * auVar242._8_4_ * (fVar254 + -5.0) + 2.0) * 0.5;
    fVar449 = (auVar242._12_4_ * auVar242._12_4_ * (fVar268 + -5.0) + 2.0) * 0.5;
    fVar453 = (auVar242._16_4_ * auVar242._16_4_ * (fVar269 + -5.0) + 2.0) * 0.5;
    fVar456 = (auVar242._20_4_ * auVar242._20_4_ * (fVar270 + -5.0) + 2.0) * 0.5;
    fVar459 = (auVar242._24_4_ * auVar242._24_4_ * (fVar273 + -5.0) + 2.0) * 0.5;
    fVar429 = -auVar242._28_4_;
    fVar395 = -auVar242._0_4_ * fVar148 * fVar148 * 0.5;
    fVar404 = -auVar242._4_4_ * fVar248 * fVar248 * 0.5;
    fVar408 = -auVar242._8_4_ * fVar182 * fVar182 * 0.5;
    fVar413 = -auVar242._12_4_ * fVar223 * fVar223 * 0.5;
    fVar417 = -auVar242._16_4_ * fVar186 * fVar186 * 0.5;
    fVar421 = -auVar242._20_4_ * fVar249 * fVar249 * 0.5;
    fVar425 = -auVar242._24_4_ * fVar146 * fVar146 * 0.5;
    local_ac0 = fVar395 * (float)local_3e0._0_4_ +
                fVar431 * (float)local_400._0_4_ + fVar371 * fVar289 + fVar462 * fVar271;
    fStack_abc = fVar404 * (float)local_3e0._4_4_ +
                 fVar441 * (float)local_400._4_4_ + fVar382 * fVar290 + fVar440 * fVar275;
    fStack_ab8 = fVar408 * fStack_3d8 + fVar444 * fStack_3f8 + fVar383 * fVar359 + fVar307 * fVar276
    ;
    fStack_ab4 = fVar413 * fStack_3d4 + fVar449 * fStack_3f4 + fVar447 * fVar361 + fVar448 * fVar285
    ;
    fStack_ab0 = fVar417 * fStack_3d0 + fVar453 * fStack_3f0 + fVar371 * fVar363 + fVar462 * fVar286
    ;
    fStack_aac = fVar421 * fStack_3cc + fVar456 * fStack_3ec + fVar382 * fVar365 + fVar440 * fVar287
    ;
    fStack_aa8 = fVar425 * fStack_3c8 + fVar459 * fStack_3e8 + fVar383 * fVar367 + fVar307 * fVar288
    ;
    fStack_aa4 = fVar448 + 2.0 + -fVar250 + fVar447 + fVar448;
    fVar352 = (float)local_1e0._0_4_ * fVar395 +
              fVar431 * (float)local_420._0_4_ +
              fVar452 * fVar289 + fVar271 * (float)local_480._0_4_;
    fVar358 = (float)local_1e0._4_4_ * fVar404 +
              fVar441 * (float)local_420._4_4_ +
              fVar272 * fVar290 + fVar275 * (float)local_480._4_4_;
    fVar360 = fStack_1d8 * fVar408 + fVar444 * fStack_418 + fVar274 * fVar359 + fVar276 * fStack_478
    ;
    fVar362 = fStack_1d4 * fVar413 + fVar449 * fStack_414 + fVar412 * fVar361 + fVar285 * fStack_474
    ;
    fVar364 = fStack_1d0 * fVar417 + fVar453 * fStack_410 + fVar452 * fVar363 + fVar286 * fStack_470
    ;
    fVar366 = fStack_1cc * fVar421 + fVar456 * fStack_40c + fVar272 * fVar365 + fVar287 * fStack_46c
    ;
    fVar368 = fStack_1c8 * fVar425 + fVar459 * fStack_408 + fVar274 * fVar367 + fVar288 * fStack_468
    ;
    fVar370 = fStack_aa4 + fVar447 + fVar448 + fVar394;
    fVar190 = (float)local_200._0_4_ * fVar395 +
              fVar431 * (float)local_440._0_4_ +
              fVar289 * (float)local_4e0._0_4_ + fVar271 * (float)local_4a0._0_4_;
    fVar217 = (float)local_200._4_4_ * fVar404 +
              fVar441 * (float)local_440._4_4_ +
              fVar290 * (float)local_4e0._4_4_ + fVar275 * (float)local_4a0._4_4_;
    fVar218 = fStack_1f8 * fVar408 +
              fVar444 * fStack_438 + fVar359 * fStack_4d8 + fVar276 * fStack_498;
    fVar219 = fStack_1f4 * fVar413 +
              fVar449 * fStack_434 + fVar361 * fStack_4d4 + fVar285 * fStack_494;
    fVar220 = fStack_1f0 * fVar417 +
              fVar453 * fStack_430 + fVar363 * fStack_4d0 + fVar286 * fStack_490;
    fVar221 = fStack_1ec * fVar421 +
              fVar456 * fStack_42c + fVar365 * fStack_4cc + fVar287 * fStack_48c;
    fVar222 = fStack_1e8 * fVar425 +
              fVar459 * fStack_428 + fVar367 * fStack_4c8 + fVar288 * fStack_488;
    fVar224 = fVar370 + fVar394 + fVar412 + fVar448;
    auVar282._0_4_ =
         (float)local_220._0_4_ * fVar395 +
         fVar431 * (float)local_460._0_4_ +
         fVar289 * (float)local_240._0_4_ + fVar271 * (float)local_4c0._0_4_;
    auVar282._4_4_ =
         (float)local_220._4_4_ * fVar404 +
         fVar441 * (float)local_460._4_4_ +
         fVar290 * (float)local_240._4_4_ + fVar275 * (float)local_4c0._4_4_;
    auVar282._8_4_ =
         fStack_218 * fVar408 + fVar444 * fStack_458 + fVar359 * fStack_238 + fVar276 * fStack_4b8;
    auVar282._12_4_ =
         fStack_214 * fVar413 + fVar449 * fStack_454 + fVar361 * fStack_234 + fVar285 * fStack_4b4;
    auVar282._16_4_ =
         fStack_210 * fVar417 + fVar453 * fStack_450 + fVar363 * fStack_230 + fVar286 * fStack_4b0;
    auVar282._20_4_ =
         fStack_20c * fVar421 + fVar456 * fStack_44c + fVar365 * fStack_22c + fVar287 * fStack_4ac;
    auVar282._24_4_ =
         fStack_208 * fVar425 + fVar459 * fStack_448 + fVar367 * fStack_228 + fVar288 * fStack_4a8;
    auVar282._28_4_ = fVar370 + fVar448 + 2.0 + -fVar250 + -3.0;
    auVar40._4_4_ = (fVar248 + fVar248) * auVar242._4_4_;
    auVar40._0_4_ = (fVar148 + fVar148) * auVar242._0_4_;
    auVar40._8_4_ = (fVar182 + fVar182) * auVar242._8_4_;
    auVar40._12_4_ = (fVar223 + fVar223) * auVar242._12_4_;
    auVar40._16_4_ = (fVar186 + fVar186) * auVar242._16_4_;
    auVar40._20_4_ = (fVar249 + fVar249) * auVar242._20_4_;
    auVar40._24_4_ = (fVar146 + fVar146) * auVar242._24_4_;
    auVar40._28_4_ = auVar242._28_4_ + auVar242._28_4_;
    auVar128 = vsubps_avx(auVar40,auVar178._0_32_);
    auVar41._4_4_ = (fVar248 + fVar248) * (fVar252 + 2.0);
    auVar41._0_4_ = (fVar148 + fVar148) * (fVar251 + 2.0);
    auVar41._8_4_ = (fVar182 + fVar182) * (fVar254 + 2.0);
    auVar41._12_4_ = (fVar223 + fVar223) * (fVar268 + 2.0);
    auVar41._16_4_ = (fVar186 + fVar186) * (fVar269 + 2.0);
    auVar41._20_4_ = (fVar249 + fVar249) * (fVar270 + 2.0);
    auVar41._24_4_ = (fVar146 + fVar146) * (fVar273 + 2.0);
    auVar41._28_4_ = 0x40400000;
    auVar42._4_4_ = fVar248 * fVar248 * 3.0;
    auVar42._0_4_ = fVar148 * fVar148 * 3.0;
    auVar42._8_4_ = fVar182 * fVar182 * 3.0;
    auVar42._12_4_ = fVar223 * fVar223 * 3.0;
    auVar42._16_4_ = fVar186 * fVar186 * 3.0;
    auVar42._20_4_ = fVar249 * fVar249 * 3.0;
    auVar42._24_4_ = fVar146 * fVar146 * 3.0;
    auVar42._28_4_ = fVar250;
    auVar175 = vsubps_avx(auVar41,auVar42);
    auVar28 = vsubps_avx(_local_ca0,auVar40);
    fVar290 = auVar128._0_4_ * 0.5;
    fVar365 = auVar128._4_4_ * 0.5;
    fVar367 = auVar128._8_4_ * 0.5;
    fVar394 = auVar128._12_4_ * 0.5;
    fVar395 = auVar128._16_4_ * 0.5;
    fVar404 = auVar128._20_4_ * 0.5;
    fVar408 = auVar128._24_4_ * 0.5;
    fVar271 = (auVar242._0_4_ * fVar251 + (auVar242._0_4_ + auVar242._0_4_) * (fVar251 + -5.0)) *
              0.5;
    fVar275 = (auVar242._4_4_ * fVar252 + (auVar242._4_4_ + auVar242._4_4_) * (fVar252 + -5.0)) *
              0.5;
    fVar287 = (auVar242._8_4_ * fVar254 + (auVar242._8_4_ + auVar242._8_4_) * (fVar254 + -5.0)) *
              0.5;
    fVar288 = (auVar242._12_4_ * fVar268 + (auVar242._12_4_ + auVar242._12_4_) * (fVar268 + -5.0)) *
              0.5;
    fVar359 = (auVar242._16_4_ * fVar269 + (auVar242._16_4_ + auVar242._16_4_) * (fVar269 + -5.0)) *
              0.5;
    fVar361 = (auVar242._20_4_ * fVar270 + (auVar242._20_4_ + auVar242._20_4_) * (fVar270 + -5.0)) *
              0.5;
    fVar363 = (auVar242._24_4_ * fVar273 + (auVar242._24_4_ + auVar242._24_4_) * (fVar273 + -5.0)) *
              0.5;
    fVar148 = auVar175._0_4_ * 0.5;
    fVar248 = auVar175._4_4_ * 0.5;
    fVar182 = auVar175._8_4_ * 0.5;
    fVar223 = auVar175._12_4_ * 0.5;
    fVar186 = auVar175._16_4_ * 0.5;
    fVar249 = auVar175._20_4_ * 0.5;
    fVar252 = auVar175._24_4_ * 0.5;
    fVar254 = auVar28._0_4_ * 0.5;
    fVar268 = auVar28._4_4_ * 0.5;
    fVar269 = auVar28._8_4_ * 0.5;
    fVar270 = auVar28._12_4_ * 0.5;
    fVar276 = auVar28._16_4_ * 0.5;
    fVar285 = auVar28._20_4_ * 0.5;
    fVar286 = auVar28._24_4_ * 0.5;
    fVar335 = fVar250 + fVar250 + auVar128._28_4_ + fVar250 + fVar250 + -4.0;
    auVar201 = vpermilps_avx(ZEXT416((uint)(auVar125._0_4_ * 0.04761905)),0);
    fVar146 = auVar201._0_4_;
    fVar310 = fVar146 * (fVar290 * (float)local_3e0._0_4_ +
                        fVar271 * (float)local_400._0_4_ + fVar148 * fVar462 + fVar371 * fVar254);
    fVar251 = auVar201._4_4_;
    fVar324 = fVar251 * (fVar365 * (float)local_3e0._4_4_ +
                        fVar275 * (float)local_400._4_4_ + fVar248 * fVar440 + fVar382 * fVar268);
    auVar43._4_4_ = fVar324;
    auVar43._0_4_ = fVar310;
    fVar273 = auVar201._8_4_;
    fVar325 = fVar273 * (fVar367 * fStack_3d8 +
                        fVar287 * fStack_3f8 + fVar182 * fVar307 + fVar383 * fVar269);
    auVar43._8_4_ = fVar325;
    fVar289 = auVar201._12_4_;
    fVar327 = fVar289 * (fVar394 * fStack_3d4 +
                        fVar288 * fStack_3f4 + fVar223 * fVar448 + fVar447 * fVar270);
    auVar43._12_4_ = fVar327;
    fVar329 = fVar146 * (fVar395 * fStack_3d0 +
                        fVar359 * fStack_3f0 + fVar186 * fVar462 + fVar371 * fVar276);
    auVar43._16_4_ = fVar329;
    fVar331 = fVar251 * (fVar404 * fStack_3cc +
                        fVar361 * fStack_3ec + fVar249 * fVar440 + fVar382 * fVar285);
    auVar43._20_4_ = fVar331;
    fVar333 = fVar273 * (fVar408 * fStack_3c8 +
                        fVar363 * fStack_3e8 + fVar252 * fVar307 + fVar383 * fVar286);
    auVar43._24_4_ = fVar333;
    auVar43._28_4_ = fVar335;
    fVar396 = fVar146 * ((float)local_1e0._0_4_ * fVar290 +
                        fVar271 * (float)local_420._0_4_ +
                        fVar148 * (float)local_480._0_4_ + fVar254 * fVar452);
    fVar405 = fVar251 * ((float)local_1e0._4_4_ * fVar365 +
                        fVar275 * (float)local_420._4_4_ +
                        fVar248 * (float)local_480._4_4_ + fVar268 * fVar272);
    auVar44._4_4_ = fVar405;
    auVar44._0_4_ = fVar396;
    fVar409 = fVar273 * (fStack_1d8 * fVar367 +
                        fVar287 * fStack_418 + fVar182 * fStack_478 + fVar269 * fVar274);
    auVar44._8_4_ = fVar409;
    fVar414 = fVar289 * (fStack_1d4 * fVar394 +
                        fVar288 * fStack_414 + fVar223 * fStack_474 + fVar270 * fVar412);
    auVar44._12_4_ = fVar414;
    fVar418 = fVar146 * (fStack_1d0 * fVar395 +
                        fVar359 * fStack_410 + fVar186 * fStack_470 + fVar276 * fVar452);
    auVar44._16_4_ = fVar418;
    fVar422 = fVar251 * (fStack_1cc * fVar404 +
                        fVar361 * fStack_40c + fVar249 * fStack_46c + fVar285 * fVar272);
    auVar44._20_4_ = fVar422;
    fVar426 = fVar273 * (fStack_1c8 * fVar408 +
                        fVar363 * fStack_408 + fVar252 * fStack_468 + fVar286 * fVar274);
    auVar44._24_4_ = fVar426;
    auVar44._28_4_ = fVar429;
    fVar432 = fVar146 * ((float)local_200._0_4_ * fVar290 +
                        fVar148 * (float)local_4a0._0_4_ + fVar254 * (float)local_4e0._0_4_ +
                        fVar271 * (float)local_440._0_4_);
    fVar442 = fVar251 * ((float)local_200._4_4_ * fVar365 +
                        fVar248 * (float)local_4a0._4_4_ + fVar268 * (float)local_4e0._4_4_ +
                        fVar275 * (float)local_440._4_4_);
    auVar45._4_4_ = fVar442;
    auVar45._0_4_ = fVar432;
    fVar445 = fVar273 * (fStack_1f8 * fVar367 +
                        fVar182 * fStack_498 + fVar269 * fStack_4d8 + fVar287 * fStack_438);
    auVar45._8_4_ = fVar445;
    fVar450 = fVar289 * (fStack_1f4 * fVar394 +
                        fVar223 * fStack_494 + fVar270 * fStack_4d4 + fVar288 * fStack_434);
    auVar45._12_4_ = fVar450;
    fVar454 = fVar146 * (fStack_1f0 * fVar395 +
                        fVar186 * fStack_490 + fVar276 * fStack_4d0 + fVar359 * fStack_430);
    auVar45._16_4_ = fVar454;
    fVar457 = fVar251 * (fStack_1ec * fVar404 +
                        fVar249 * fStack_48c + fVar285 * fStack_4cc + fVar361 * fStack_42c);
    auVar45._20_4_ = fVar457;
    fVar460 = fVar273 * (fStack_1e8 * fVar408 +
                        fVar252 * fStack_488 + fVar286 * fStack_4c8 + fVar363 * fStack_428);
    auVar45._24_4_ = fVar460;
    auVar45._28_4_ = uStack_1c4;
    fVar250 = fVar146 * ((float)local_220._0_4_ * fVar290 +
                        fVar271 * (float)local_460._0_4_ +
                        fVar148 * (float)local_4c0._0_4_ + (float)local_240._0_4_ * fVar254);
    fVar271 = fVar251 * ((float)local_220._4_4_ * fVar365 +
                        fVar275 * (float)local_460._4_4_ +
                        fVar248 * (float)local_4c0._4_4_ + (float)local_240._4_4_ * fVar268);
    auVar46._4_4_ = fVar271;
    auVar46._0_4_ = fVar250;
    fVar275 = fVar273 * (fStack_218 * fVar367 +
                        fVar287 * fStack_458 + fVar182 * fStack_4b8 + fStack_238 * fVar269);
    auVar46._8_4_ = fVar275;
    fVar290 = fVar289 * (fStack_214 * fVar394 +
                        fVar288 * fStack_454 + fVar223 * fStack_4b4 + fStack_234 * fVar270);
    auVar46._12_4_ = fVar290;
    fVar146 = fVar146 * (fStack_210 * fVar395 +
                        fVar359 * fStack_450 + fVar186 * fStack_4b0 + fStack_230 * fVar276);
    auVar46._16_4_ = fVar146;
    fVar251 = fVar251 * (fStack_20c * fVar404 +
                        fVar361 * fStack_44c + fVar249 * fStack_4ac + fStack_22c * fVar285);
    auVar46._20_4_ = fVar251;
    fVar273 = fVar273 * (fStack_208 * fVar408 +
                        fVar363 * fStack_448 + fVar252 * fStack_4a8 + fStack_228 * fVar286);
    auVar46._24_4_ = fVar273;
    auVar46._28_4_ = fVar289;
    auVar98._4_4_ = fVar358;
    auVar98._0_4_ = fVar352;
    auVar98._8_4_ = fVar360;
    auVar98._12_4_ = fVar362;
    auVar98._16_4_ = fVar364;
    auVar98._20_4_ = fVar366;
    auVar98._24_4_ = fVar368;
    auVar98._28_4_ = fVar370;
    auVar128 = vperm2f128_avx(auVar98,auVar98,1);
    auVar128 = vshufps_avx(auVar128,auVar98,0x30);
    _local_ae0 = vshufps_avx(auVar98,auVar128,0x29);
    auVar96._4_4_ = fVar217;
    auVar96._0_4_ = fVar190;
    auVar96._8_4_ = fVar218;
    auVar96._12_4_ = fVar219;
    auVar96._16_4_ = fVar220;
    auVar96._20_4_ = fVar221;
    auVar96._24_4_ = fVar222;
    auVar96._28_4_ = fVar224;
    auVar128 = vperm2f128_avx(auVar96,auVar96,1);
    auVar128 = vshufps_avx(auVar128,auVar96,0x30);
    auVar29 = vshufps_avx(auVar96,auVar128,0x29);
    auVar175 = vsubps_avx(auVar282,auVar46);
    auVar128 = vperm2f128_avx(auVar175,auVar175,1);
    auVar128 = vshufps_avx(auVar128,auVar175,0x30);
    auVar30 = vshufps_avx(auVar175,auVar128,0x29);
    auVar31 = vsubps_avx(_local_ae0,auVar98);
    auVar28 = vsubps_avx(auVar29,auVar96);
    fVar248 = auVar31._0_4_;
    fVar252 = auVar31._4_4_;
    auVar47._4_4_ = fVar442 * fVar252;
    auVar47._0_4_ = fVar432 * fVar248;
    fVar276 = auVar31._8_4_;
    auVar47._8_4_ = fVar445 * fVar276;
    fVar361 = auVar31._12_4_;
    auVar47._12_4_ = fVar450 * fVar361;
    fVar371 = auVar31._16_4_;
    auVar47._16_4_ = fVar454 * fVar371;
    fVar417 = auVar31._20_4_;
    auVar47._20_4_ = fVar457 * fVar417;
    fVar444 = auVar31._24_4_;
    auVar47._24_4_ = fVar460 * fVar444;
    auVar47._28_4_ = auVar175._28_4_;
    fVar182 = auVar28._0_4_;
    fVar254 = auVar28._4_4_;
    auVar48._4_4_ = fVar405 * fVar254;
    auVar48._0_4_ = fVar396 * fVar182;
    fVar285 = auVar28._8_4_;
    auVar48._8_4_ = fVar409 * fVar285;
    fVar363 = auVar28._12_4_;
    auVar48._12_4_ = fVar414 * fVar363;
    fVar382 = auVar28._16_4_;
    auVar48._16_4_ = fVar418 * fVar382;
    fVar421 = auVar28._20_4_;
    auVar48._20_4_ = fVar422 * fVar421;
    fVar449 = auVar28._24_4_;
    auVar48._24_4_ = fVar426 * fVar449;
    auVar48._28_4_ = auVar128._28_4_;
    auVar166 = vsubps_avx(auVar48,auVar47);
    auVar102._4_4_ = fStack_abc;
    auVar102._0_4_ = local_ac0;
    auVar102._8_4_ = fStack_ab8;
    auVar102._12_4_ = fStack_ab4;
    auVar102._16_4_ = fStack_ab0;
    auVar102._20_4_ = fStack_aac;
    auVar102._24_4_ = fStack_aa8;
    auVar102._28_4_ = fStack_aa4;
    auVar128 = vperm2f128_avx(auVar102,auVar102,1);
    auVar128 = vshufps_avx(auVar128,auVar102,0x30);
    local_980 = vshufps_avx(auVar102,auVar128,0x29);
    auVar32 = vsubps_avx(local_980,auVar102);
    auVar49._4_4_ = fVar254 * fVar324;
    auVar49._0_4_ = fVar182 * fVar310;
    auVar49._8_4_ = fVar285 * fVar325;
    auVar49._12_4_ = fVar363 * fVar327;
    auVar49._16_4_ = fVar382 * fVar329;
    auVar49._20_4_ = fVar421 * fVar331;
    auVar49._24_4_ = fVar449 * fVar333;
    auVar49._28_4_ = auVar128._28_4_;
    fVar223 = auVar32._0_4_;
    fVar268 = auVar32._4_4_;
    auVar50._4_4_ = fVar442 * fVar268;
    auVar50._0_4_ = fVar432 * fVar223;
    fVar286 = auVar32._8_4_;
    auVar50._8_4_ = fVar445 * fVar286;
    fVar365 = auVar32._12_4_;
    auVar50._12_4_ = fVar450 * fVar365;
    fVar383 = auVar32._16_4_;
    auVar50._16_4_ = fVar454 * fVar383;
    fVar425 = auVar32._20_4_;
    auVar50._20_4_ = fVar457 * fVar425;
    fVar453 = auVar32._24_4_;
    auVar50._24_4_ = fVar460 * fVar453;
    auVar50._28_4_ = auVar29._28_4_;
    auVar244 = vsubps_avx(auVar50,auVar49);
    auVar51._4_4_ = fVar405 * fVar268;
    auVar51._0_4_ = fVar396 * fVar223;
    auVar51._8_4_ = fVar409 * fVar286;
    auVar51._12_4_ = fVar414 * fVar365;
    auVar51._16_4_ = fVar418 * fVar383;
    auVar51._20_4_ = fVar422 * fVar425;
    auVar51._24_4_ = fVar426 * fVar453;
    auVar51._28_4_ = auVar29._28_4_;
    auVar52._4_4_ = fVar252 * fVar324;
    auVar52._0_4_ = fVar248 * fVar310;
    auVar52._8_4_ = fVar276 * fVar325;
    auVar52._12_4_ = fVar361 * fVar327;
    auVar52._16_4_ = fVar371 * fVar329;
    auVar52._20_4_ = fVar417 * fVar331;
    auVar52._24_4_ = fVar444 * fVar333;
    auVar52._28_4_ = fVar224;
    auVar38 = vsubps_avx(auVar52,auVar51);
    fVar148 = auVar38._28_4_;
    fVar359 = auVar244._28_4_ + fVar148;
    auVar243._0_4_ = fVar223 * fVar223 + fVar248 * fVar248 + fVar182 * fVar182;
    auVar243._4_4_ = fVar268 * fVar268 + fVar252 * fVar252 + fVar254 * fVar254;
    auVar243._8_4_ = fVar286 * fVar286 + fVar276 * fVar276 + fVar285 * fVar285;
    auVar243._12_4_ = fVar365 * fVar365 + fVar361 * fVar361 + fVar363 * fVar363;
    auVar243._16_4_ = fVar383 * fVar383 + fVar371 * fVar371 + fVar382 * fVar382;
    auVar243._20_4_ = fVar425 * fVar425 + fVar417 * fVar417 + fVar421 * fVar421;
    auVar243._24_4_ = fVar453 * fVar453 + fVar444 * fVar444 + fVar449 * fVar449;
    auVar243._28_4_ = fVar148 + fVar148 + fVar359;
    auVar128 = vrcpps_avx(auVar243);
    fVar148 = auVar128._0_4_;
    fVar395 = auVar128._4_4_;
    auVar53._4_4_ = fVar395 * auVar243._4_4_;
    auVar53._0_4_ = fVar148 * auVar243._0_4_;
    fVar404 = auVar128._8_4_;
    auVar53._8_4_ = fVar404 * auVar243._8_4_;
    fVar408 = auVar128._12_4_;
    auVar53._12_4_ = fVar408 * auVar243._12_4_;
    fVar272 = auVar128._16_4_;
    auVar53._16_4_ = fVar272 * auVar243._16_4_;
    fVar274 = auVar128._20_4_;
    auVar53._20_4_ = fVar274 * auVar243._20_4_;
    fVar413 = auVar128._24_4_;
    auVar53._24_4_ = fVar413 * auVar243._24_4_;
    auVar53._28_4_ = fVar224;
    auVar207._8_4_ = 0x3f800000;
    auVar207._0_8_ = 0x3f8000003f800000;
    auVar207._12_4_ = 0x3f800000;
    auVar207._16_4_ = 0x3f800000;
    auVar207._20_4_ = 0x3f800000;
    auVar207._24_4_ = 0x3f800000;
    auVar207._28_4_ = 0x3f800000;
    auVar39 = vsubps_avx(auVar207,auVar53);
    fVar148 = auVar39._0_4_ * fVar148 + fVar148;
    fVar395 = auVar39._4_4_ * fVar395 + fVar395;
    fVar404 = auVar39._8_4_ * fVar404 + fVar404;
    fVar408 = auVar39._12_4_ * fVar408 + fVar408;
    fVar272 = auVar39._16_4_ * fVar272 + fVar272;
    fVar274 = auVar39._20_4_ * fVar274 + fVar274;
    fVar413 = auVar39._24_4_ * fVar413 + fVar413;
    auVar175 = vperm2f128_avx(auVar44,auVar44,1);
    auVar175 = vshufps_avx(auVar175,auVar44,0x30);
    local_9a0 = vshufps_avx(auVar44,auVar175,0x29);
    auVar175 = vperm2f128_avx(auVar45,auVar45,1);
    auVar175 = vshufps_avx(auVar175,auVar45,0x30);
    local_9c0 = vshufps_avx(auVar45,auVar175,0x29);
    fVar433 = local_9c0._0_4_;
    fVar443 = local_9c0._4_4_;
    auVar54._4_4_ = fVar443 * fVar252;
    auVar54._0_4_ = fVar433 * fVar248;
    fVar446 = local_9c0._8_4_;
    auVar54._8_4_ = fVar446 * fVar276;
    fVar451 = local_9c0._12_4_;
    auVar54._12_4_ = fVar451 * fVar361;
    fVar455 = local_9c0._16_4_;
    auVar54._16_4_ = fVar455 * fVar371;
    fVar458 = local_9c0._20_4_;
    auVar54._20_4_ = fVar458 * fVar417;
    fVar461 = local_9c0._24_4_;
    auVar54._24_4_ = fVar461 * fVar444;
    auVar54._28_4_ = auVar175._28_4_;
    fVar186 = local_9a0._0_4_;
    fVar269 = local_9a0._4_4_;
    auVar55._4_4_ = fVar254 * fVar269;
    auVar55._0_4_ = fVar182 * fVar186;
    fVar287 = local_9a0._8_4_;
    auVar55._8_4_ = fVar285 * fVar287;
    fVar367 = local_9a0._12_4_;
    auVar55._12_4_ = fVar363 * fVar367;
    fVar447 = local_9a0._16_4_;
    auVar55._16_4_ = fVar382 * fVar447;
    fVar462 = local_9a0._20_4_;
    auVar55._20_4_ = fVar421 * fVar462;
    fVar456 = local_9a0._24_4_;
    auVar55._24_4_ = fVar449 * fVar456;
    auVar55._28_4_ = fVar429;
    auVar129 = vsubps_avx(auVar55,auVar54);
    auVar175 = vperm2f128_avx(auVar43,auVar43,1);
    auVar175 = vshufps_avx(auVar175,auVar43,0x30);
    auVar28 = vshufps_avx(auVar43,auVar175,0x29);
    fVar249 = auVar28._0_4_;
    fVar270 = auVar28._4_4_;
    auVar56._4_4_ = fVar254 * fVar270;
    auVar56._0_4_ = fVar182 * fVar249;
    fVar288 = auVar28._8_4_;
    auVar56._8_4_ = fVar285 * fVar288;
    fVar394 = auVar28._12_4_;
    auVar56._12_4_ = fVar363 * fVar394;
    fVar452 = auVar28._16_4_;
    auVar56._16_4_ = fVar382 * fVar452;
    fVar431 = auVar28._20_4_;
    auVar56._20_4_ = fVar421 * fVar431;
    fVar459 = auVar28._24_4_;
    auVar56._24_4_ = fVar449 * fVar459;
    auVar56._28_4_ = auVar175._28_4_;
    auVar57._4_4_ = fVar443 * fVar268;
    auVar57._0_4_ = fVar433 * fVar223;
    auVar57._8_4_ = fVar446 * fVar286;
    auVar57._12_4_ = fVar451 * fVar365;
    auVar57._16_4_ = fVar455 * fVar383;
    auVar57._20_4_ = fVar458 * fVar425;
    uVar106 = local_9c0._28_4_;
    auVar57._24_4_ = fVar461 * fVar453;
    auVar57._28_4_ = uVar106;
    auVar175 = vsubps_avx(auVar57,auVar56);
    auVar58._4_4_ = fVar268 * fVar269;
    auVar58._0_4_ = fVar223 * fVar186;
    auVar58._8_4_ = fVar286 * fVar287;
    auVar58._12_4_ = fVar365 * fVar367;
    auVar58._16_4_ = fVar383 * fVar447;
    auVar58._20_4_ = fVar425 * fVar462;
    auVar58._24_4_ = fVar453 * fVar456;
    auVar58._28_4_ = uVar106;
    auVar59._4_4_ = fVar252 * fVar270;
    auVar59._0_4_ = fVar248 * fVar249;
    auVar59._8_4_ = fVar276 * fVar288;
    auVar59._12_4_ = fVar361 * fVar394;
    auVar59._16_4_ = fVar371 * fVar452;
    auVar59._20_4_ = fVar417 * fVar431;
    auVar59._24_4_ = fVar444 * fVar459;
    auVar59._28_4_ = fStack_204;
    auVar130 = vsubps_avx(auVar59,auVar58);
    auVar60._4_4_ =
         (auVar166._4_4_ * auVar166._4_4_ +
         auVar244._4_4_ * auVar244._4_4_ + auVar38._4_4_ * auVar38._4_4_) * fVar395;
    auVar60._0_4_ =
         (auVar166._0_4_ * auVar166._0_4_ +
         auVar244._0_4_ * auVar244._0_4_ + auVar38._0_4_ * auVar38._0_4_) * fVar148;
    auVar60._8_4_ =
         (auVar166._8_4_ * auVar166._8_4_ +
         auVar244._8_4_ * auVar244._8_4_ + auVar38._8_4_ * auVar38._8_4_) * fVar404;
    auVar60._12_4_ =
         (auVar166._12_4_ * auVar166._12_4_ +
         auVar244._12_4_ * auVar244._12_4_ + auVar38._12_4_ * auVar38._12_4_) * fVar408;
    auVar60._16_4_ =
         (auVar166._16_4_ * auVar166._16_4_ +
         auVar244._16_4_ * auVar244._16_4_ + auVar38._16_4_ * auVar38._16_4_) * fVar272;
    auVar60._20_4_ =
         (auVar166._20_4_ * auVar166._20_4_ +
         auVar244._20_4_ * auVar244._20_4_ + auVar38._20_4_ * auVar38._20_4_) * fVar274;
    auVar60._24_4_ =
         (auVar166._24_4_ * auVar166._24_4_ +
         auVar244._24_4_ * auVar244._24_4_ + auVar38._24_4_ * auVar38._24_4_) * fVar413;
    auVar60._28_4_ = auVar166._28_4_ + fVar359;
    auVar61._4_4_ =
         (auVar129._4_4_ * auVar129._4_4_ +
         auVar175._4_4_ * auVar175._4_4_ + auVar130._4_4_ * auVar130._4_4_) * fVar395;
    auVar61._0_4_ =
         (auVar129._0_4_ * auVar129._0_4_ +
         auVar175._0_4_ * auVar175._0_4_ + auVar130._0_4_ * auVar130._0_4_) * fVar148;
    auVar61._8_4_ =
         (auVar129._8_4_ * auVar129._8_4_ +
         auVar175._8_4_ * auVar175._8_4_ + auVar130._8_4_ * auVar130._8_4_) * fVar404;
    auVar61._12_4_ =
         (auVar129._12_4_ * auVar129._12_4_ +
         auVar175._12_4_ * auVar175._12_4_ + auVar130._12_4_ * auVar130._12_4_) * fVar408;
    auVar61._16_4_ =
         (auVar129._16_4_ * auVar129._16_4_ +
         auVar175._16_4_ * auVar175._16_4_ + auVar130._16_4_ * auVar130._16_4_) * fVar272;
    auVar61._20_4_ =
         (auVar129._20_4_ * auVar129._20_4_ +
         auVar175._20_4_ * auVar175._20_4_ + auVar130._20_4_ * auVar130._20_4_) * fVar274;
    auVar61._24_4_ =
         (auVar129._24_4_ * auVar129._24_4_ +
         auVar175._24_4_ * auVar175._24_4_ + auVar130._24_4_ * auVar130._24_4_) * fVar413;
    auVar61._28_4_ = auVar39._28_4_ + auVar128._28_4_;
    auVar128 = vmaxps_avx(auVar60,auVar61);
    auVar175 = vperm2f128_avx(auVar282,auVar282,1);
    auVar175 = vshufps_avx(auVar175,auVar282,0x30);
    auVar166 = vshufps_avx(auVar282,auVar175,0x29);
    auVar133._0_4_ = auVar282._0_4_ + fVar250;
    auVar133._4_4_ = auVar282._4_4_ + fVar271;
    auVar133._8_4_ = auVar282._8_4_ + fVar275;
    auVar133._12_4_ = auVar282._12_4_ + fVar290;
    auVar133._16_4_ = auVar282._16_4_ + fVar146;
    auVar133._20_4_ = auVar282._20_4_ + fVar251;
    auVar133._24_4_ = auVar282._24_4_ + fVar273;
    auVar133._28_4_ = auVar282._28_4_ + fVar289;
    auVar175 = vmaxps_avx(auVar282,auVar133);
    auVar28 = vmaxps_avx(auVar30,auVar166);
    auVar175 = vmaxps_avx(auVar175,auVar28);
    auVar28 = vrsqrtps_avx(auVar243);
    fVar148 = auVar28._0_4_;
    fVar146 = auVar28._4_4_;
    fVar250 = auVar28._8_4_;
    fVar251 = auVar28._12_4_;
    fVar271 = auVar28._16_4_;
    fVar273 = auVar28._20_4_;
    fVar275 = auVar28._24_4_;
    auVar62._4_4_ = fVar146 * fVar146 * fVar146 * auVar243._4_4_ * 0.5;
    auVar62._0_4_ = fVar148 * fVar148 * fVar148 * auVar243._0_4_ * 0.5;
    auVar62._8_4_ = fVar250 * fVar250 * fVar250 * auVar243._8_4_ * 0.5;
    auVar62._12_4_ = fVar251 * fVar251 * fVar251 * auVar243._12_4_ * 0.5;
    auVar62._16_4_ = fVar271 * fVar271 * fVar271 * auVar243._16_4_ * 0.5;
    auVar62._20_4_ = fVar273 * fVar273 * fVar273 * auVar243._20_4_ * 0.5;
    auVar62._24_4_ = fVar275 * fVar275 * fVar275 * auVar243._24_4_ * 0.5;
    auVar62._28_4_ = auVar243._28_4_;
    auVar63._4_4_ = fVar146 * 1.5;
    auVar63._0_4_ = fVar148 * 1.5;
    auVar63._8_4_ = fVar250 * 1.5;
    auVar63._12_4_ = fVar251 * 1.5;
    auVar63._16_4_ = fVar271 * 1.5;
    auVar63._20_4_ = fVar273 * 1.5;
    auVar63._24_4_ = fVar275 * 1.5;
    auVar63._28_4_ = auVar28._28_4_;
    local_560 = vsubps_avx(auVar63,auVar62);
    auVar99._4_4_ = fVar358;
    auVar99._0_4_ = fVar352;
    auVar99._8_4_ = fVar360;
    auVar99._12_4_ = fVar362;
    auVar99._16_4_ = fVar364;
    auVar99._20_4_ = fVar366;
    auVar99._24_4_ = fVar368;
    auVar99._28_4_ = fVar370;
    auVar244 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_9e0 = vsubps_avx(auVar244,auVar99);
    auVar97._4_4_ = fVar217;
    auVar97._0_4_ = fVar190;
    auVar97._8_4_ = fVar218;
    auVar97._12_4_ = fVar219;
    auVar97._16_4_ = fVar220;
    auVar97._20_4_ = fVar221;
    auVar97._24_4_ = fVar222;
    auVar97._28_4_ = fVar224;
    local_a00 = vsubps_avx(auVar244,auVar97);
    fVar397 = local_a00._0_4_;
    fVar406 = local_a00._4_4_;
    fVar410 = local_a00._8_4_;
    fVar415 = local_a00._12_4_;
    fVar419 = local_a00._16_4_;
    fVar423 = local_a00._20_4_;
    fVar427 = local_a00._24_4_;
    fVar146 = local_9e0._0_4_;
    fVar271 = local_9e0._4_4_;
    fVar289 = local_9e0._8_4_;
    fVar395 = local_9e0._12_4_;
    fVar272 = local_9e0._16_4_;
    fVar440 = local_9e0._20_4_;
    fVar34 = local_9e0._24_4_;
    auVar244 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar102);
    fVar250 = auVar244._0_4_;
    fVar273 = auVar244._4_4_;
    fVar290 = auVar244._8_4_;
    fVar404 = auVar244._12_4_;
    fVar274 = auVar244._16_4_;
    fVar441 = auVar244._20_4_;
    fVar35 = auVar244._24_4_;
    auVar437._0_4_ =
         (float)local_aa0._0_4_ * fVar250 +
         (float)local_860._0_4_ * fVar146 + fVar397 * (float)local_a20._0_4_;
    auVar437._4_4_ =
         (float)local_aa0._4_4_ * fVar273 +
         (float)local_860._4_4_ * fVar271 + fVar406 * (float)local_a20._4_4_;
    auVar437._8_4_ = fStack_a98 * fVar290 + fStack_858 * fVar289 + fVar410 * fStack_a18;
    auVar437._12_4_ = fStack_a94 * fVar404 + fStack_854 * fVar395 + fVar415 * fStack_a14;
    auVar437._16_4_ = fStack_a90 * fVar274 + fStack_850 * fVar272 + fVar419 * fStack_a10;
    auVar437._20_4_ = fStack_a8c * fVar441 + fStack_84c * fVar440 + fVar423 * fStack_a0c;
    auVar437._24_4_ = fStack_a88 * fVar35 + fStack_848 * fVar34 + fVar427 * fStack_a08;
    auVar437._28_4_ = fStack_204 + auVar130._28_4_ + auVar28._28_4_;
    auVar465._0_4_ = fVar250 * fVar250 + fVar146 * fVar146 + fVar397 * fVar397;
    auVar465._4_4_ = fVar273 * fVar273 + fVar271 * fVar271 + fVar406 * fVar406;
    auVar465._8_4_ = fVar290 * fVar290 + fVar289 * fVar289 + fVar410 * fVar410;
    auVar465._12_4_ = fVar404 * fVar404 + fVar395 * fVar395 + fVar415 * fVar415;
    auVar465._16_4_ = fVar274 * fVar274 + fVar272 * fVar272 + fVar419 * fVar419;
    auVar465._20_4_ = fVar441 * fVar441 + fVar440 * fVar440 + fVar423 * fVar423;
    auVar465._24_4_ = fVar35 * fVar35 + fVar34 * fVar34 + fVar427 * fVar427;
    auVar465._28_4_ = fStack_aa4 + fStack_aa4 + fStack_204;
    fVar251 = local_560._0_4_;
    fVar275 = local_560._4_4_;
    fVar359 = local_560._8_4_;
    fVar408 = local_560._12_4_;
    fVar413 = local_560._16_4_;
    fVar307 = local_560._20_4_;
    fVar309 = local_560._24_4_;
    fVar336 = (float)local_aa0._0_4_ * fVar223 * fVar251 +
              fVar248 * fVar251 * (float)local_860._0_4_ +
              fVar182 * fVar251 * (float)local_a20._0_4_;
    fVar346 = (float)local_aa0._4_4_ * fVar268 * fVar275 +
              fVar252 * fVar275 * (float)local_860._4_4_ +
              fVar254 * fVar275 * (float)local_a20._4_4_;
    fVar347 = fStack_a98 * fVar286 * fVar359 +
              fVar276 * fVar359 * fStack_858 + fVar285 * fVar359 * fStack_a18;
    fVar348 = fStack_a94 * fVar365 * fVar408 +
              fVar361 * fVar408 * fStack_854 + fVar363 * fVar408 * fStack_a14;
    fVar349 = fStack_a90 * fVar383 * fVar413 +
              fVar371 * fVar413 * fStack_850 + fVar382 * fVar413 * fStack_a10;
    fVar350 = fStack_a8c * fVar425 * fVar307 +
              fVar417 * fVar307 * fStack_84c + fVar421 * fVar307 * fStack_a0c;
    fVar351 = fStack_a88 * fVar453 * fVar309 +
              fVar444 * fVar309 * fStack_848 + fVar449 * fVar309 * fStack_a08;
    fVar148 = fStack_a84 + fStack_844 + fStack_a04;
    fVar398 = fVar250 * fVar223 * fVar251 +
              fVar248 * fVar251 * fVar146 + fVar397 * fVar182 * fVar251;
    fVar407 = fVar273 * fVar268 * fVar275 +
              fVar252 * fVar275 * fVar271 + fVar406 * fVar254 * fVar275;
    fVar411 = fVar290 * fVar286 * fVar359 +
              fVar276 * fVar359 * fVar289 + fVar410 * fVar285 * fVar359;
    fVar416 = fVar404 * fVar365 * fVar408 +
              fVar361 * fVar408 * fVar395 + fVar415 * fVar363 * fVar408;
    fVar420 = fVar274 * fVar383 * fVar413 +
              fVar371 * fVar413 * fVar272 + fVar419 * fVar382 * fVar413;
    fVar424 = fVar441 * fVar425 * fVar307 +
              fVar417 * fVar307 * fVar440 + fVar423 * fVar421 * fVar307;
    fVar428 = fVar35 * fVar453 * fVar309 + fVar444 * fVar309 * fVar34 + fVar427 * fVar449 * fVar309;
    fVar430 = fStack_844 + fVar148;
    auVar64._4_4_ = fVar346 * fVar407;
    auVar64._0_4_ = fVar336 * fVar398;
    auVar64._8_4_ = fVar347 * fVar411;
    auVar64._12_4_ = fVar348 * fVar416;
    auVar64._16_4_ = fVar349 * fVar420;
    auVar64._20_4_ = fVar350 * fVar424;
    auVar64._24_4_ = fVar351 * fVar428;
    auVar64._28_4_ = fVar148;
    auVar38 = vsubps_avx(auVar437,auVar64);
    auVar65._4_4_ = fVar407 * fVar407;
    auVar65._0_4_ = fVar398 * fVar398;
    auVar65._8_4_ = fVar411 * fVar411;
    auVar65._12_4_ = fVar416 * fVar416;
    auVar65._16_4_ = fVar420 * fVar420;
    auVar65._20_4_ = fVar424 * fVar424;
    auVar65._24_4_ = fVar428 * fVar428;
    auVar65._28_4_ = fStack_844;
    auVar39 = vsubps_avx(auVar465,auVar65);
    auVar28 = vsqrtps_avx(auVar128);
    fVar148 = (auVar28._0_4_ + auVar175._0_4_) * 1.0000002;
    fVar180 = (auVar28._4_4_ + auVar175._4_4_) * 1.0000002;
    fVar183 = (auVar28._8_4_ + auVar175._8_4_) * 1.0000002;
    fVar185 = (auVar28._12_4_ + auVar175._12_4_) * 1.0000002;
    fVar187 = (auVar28._16_4_ + auVar175._16_4_) * 1.0000002;
    fVar188 = (auVar28._20_4_ + auVar175._20_4_) * 1.0000002;
    fVar189 = (auVar28._24_4_ + auVar175._24_4_) * 1.0000002;
    auVar66._4_4_ = fVar180 * fVar180;
    auVar66._0_4_ = fVar148 * fVar148;
    auVar66._8_4_ = fVar183 * fVar183;
    auVar66._12_4_ = fVar185 * fVar185;
    auVar66._16_4_ = fVar187 * fVar187;
    auVar66._20_4_ = fVar188 * fVar188;
    auVar66._24_4_ = fVar189 * fVar189;
    auVar66._28_4_ = auVar28._28_4_ + auVar175._28_4_;
    fVar384 = auVar38._0_4_ + auVar38._0_4_;
    fVar393 = auVar38._4_4_ + auVar38._4_4_;
    local_280._0_8_ = CONCAT44(fVar393,fVar384);
    local_280._8_4_ = auVar38._8_4_ + auVar38._8_4_;
    local_280._12_4_ = auVar38._12_4_ + auVar38._12_4_;
    local_280._16_4_ = auVar38._16_4_ + auVar38._16_4_;
    local_280._20_4_ = auVar38._20_4_ + auVar38._20_4_;
    local_280._24_4_ = auVar38._24_4_ + auVar38._24_4_;
    fVar148 = auVar38._28_4_;
    local_280._28_4_ = fVar148 + fVar148;
    auVar392 = ZEXT3264(local_280);
    auVar175 = vsubps_avx(auVar39,auVar66);
    local_340._4_4_ = fVar346 * fVar346;
    local_340._0_4_ = fVar336 * fVar336;
    local_340._8_4_ = fVar347 * fVar347;
    local_340._12_4_ = fVar348 * fVar348;
    local_340._16_4_ = fVar349 * fVar349;
    local_340._20_4_ = fVar350 * fVar350;
    local_340._24_4_ = fVar351 * fVar351;
    local_340._28_4_ = auVar39._28_4_;
    local_580 = vsubps_avx(local_260,local_340);
    auVar67._4_4_ = fVar393 * fVar393;
    auVar67._0_4_ = fVar384 * fVar384;
    auVar67._8_4_ = local_280._8_4_ * local_280._8_4_;
    auVar67._12_4_ = local_280._12_4_ * local_280._12_4_;
    auVar67._16_4_ = local_280._16_4_ * local_280._16_4_;
    auVar67._20_4_ = local_280._20_4_ * local_280._20_4_;
    auVar67._24_4_ = local_280._24_4_ * local_280._24_4_;
    auVar67._28_4_ = fVar148;
    fVar180 = local_580._0_4_;
    fVar183 = local_580._4_4_;
    fVar185 = local_580._8_4_;
    fVar187 = local_580._12_4_;
    fVar188 = local_580._16_4_;
    fVar189 = local_580._20_4_;
    fVar369 = local_580._24_4_;
    auVar68._4_4_ = auVar175._4_4_ * fVar183 * 4.0;
    auVar68._0_4_ = auVar175._0_4_ * fVar180 * 4.0;
    auVar68._8_4_ = auVar175._8_4_ * fVar185 * 4.0;
    auVar68._12_4_ = auVar175._12_4_ * fVar187 * 4.0;
    auVar68._16_4_ = auVar175._16_4_ * fVar188 * 4.0;
    auVar68._20_4_ = auVar175._20_4_ * fVar189 * 4.0;
    auVar68._24_4_ = auVar175._24_4_ * fVar369 * 4.0;
    auVar68._28_4_ = 0x40800000;
    auVar38 = vsubps_avx(auVar67,auVar68);
    auVar128 = vcmpps_avx(auVar38,ZEXT832(0) << 0x20,5);
    fVar148 = local_580._28_4_;
    if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar128 >> 0x7f,0) == '\0') &&
          (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar128 >> 0xbf,0) == '\0') &&
        (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar128[0x1f])
    {
      auVar263._8_4_ = 0x7f800000;
      auVar263._0_8_ = 0x7f8000007f800000;
      auVar263._12_4_ = 0x7f800000;
      auVar263._16_4_ = 0x7f800000;
      auVar263._20_4_ = 0x7f800000;
      auVar263._24_4_ = 0x7f800000;
      auVar263._28_4_ = 0x7f800000;
      auVar466._8_4_ = 0xff800000;
      auVar466._0_8_ = 0xff800000ff800000;
      auVar466._12_4_ = 0xff800000;
      auVar466._16_4_ = 0xff800000;
      auVar466._20_4_ = 0xff800000;
      auVar466._24_4_ = 0xff800000;
      auVar466._28_4_ = 0xff800000;
    }
    else {
      auVar129 = vcmpps_avx(auVar38,ZEXT832(0) << 0x20,5);
      auVar130 = vsqrtps_avx(auVar38);
      auVar296._0_4_ = fVar180 + fVar180;
      auVar296._4_4_ = fVar183 + fVar183;
      auVar296._8_4_ = fVar185 + fVar185;
      auVar296._12_4_ = fVar187 + fVar187;
      auVar296._16_4_ = fVar188 + fVar188;
      auVar296._20_4_ = fVar189 + fVar189;
      auVar296._24_4_ = fVar369 + fVar369;
      auVar296._28_4_ = fVar148 + fVar148;
      auVar38 = vrcpps_avx(auVar296);
      fVar291 = auVar38._0_4_;
      fVar302 = auVar38._4_4_;
      auVar69._4_4_ = auVar296._4_4_ * fVar302;
      auVar69._0_4_ = auVar296._0_4_ * fVar291;
      fVar303 = auVar38._8_4_;
      auVar69._8_4_ = auVar296._8_4_ * fVar303;
      fVar304 = auVar38._12_4_;
      auVar69._12_4_ = auVar296._12_4_ * fVar304;
      fVar305 = auVar38._16_4_;
      auVar69._16_4_ = auVar296._16_4_ * fVar305;
      fVar306 = auVar38._20_4_;
      auVar69._20_4_ = auVar296._20_4_ * fVar306;
      fVar308 = auVar38._24_4_;
      auVar69._24_4_ = auVar296._24_4_ * fVar308;
      auVar69._28_4_ = auVar296._28_4_;
      auVar343._8_4_ = 0x3f800000;
      auVar343._0_8_ = 0x3f8000003f800000;
      auVar343._12_4_ = 0x3f800000;
      auVar343._16_4_ = 0x3f800000;
      auVar343._20_4_ = 0x3f800000;
      auVar343._24_4_ = 0x3f800000;
      auVar343._28_4_ = 0x3f800000;
      auVar163 = vsubps_avx(auVar343,auVar69);
      fVar291 = fVar291 + fVar291 * auVar163._0_4_;
      fVar302 = fVar302 + fVar302 * auVar163._4_4_;
      fVar303 = fVar303 + fVar303 * auVar163._8_4_;
      fVar304 = fVar304 + fVar304 * auVar163._12_4_;
      fVar305 = fVar305 + fVar305 * auVar163._16_4_;
      fVar306 = fVar306 + fVar306 * auVar163._20_4_;
      fVar308 = fVar308 + fVar308 * auVar163._24_4_;
      auVar318._0_8_ = CONCAT44(fVar393,fVar384) ^ 0x8000000080000000;
      auVar318._8_4_ = -local_280._8_4_;
      auVar318._12_4_ = -local_280._12_4_;
      auVar318._16_4_ = -local_280._16_4_;
      auVar318._20_4_ = -local_280._20_4_;
      auVar318._24_4_ = -local_280._24_4_;
      auVar318._28_4_ = -local_280._28_4_;
      auVar164 = vsubps_avx(auVar318,auVar130);
      fVar384 = auVar164._0_4_ * fVar291;
      fVar393 = auVar164._4_4_ * fVar302;
      auVar70._4_4_ = fVar393;
      auVar70._0_4_ = fVar384;
      fVar326 = auVar164._8_4_ * fVar303;
      auVar70._8_4_ = fVar326;
      fVar328 = auVar164._12_4_ * fVar304;
      auVar70._12_4_ = fVar328;
      fVar330 = auVar164._16_4_ * fVar305;
      auVar70._16_4_ = fVar330;
      fVar332 = auVar164._20_4_ * fVar306;
      auVar70._20_4_ = fVar332;
      fVar334 = auVar164._24_4_ * fVar308;
      auVar70._24_4_ = fVar334;
      auVar70._28_4_ = auVar164._28_4_;
      auVar130 = vsubps_avx(auVar130,local_280);
      auVar392 = ZEXT3264(auVar129);
      fVar291 = auVar130._0_4_ * fVar291;
      fVar302 = auVar130._4_4_ * fVar302;
      auVar71._4_4_ = fVar302;
      auVar71._0_4_ = fVar291;
      fVar303 = auVar130._8_4_ * fVar303;
      auVar71._8_4_ = fVar303;
      fVar304 = auVar130._12_4_ * fVar304;
      auVar71._12_4_ = fVar304;
      fVar305 = auVar130._16_4_ * fVar305;
      auVar71._16_4_ = fVar305;
      fVar306 = auVar130._20_4_ * fVar306;
      auVar71._20_4_ = fVar306;
      fVar308 = auVar130._24_4_ * fVar308;
      auVar71._24_4_ = fVar308;
      auVar71._28_4_ = auVar130._28_4_;
      local_300 = fVar251 * (fVar398 + fVar336 * fVar384);
      fStack_2fc = fVar275 * (fVar407 + fVar346 * fVar393);
      fStack_2f8 = fVar359 * (fVar411 + fVar347 * fVar326);
      fStack_2f4 = fVar408 * (fVar416 + fVar348 * fVar328);
      fStack_2f0 = fVar413 * (fVar420 + fVar349 * fVar330);
      fStack_2ec = fVar307 * (fVar424 + fVar350 * fVar332);
      fStack_2e8 = fVar309 * (fVar428 + fVar351 * fVar334);
      fStack_2e4 = fVar430 + auVar38._28_4_ + auVar163._28_4_;
      auVar378._8_4_ = 0x7fffffff;
      auVar378._0_8_ = 0x7fffffff7fffffff;
      auVar378._12_4_ = 0x7fffffff;
      auVar378._16_4_ = 0x7fffffff;
      auVar378._20_4_ = 0x7fffffff;
      auVar378._24_4_ = 0x7fffffff;
      auVar378._28_4_ = 0x7fffffff;
      auVar38 = vandps_avx(auVar378,local_340);
      auVar130 = vmaxps_avx(local_500,auVar38);
      auVar72._4_4_ = auVar130._4_4_ * 1.9073486e-06;
      auVar72._0_4_ = auVar130._0_4_ * 1.9073486e-06;
      auVar72._8_4_ = auVar130._8_4_ * 1.9073486e-06;
      auVar72._12_4_ = auVar130._12_4_ * 1.9073486e-06;
      auVar72._16_4_ = auVar130._16_4_ * 1.9073486e-06;
      auVar72._20_4_ = auVar130._20_4_ * 1.9073486e-06;
      auVar72._24_4_ = auVar130._24_4_ * 1.9073486e-06;
      auVar72._28_4_ = auVar130._28_4_;
      auVar38 = vandps_avx(local_580,auVar378);
      auVar38 = vcmpps_avx(auVar38,auVar72,1);
      auVar344._8_4_ = 0x7f800000;
      auVar344._0_8_ = 0x7f8000007f800000;
      auVar344._12_4_ = 0x7f800000;
      auVar344._16_4_ = 0x7f800000;
      auVar344._20_4_ = 0x7f800000;
      auVar344._24_4_ = 0x7f800000;
      auVar344._28_4_ = 0x7f800000;
      auVar263 = vblendvps_avx(auVar344,auVar70,auVar129);
      local_320 = fVar251 * (fVar398 + fVar336 * fVar291);
      fStack_31c = fVar275 * (fVar407 + fVar346 * fVar302);
      fStack_318 = fVar359 * (fVar411 + fVar347 * fVar303);
      fStack_314 = fVar408 * (fVar416 + fVar348 * fVar304);
      fStack_310 = fVar413 * (fVar420 + fVar349 * fVar305);
      fStack_30c = fVar307 * (fVar424 + fVar350 * fVar306);
      fStack_308 = fVar309 * (fVar428 + fVar351 * fVar308);
      fStack_304 = fVar430 + auVar130._28_4_;
      auVar297._8_4_ = 0xff800000;
      auVar297._0_8_ = 0xff800000ff800000;
      auVar297._12_4_ = 0xff800000;
      auVar297._16_4_ = 0xff800000;
      auVar297._20_4_ = 0xff800000;
      auVar297._24_4_ = 0xff800000;
      auVar297._28_4_ = 0xff800000;
      auVar466 = vblendvps_avx(auVar297,auVar71,auVar129);
      auVar130 = auVar129 & auVar38;
      if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar130 >> 0x7f,0) != '\0') ||
            (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar130 >> 0xbf,0) != '\0') ||
          (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar130[0x1f] < '\0') {
        auVar128 = vandps_avx(auVar38,auVar129);
        auVar201 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
        auVar130 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar38 = vcmpps_avx(auVar175,auVar130,2);
        auVar439._8_4_ = 0xff800000;
        auVar439._0_8_ = 0xff800000ff800000;
        auVar439._12_4_ = 0xff800000;
        auVar439._16_4_ = 0xff800000;
        auVar439._20_4_ = 0xff800000;
        auVar439._24_4_ = 0xff800000;
        auVar439._28_4_ = 0xff800000;
        auVar469._8_4_ = 0x7f800000;
        auVar469._0_8_ = 0x7f8000007f800000;
        auVar469._12_4_ = 0x7f800000;
        auVar469._16_4_ = 0x7f800000;
        auVar469._20_4_ = 0x7f800000;
        auVar469._24_4_ = 0x7f800000;
        auVar469._28_4_ = 0x7f800000;
        auVar175 = vblendvps_avx(auVar469,auVar439,auVar38);
        auVar198 = vpmovsxwd_avx(auVar201);
        auVar201 = vpunpckhwd_avx(auVar201,auVar201);
        auVar284._16_16_ = auVar201;
        auVar284._0_16_ = auVar198;
        auVar263 = vblendvps_avx(auVar263,auVar175,auVar284);
        auVar175 = vblendvps_avx(auVar439,auVar469,auVar38);
        auVar466 = vblendvps_avx(auVar466,auVar175,auVar284);
        auVar175 = vcmpps_avx(auVar130,ZEXT1232(ZEXT812(0)) << 0x20,0xf);
        auVar177._0_4_ = auVar128._0_4_ ^ auVar175._0_4_;
        auVar177._4_4_ = auVar128._4_4_ ^ auVar175._4_4_;
        auVar177._8_4_ = auVar128._8_4_ ^ auVar175._8_4_;
        auVar177._12_4_ = auVar128._12_4_ ^ auVar175._12_4_;
        auVar177._16_4_ = auVar128._16_4_ ^ auVar175._16_4_;
        auVar177._20_4_ = auVar128._20_4_ ^ auVar175._20_4_;
        auVar177._24_4_ = auVar128._24_4_ ^ auVar175._24_4_;
        auVar177._28_4_ = auVar128._28_4_ ^ auVar175._28_4_;
        auVar128 = vorps_avx(auVar38,auVar177);
        auVar128 = vandps_avx(auVar129,auVar128);
      }
    }
    auVar345 = ZEXT3264(local_2a0);
    auVar175 = local_2a0 & auVar128;
    fVar384 = (float)local_b00._0_4_;
    fVar393 = (float)local_b00._4_4_;
    fVar291 = fStack_af8;
    fVar302 = fStack_af4;
    fVar303 = fStack_af0;
    fVar304 = fStack_aec;
    fVar305 = fStack_ae8;
    fVar306 = fStack_ae4;
    if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar175 >> 0x7f,0) != '\0') ||
          (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar175 >> 0xbf,0) != '\0') ||
        (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar175[0x1f] < '\0') {
      local_6c0 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      auVar201 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8e0._0_4_));
      auVar201 = vshufps_avx(auVar201,auVar201,0);
      auVar283._16_16_ = auVar201;
      auVar283._0_16_ = auVar201;
      auVar129 = vminps_avx(auVar283,auVar466);
      fVar253 = local_560._28_4_ + auVar263._28_4_;
      auVar208._0_4_ =
           (float)local_aa0._0_4_ * fVar310 +
           (float)local_860._0_4_ * fVar396 + (float)local_a20._0_4_ * fVar432;
      auVar208._4_4_ =
           (float)local_aa0._4_4_ * fVar324 +
           (float)local_860._4_4_ * fVar405 + (float)local_a20._4_4_ * fVar442;
      auVar208._8_4_ = fStack_a98 * fVar325 + fStack_858 * fVar409 + fStack_a18 * fVar445;
      auVar208._12_4_ = fStack_a94 * fVar327 + fStack_854 * fVar414 + fStack_a14 * fVar450;
      auVar208._16_4_ = fStack_a90 * fVar329 + fStack_850 * fVar418 + fStack_a10 * fVar454;
      auVar208._20_4_ = fStack_a8c * fVar331 + fStack_84c * fVar422 + fStack_a0c * fVar457;
      auVar208._24_4_ = fStack_a88 * fVar333 + fStack_848 * fVar426 + fStack_a08 * fVar460;
      auVar208._28_4_ = fVar253 + fVar429 + fVar253;
      auVar175 = vrcpps_avx(auVar208);
      fVar429 = auVar175._0_4_;
      fVar308 = auVar175._4_4_;
      auVar73._4_4_ = auVar208._4_4_ * fVar308;
      auVar73._0_4_ = auVar208._0_4_ * fVar429;
      fVar326 = auVar175._8_4_;
      auVar73._8_4_ = auVar208._8_4_ * fVar326;
      fVar328 = auVar175._12_4_;
      auVar73._12_4_ = auVar208._12_4_ * fVar328;
      fVar330 = auVar175._16_4_;
      auVar73._16_4_ = auVar208._16_4_ * fVar330;
      fVar332 = auVar175._20_4_;
      auVar73._20_4_ = auVar208._20_4_ * fVar332;
      fVar334 = auVar175._24_4_;
      auVar73._24_4_ = auVar208._24_4_ * fVar334;
      auVar73._28_4_ = fVar335;
      auVar379._8_4_ = 0x3f800000;
      auVar379._0_8_ = 0x3f8000003f800000;
      auVar379._12_4_ = 0x3f800000;
      auVar379._16_4_ = 0x3f800000;
      auVar379._20_4_ = 0x3f800000;
      auVar379._24_4_ = 0x3f800000;
      auVar379._28_4_ = 0x3f800000;
      auVar130 = vsubps_avx(auVar379,auVar73);
      auVar319._8_4_ = 0x7fffffff;
      auVar319._0_8_ = 0x7fffffff7fffffff;
      auVar319._12_4_ = 0x7fffffff;
      auVar319._16_4_ = 0x7fffffff;
      auVar319._20_4_ = 0x7fffffff;
      auVar319._24_4_ = 0x7fffffff;
      auVar319._28_4_ = 0x7fffffff;
      auVar175 = vandps_avx(auVar208,auVar319);
      auVar357._8_4_ = 0x219392ef;
      auVar357._0_8_ = 0x219392ef219392ef;
      auVar357._12_4_ = 0x219392ef;
      auVar357._16_4_ = 0x219392ef;
      auVar357._20_4_ = 0x219392ef;
      auVar357._24_4_ = 0x219392ef;
      auVar357._28_4_ = 0x219392ef;
      auVar38 = vcmpps_avx(auVar175,auVar357,1);
      auVar74._4_4_ =
           (fVar308 + fVar308 * auVar130._4_4_) *
           -(fVar324 * fVar273 + fVar405 * fVar271 + fVar442 * fVar406);
      auVar74._0_4_ =
           (fVar429 + fVar429 * auVar130._0_4_) *
           -(fVar310 * fVar250 + fVar396 * fVar146 + fVar432 * fVar397);
      auVar74._8_4_ =
           (fVar326 + fVar326 * auVar130._8_4_) *
           -(fVar325 * fVar290 + fVar409 * fVar289 + fVar445 * fVar410);
      auVar74._12_4_ =
           (fVar328 + fVar328 * auVar130._12_4_) *
           -(fVar327 * fVar404 + fVar414 * fVar395 + fVar450 * fVar415);
      auVar74._16_4_ =
           (fVar330 + fVar330 * auVar130._16_4_) *
           -(fVar329 * fVar274 + fVar418 * fVar272 + fVar454 * fVar419);
      auVar74._20_4_ =
           (fVar332 + fVar332 * auVar130._20_4_) *
           -(fVar331 * fVar441 + fVar422 * fVar440 + fVar457 * fVar423);
      auVar74._24_4_ =
           (fVar334 + fVar334 * auVar130._24_4_) *
           -(fVar333 * fVar35 + fVar426 * fVar34 + fVar460 * fVar427);
      auVar74._28_4_ = -(auVar244._28_4_ + fVar253);
      auVar244 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar175 = vcmpps_avx(auVar208,auVar244,1);
      auVar175 = vorps_avx(auVar38,auVar175);
      auVar391._8_4_ = 0xff800000;
      auVar391._0_8_ = 0xff800000ff800000;
      auVar391._12_4_ = 0xff800000;
      auVar391._16_4_ = 0xff800000;
      auVar391._20_4_ = 0xff800000;
      auVar391._24_4_ = 0xff800000;
      auVar391._28_4_ = 0xff800000;
      auVar392 = ZEXT3264(auVar391);
      auVar175 = vblendvps_avx(auVar74,auVar391,auVar175);
      auVar244 = vcmpps_avx(auVar208,auVar244,6);
      auVar244 = vorps_avx(auVar38,auVar244);
      auVar438._8_4_ = 0x7f800000;
      auVar438._0_8_ = 0x7f8000007f800000;
      auVar438._12_4_ = 0x7f800000;
      auVar438._16_4_ = 0x7f800000;
      auVar438._20_4_ = 0x7f800000;
      auVar438._24_4_ = 0x7f800000;
      auVar438._28_4_ = 0x7f800000;
      auVar244 = vblendvps_avx(auVar74,auVar438,auVar244);
      auVar38 = vmaxps_avx(local_2c0,auVar263);
      auVar38 = vmaxps_avx(auVar38,auVar175);
      auVar244 = vminps_avx(auVar129,auVar244);
      auVar129 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar175 = vsubps_avx(auVar129,_local_ae0);
      auVar29 = vsubps_avx(auVar129,auVar29);
      auVar75._4_4_ = auVar29._4_4_ * -fVar443;
      auVar75._0_4_ = auVar29._0_4_ * -fVar433;
      auVar75._8_4_ = auVar29._8_4_ * -fVar446;
      auVar75._12_4_ = auVar29._12_4_ * -fVar451;
      auVar75._16_4_ = auVar29._16_4_ * -fVar455;
      auVar75._20_4_ = auVar29._20_4_ * -fVar458;
      auVar75._24_4_ = auVar29._24_4_ * -fVar461;
      auVar75._28_4_ = auVar29._28_4_;
      auVar76._4_4_ = fVar269 * auVar175._4_4_;
      auVar76._0_4_ = fVar186 * auVar175._0_4_;
      auVar76._8_4_ = fVar287 * auVar175._8_4_;
      auVar76._12_4_ = fVar367 * auVar175._12_4_;
      auVar76._16_4_ = fVar447 * auVar175._16_4_;
      auVar76._20_4_ = fVar462 * auVar175._20_4_;
      auVar76._24_4_ = fVar456 * auVar175._24_4_;
      auVar76._28_4_ = auVar175._28_4_;
      auVar175 = vsubps_avx(auVar75,auVar76);
      auVar29 = vsubps_avx(auVar129,local_980);
      auVar77._4_4_ = fVar270 * auVar29._4_4_;
      auVar77._0_4_ = fVar249 * auVar29._0_4_;
      auVar77._8_4_ = fVar288 * auVar29._8_4_;
      auVar77._12_4_ = fVar394 * auVar29._12_4_;
      auVar77._16_4_ = fVar452 * auVar29._16_4_;
      auVar77._20_4_ = fVar431 * auVar29._20_4_;
      uVar7 = auVar29._28_4_;
      auVar77._24_4_ = fVar459 * auVar29._24_4_;
      auVar77._28_4_ = uVar7;
      auVar129 = vsubps_avx(auVar175,auVar77);
      auVar78._4_4_ = -fVar443 * (float)local_a20._4_4_;
      auVar78._0_4_ = -fVar433 * (float)local_a20._0_4_;
      auVar78._8_4_ = -fVar446 * fStack_a18;
      auVar78._12_4_ = -fVar451 * fStack_a14;
      auVar78._16_4_ = -fVar455 * fStack_a10;
      auVar78._20_4_ = -fVar458 * fStack_a0c;
      auVar78._24_4_ = -fVar461 * fStack_a08;
      auVar78._28_4_ = uVar106 ^ 0x80000000;
      auVar467._8_4_ = 0x3f800000;
      auVar467._0_8_ = 0x3f8000003f800000;
      auVar467._12_4_ = 0x3f800000;
      auVar467._16_4_ = 0x3f800000;
      auVar467._20_4_ = 0x3f800000;
      auVar467._24_4_ = 0x3f800000;
      auVar467._28_4_ = 0x3f800000;
      auVar79._4_4_ = (float)local_860._4_4_ * fVar269;
      auVar79._0_4_ = (float)local_860._0_4_ * fVar186;
      auVar79._8_4_ = fStack_858 * fVar287;
      auVar79._12_4_ = fStack_854 * fVar367;
      auVar79._16_4_ = fStack_850 * fVar447;
      auVar79._20_4_ = fStack_84c * fVar462;
      auVar79._24_4_ = fStack_848 * fVar456;
      auVar79._28_4_ = uVar7;
      auVar175 = vsubps_avx(auVar78,auVar79);
      auVar80._4_4_ = fVar270 * (float)local_aa0._4_4_;
      auVar80._0_4_ = fVar249 * (float)local_aa0._0_4_;
      auVar80._8_4_ = fVar288 * fStack_a98;
      auVar80._12_4_ = fVar394 * fStack_a94;
      auVar80._16_4_ = fVar452 * fStack_a90;
      auVar80._20_4_ = fVar431 * fStack_a8c;
      auVar80._24_4_ = fVar459 * fStack_a88;
      auVar80._28_4_ = uVar7;
      auVar130 = vsubps_avx(auVar175,auVar80);
      auVar175 = vrcpps_avx(auVar130);
      fVar186 = auVar175._0_4_;
      fVar249 = auVar175._4_4_;
      auVar81._4_4_ = auVar130._4_4_ * fVar249;
      auVar81._0_4_ = auVar130._0_4_ * fVar186;
      fVar146 = auVar175._8_4_;
      auVar81._8_4_ = auVar130._8_4_ * fVar146;
      fVar250 = auVar175._12_4_;
      auVar81._12_4_ = auVar130._12_4_ * fVar250;
      fVar269 = auVar175._16_4_;
      auVar81._16_4_ = auVar130._16_4_ * fVar269;
      fVar270 = auVar175._20_4_;
      auVar81._20_4_ = auVar130._20_4_ * fVar270;
      fVar271 = auVar175._24_4_;
      auVar81._24_4_ = auVar130._24_4_ * fVar271;
      auVar81._28_4_ = fStack_a84;
      auVar163 = vsubps_avx(auVar467,auVar81);
      auVar175 = vandps_avx(auVar130,auVar319);
      auVar29 = vcmpps_avx(auVar175,auVar357,1);
      auVar82._4_4_ = (fVar249 + fVar249 * auVar163._4_4_) * -auVar129._4_4_;
      auVar82._0_4_ = (fVar186 + fVar186 * auVar163._0_4_) * -auVar129._0_4_;
      auVar82._8_4_ = (fVar146 + fVar146 * auVar163._8_4_) * -auVar129._8_4_;
      auVar82._12_4_ = (fVar250 + fVar250 * auVar163._12_4_) * -auVar129._12_4_;
      auVar82._16_4_ = (fVar269 + fVar269 * auVar163._16_4_) * -auVar129._16_4_;
      auVar82._20_4_ = (fVar270 + fVar270 * auVar163._20_4_) * -auVar129._20_4_;
      auVar82._24_4_ = (fVar271 + fVar271 * auVar163._24_4_) * -auVar129._24_4_;
      auVar82._28_4_ = auVar129._28_4_ ^ 0x80000000;
      auVar175 = vcmpps_avx(auVar130,ZEXT832(0) << 0x20,1);
      auVar175 = vorps_avx(auVar29,auVar175);
      auVar175 = vblendvps_avx(auVar82,auVar391,auVar175);
      _local_7a0 = vmaxps_avx(auVar38,auVar175);
      auVar175 = vcmpps_avx(auVar130,ZEXT832(0) << 0x20,6);
      auVar175 = vorps_avx(auVar29,auVar175);
      auVar175 = vblendvps_avx(auVar82,auVar438,auVar175);
      auVar128 = vandps_avx(local_2a0,auVar128);
      local_360 = vminps_avx(auVar244,auVar175);
      auVar175 = vcmpps_avx(_local_7a0,local_360,2);
      auVar29 = auVar128 & auVar175;
      if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar29 >> 0x7f,0) != '\0') ||
            (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar29 >> 0xbf,0) != '\0') ||
          (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar29[0x1f] < '\0') {
        auVar29 = vminps_avx(auVar282,auVar133);
        auVar30 = vminps_avx(auVar30,auVar166);
        auVar29 = vminps_avx(auVar29,auVar30);
        auVar28 = vsubps_avx(auVar29,auVar28);
        auVar128 = vandps_avx(auVar175,auVar128);
        auVar104._4_4_ = fStack_2fc;
        auVar104._0_4_ = local_300;
        auVar104._8_4_ = fStack_2f8;
        auVar104._12_4_ = fStack_2f4;
        auVar104._16_4_ = fStack_2f0;
        auVar104._20_4_ = fStack_2ec;
        auVar104._24_4_ = fStack_2e8;
        auVar104._28_4_ = fStack_2e4;
        auVar175 = vminps_avx(auVar104,auVar467);
        auVar175 = vmaxps_avx(auVar175,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar118 + fVar147 * (auVar175._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar144 + fVar179 * (auVar175._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar145 + fVar181 * (auVar175._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fStack_c84 + fVar184 * (auVar175._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar118 + fVar147 * (auVar175._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar144 + fVar179 * (auVar175._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar145 + fVar181 * (auVar175._24_4_ + 6.0) * 0.125;
        fStack_184 = fStack_c84 + auVar175._28_4_ + 7.0;
        auVar103._4_4_ = fStack_31c;
        auVar103._0_4_ = local_320;
        auVar103._8_4_ = fStack_318;
        auVar103._12_4_ = fStack_314;
        auVar103._16_4_ = fStack_310;
        auVar103._20_4_ = fStack_30c;
        auVar103._24_4_ = fStack_308;
        auVar103._28_4_ = fStack_304;
        auVar175 = vminps_avx(auVar103,auVar467);
        auVar175 = vmaxps_avx(auVar175,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar118 + fVar147 * (auVar175._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar144 + fVar179 * (auVar175._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar145 + fVar181 * (auVar175._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fStack_c84 + fVar184 * (auVar175._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar118 + fVar147 * (auVar175._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar144 + fVar179 * (auVar175._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar145 + fVar181 * (auVar175._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fStack_c84 + auVar175._28_4_ + 7.0;
        auVar83._4_4_ = auVar28._4_4_ * 0.99999976;
        auVar83._0_4_ = auVar28._0_4_ * 0.99999976;
        auVar83._8_4_ = auVar28._8_4_ * 0.99999976;
        auVar83._12_4_ = auVar28._12_4_ * 0.99999976;
        auVar83._16_4_ = auVar28._16_4_ * 0.99999976;
        auVar83._20_4_ = auVar28._20_4_ * 0.99999976;
        auVar83._24_4_ = auVar28._24_4_ * 0.99999976;
        auVar83._28_4_ = 0x3f7ffffc;
        auVar175 = vmaxps_avx(ZEXT832(0) << 0x20,auVar83);
        auVar84._4_4_ = auVar175._4_4_ * auVar175._4_4_;
        auVar84._0_4_ = auVar175._0_4_ * auVar175._0_4_;
        auVar84._8_4_ = auVar175._8_4_ * auVar175._8_4_;
        auVar84._12_4_ = auVar175._12_4_ * auVar175._12_4_;
        auVar84._16_4_ = auVar175._16_4_ * auVar175._16_4_;
        auVar84._20_4_ = auVar175._20_4_ * auVar175._20_4_;
        auVar84._24_4_ = auVar175._24_4_ * auVar175._24_4_;
        auVar84._28_4_ = auVar175._28_4_;
        auVar28 = vsubps_avx(auVar39,auVar84);
        auVar85._4_4_ = auVar28._4_4_ * fVar183 * 4.0;
        auVar85._0_4_ = auVar28._0_4_ * fVar180 * 4.0;
        auVar85._8_4_ = auVar28._8_4_ * fVar185 * 4.0;
        auVar85._12_4_ = auVar28._12_4_ * fVar187 * 4.0;
        auVar85._16_4_ = auVar28._16_4_ * fVar188 * 4.0;
        auVar85._20_4_ = auVar28._20_4_ * fVar189 * 4.0;
        auVar85._24_4_ = auVar28._24_4_ * fVar369 * 4.0;
        auVar85._28_4_ = auVar175._28_4_;
        auVar29 = vsubps_avx(auVar67,auVar85);
        local_900 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,5);
        auVar175 = local_900;
        if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_900 >> 0x7f,0) == '\0') &&
              (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_900 >> 0xbf,0) == '\0') &&
            (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_900[0x1f]) {
          auVar166 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_8a0 = ZEXT832(0) << 0x20;
          _local_8c0 = ZEXT832(0) << 0x20;
          auVar238 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar261 = ZEXT828(0) << 0x20;
          auVar298._8_4_ = 0x7f800000;
          auVar298._0_8_ = 0x7f8000007f800000;
          auVar298._12_4_ = 0x7f800000;
          auVar298._16_4_ = 0x7f800000;
          auVar298._20_4_ = 0x7f800000;
          auVar298._24_4_ = 0x7f800000;
          auVar298._28_4_ = 0x7f800000;
          auVar320._8_4_ = 0xff800000;
          auVar320._0_8_ = 0xff800000ff800000;
          auVar320._12_4_ = 0xff800000;
          auVar320._16_4_ = 0xff800000;
          auVar320._20_4_ = 0xff800000;
          auVar320._24_4_ = 0xff800000;
          auVar320._28_4_ = 0xff800000;
          local_900 = auVar43;
          _local_880 = _local_8a0;
        }
        else {
          auVar166 = vsqrtps_avx(auVar29);
          auVar245._0_4_ = fVar180 + fVar180;
          auVar245._4_4_ = fVar183 + fVar183;
          auVar245._8_4_ = fVar185 + fVar185;
          auVar245._12_4_ = fVar187 + fVar187;
          auVar245._16_4_ = fVar188 + fVar188;
          auVar245._20_4_ = fVar189 + fVar189;
          auVar245._24_4_ = fVar369 + fVar369;
          auVar245._28_4_ = fVar148 + fVar148;
          auVar30 = vrcpps_avx(auVar245);
          fVar148 = auVar30._0_4_;
          fVar186 = auVar30._4_4_;
          auVar86._4_4_ = auVar245._4_4_ * fVar186;
          auVar86._0_4_ = auVar245._0_4_ * fVar148;
          fVar249 = auVar30._8_4_;
          auVar86._8_4_ = auVar245._8_4_ * fVar249;
          fVar146 = auVar30._12_4_;
          auVar86._12_4_ = auVar245._12_4_ * fVar146;
          fVar250 = auVar30._16_4_;
          auVar86._16_4_ = auVar245._16_4_ * fVar250;
          fVar269 = auVar30._20_4_;
          auVar86._20_4_ = auVar245._20_4_ * fVar269;
          fVar270 = auVar30._24_4_;
          auVar86._24_4_ = auVar245._24_4_ * fVar270;
          auVar86._28_4_ = auVar245._28_4_;
          auVar244 = vsubps_avx(auVar467,auVar86);
          fVar148 = fVar148 + fVar148 * auVar244._0_4_;
          fVar186 = fVar186 + fVar186 * auVar244._4_4_;
          fVar249 = fVar249 + fVar249 * auVar244._8_4_;
          fVar146 = fVar146 + fVar146 * auVar244._12_4_;
          fVar250 = fVar250 + fVar250 * auVar244._16_4_;
          fVar269 = fVar269 + fVar269 * auVar244._20_4_;
          fVar270 = fVar270 + fVar270 * auVar244._24_4_;
          fVar271 = auVar30._28_4_ + auVar244._28_4_;
          auVar264._0_8_ = local_280._0_8_ ^ 0x8000000080000000;
          auVar264._8_4_ = -local_280._8_4_;
          auVar264._12_4_ = -local_280._12_4_;
          auVar264._16_4_ = -local_280._16_4_;
          auVar264._20_4_ = -local_280._20_4_;
          auVar264._24_4_ = -local_280._24_4_;
          auVar264._28_4_ = -local_280._28_4_;
          auVar30 = vsubps_avx(auVar264,auVar166);
          fVar395 = auVar30._0_4_ * fVar148;
          fVar404 = auVar30._4_4_ * fVar186;
          auVar87._4_4_ = fVar404;
          auVar87._0_4_ = fVar395;
          fVar447 = auVar30._8_4_ * fVar249;
          auVar87._8_4_ = fVar447;
          fVar452 = auVar30._12_4_ * fVar146;
          auVar87._12_4_ = fVar452;
          fVar272 = auVar30._16_4_ * fVar250;
          auVar87._16_4_ = fVar272;
          fVar274 = auVar30._20_4_ * fVar269;
          auVar87._20_4_ = fVar274;
          fVar462 = auVar30._24_4_ * fVar270;
          auVar87._24_4_ = fVar462;
          auVar87._28_4_ = fVar448;
          auVar166 = vsubps_avx(auVar166,local_280);
          fVar148 = auVar166._0_4_ * fVar148;
          fVar186 = auVar166._4_4_ * fVar186;
          auVar88._4_4_ = fVar186;
          auVar88._0_4_ = fVar148;
          fVar249 = auVar166._8_4_ * fVar249;
          auVar88._8_4_ = fVar249;
          fVar146 = auVar166._12_4_ * fVar146;
          auVar88._12_4_ = fVar146;
          fVar250 = auVar166._16_4_ * fVar250;
          auVar88._16_4_ = fVar250;
          fVar269 = auVar166._20_4_ * fVar269;
          auVar88._20_4_ = fVar269;
          fVar270 = auVar166._24_4_ * fVar270;
          auVar88._24_4_ = fVar270;
          auVar88._28_4_ = fVar412;
          fVar273 = (fVar395 * fVar336 + fVar398) * fVar251;
          fVar287 = (fVar404 * fVar346 + fVar407) * fVar275;
          fVar288 = (fVar447 * fVar347 + fVar411) * fVar359;
          fVar289 = (fVar452 * fVar348 + fVar416) * fVar408;
          fVar290 = (fVar272 * fVar349 + fVar420) * fVar413;
          fVar367 = (fVar274 * fVar350 + fVar424) * fVar307;
          fVar394 = (fVar462 * fVar351 + fVar428) * fVar309;
          local_940._28_4_ = auVar32._28_4_;
          auVar167._0_4_ = local_ac0 + fVar223 * fVar273;
          auVar167._4_4_ = fStack_abc + fVar268 * fVar287;
          auVar167._8_4_ = fStack_ab8 + fVar286 * fVar288;
          auVar167._12_4_ = fStack_ab4 + fVar365 * fVar289;
          auVar167._16_4_ = fStack_ab0 + fVar383 * fVar290;
          auVar167._20_4_ = fStack_aac + fVar425 * fVar367;
          auVar167._24_4_ = fStack_aa8 + fVar453 * fVar394;
          auVar167._28_4_ = fStack_aa4 + auVar166._28_4_ + fVar430;
          auVar89._4_4_ = (float)local_aa0._4_4_ * fVar404;
          auVar89._0_4_ = (float)local_aa0._0_4_ * fVar395;
          auVar89._8_4_ = fStack_a98 * fVar447;
          auVar89._12_4_ = fStack_a94 * fVar452;
          auVar89._16_4_ = fStack_a90 * fVar272;
          auVar89._20_4_ = fStack_a8c * fVar274;
          auVar89._24_4_ = fStack_a88 * fVar462;
          auVar89._28_4_ = fVar271;
          auVar166 = vsubps_avx(auVar89,auVar167);
          auVar246._0_4_ = fVar352 + fVar248 * fVar273;
          auVar246._4_4_ = fVar358 + fVar252 * fVar287;
          auVar246._8_4_ = fVar360 + fVar276 * fVar288;
          auVar246._12_4_ = fVar362 + fVar361 * fVar289;
          auVar246._16_4_ = fVar364 + fVar371 * fVar290;
          auVar246._20_4_ = fVar366 + fVar417 * fVar367;
          auVar246._24_4_ = fVar368 + fVar444 * fVar394;
          auVar246._28_4_ = fVar370 + fVar271;
          auVar299._0_4_ = (float)local_860._0_4_ * fVar395;
          auVar299._4_4_ = (float)local_860._4_4_ * fVar404;
          auVar299._8_4_ = fStack_858 * fVar447;
          auVar299._12_4_ = fStack_854 * fVar452;
          auVar299._16_4_ = fStack_850 * fVar272;
          auVar299._20_4_ = fStack_84c * fVar274;
          auVar299._24_4_ = fStack_848 * fVar462;
          auVar299._28_4_ = 0;
          auVar32 = vsubps_avx(auVar299,auVar246);
          auVar265._0_4_ = fVar190 + fVar182 * fVar273;
          auVar265._4_4_ = fVar217 + fVar254 * fVar287;
          auVar265._8_4_ = fVar218 + fVar285 * fVar288;
          auVar265._12_4_ = fVar219 + fVar363 * fVar289;
          auVar265._16_4_ = fVar220 + fVar382 * fVar290;
          auVar265._20_4_ = fVar221 + fVar421 * fVar367;
          auVar265._24_4_ = fVar222 + fVar449 * fVar394;
          auVar265._28_4_ = fVar224 + auVar30._28_4_;
          auVar90._4_4_ = (float)local_a20._4_4_ * fVar404;
          auVar90._0_4_ = (float)local_a20._0_4_ * fVar395;
          auVar90._8_4_ = fStack_a18 * fVar447;
          auVar90._12_4_ = fStack_a14 * fVar452;
          auVar90._16_4_ = fStack_a10 * fVar272;
          auVar90._20_4_ = fStack_a0c * fVar274;
          auVar90._24_4_ = fStack_a08 * fVar462;
          auVar90._28_4_ = 0;
          auVar30 = vsubps_avx(auVar90,auVar265);
          auVar261 = auVar30._0_28_;
          fVar251 = (fVar148 * fVar336 + fVar398) * fVar251;
          fVar275 = (fVar186 * fVar346 + fVar407) * fVar275;
          fVar359 = (fVar249 * fVar347 + fVar411) * fVar359;
          fVar408 = (fVar146 * fVar348 + fVar416) * fVar408;
          fVar413 = (fVar250 * fVar349 + fVar420) * fVar413;
          fVar307 = (fVar269 * fVar350 + fVar424) * fVar307;
          fVar309 = (fVar270 * fVar351 + fVar428) * fVar309;
          auVar321._0_4_ = local_ac0 + fVar223 * fVar251;
          auVar321._4_4_ = fStack_abc + fVar268 * fVar275;
          auVar321._8_4_ = fStack_ab8 + fVar286 * fVar359;
          auVar321._12_4_ = fStack_ab4 + fVar365 * fVar408;
          auVar321._16_4_ = fStack_ab0 + fVar383 * fVar413;
          auVar321._20_4_ = fStack_aac + fVar425 * fVar307;
          auVar321._24_4_ = fStack_aa8 + fVar453 * fVar309;
          auVar321._28_4_ = fStack_aa4 + (float)local_940._28_4_;
          auVar91._4_4_ = (float)local_aa0._4_4_ * fVar186;
          auVar91._0_4_ = (float)local_aa0._0_4_ * fVar148;
          auVar91._8_4_ = fStack_a98 * fVar249;
          auVar91._12_4_ = fStack_a94 * fVar146;
          auVar91._16_4_ = fStack_a90 * fVar250;
          auVar91._20_4_ = fStack_a8c * fVar269;
          auVar91._24_4_ = fStack_a88 * fVar270;
          auVar91._28_4_ = fStack_a84;
          _local_880 = vsubps_avx(auVar91,auVar321);
          auVar322._0_4_ = fVar352 + fVar248 * fVar251;
          auVar322._4_4_ = fVar358 + fVar252 * fVar275;
          auVar322._8_4_ = fVar360 + fVar276 * fVar359;
          auVar322._12_4_ = fVar362 + fVar361 * fVar408;
          auVar322._16_4_ = fVar364 + fVar371 * fVar413;
          auVar322._20_4_ = fVar366 + fVar417 * fVar307;
          auVar322._24_4_ = fVar368 + fVar444 * fVar309;
          auVar322._28_4_ = fVar370 + local_880._28_4_;
          auVar92._4_4_ = (float)local_860._4_4_ * fVar186;
          auVar92._0_4_ = (float)local_860._0_4_ * fVar148;
          auVar92._8_4_ = fStack_858 * fVar249;
          auVar92._12_4_ = fStack_854 * fVar146;
          auVar92._16_4_ = fStack_850 * fVar250;
          auVar92._20_4_ = fStack_84c * fVar269;
          auVar92._24_4_ = fStack_848 * fVar270;
          auVar92._28_4_ = fStack_a84;
          _local_8a0 = vsubps_avx(auVar92,auVar322);
          auVar300._0_4_ = fVar190 + fVar182 * fVar251;
          auVar300._4_4_ = fVar217 + fVar254 * fVar275;
          auVar300._8_4_ = fVar218 + fVar285 * fVar359;
          auVar300._12_4_ = fVar219 + fVar363 * fVar408;
          auVar300._16_4_ = fVar220 + fVar382 * fVar413;
          auVar300._20_4_ = fVar221 + fVar421 * fVar307;
          auVar300._24_4_ = fVar222 + fVar449 * fVar309;
          auVar300._28_4_ = fVar224 + fVar430 + 0.0;
          auVar93._4_4_ = (float)local_a20._4_4_ * fVar186;
          auVar93._0_4_ = (float)local_a20._0_4_ * fVar148;
          auVar93._8_4_ = fStack_a18 * fVar249;
          auVar93._12_4_ = fStack_a14 * fVar146;
          auVar93._16_4_ = fStack_a10 * fVar250;
          auVar93._20_4_ = fStack_a0c * fVar269;
          auVar93._24_4_ = fStack_a08 * fVar270;
          auVar93._28_4_ = local_8a0._28_4_;
          _local_8c0 = vsubps_avx(auVar93,auVar300);
          auVar30 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,5);
          auVar345 = ZEXT3264(auVar30);
          auVar301._8_4_ = 0x7f800000;
          auVar301._0_8_ = 0x7f8000007f800000;
          auVar301._12_4_ = 0x7f800000;
          auVar301._16_4_ = 0x7f800000;
          auVar301._20_4_ = 0x7f800000;
          auVar301._24_4_ = 0x7f800000;
          auVar301._28_4_ = 0x7f800000;
          auVar298 = vblendvps_avx(auVar301,auVar87,auVar30);
          auVar380._8_4_ = 0x7fffffff;
          auVar380._0_8_ = 0x7fffffff7fffffff;
          auVar380._12_4_ = 0x7fffffff;
          auVar380._16_4_ = 0x7fffffff;
          auVar380._20_4_ = 0x7fffffff;
          auVar380._24_4_ = 0x7fffffff;
          auVar380._28_4_ = 0x7fffffff;
          auVar29 = vandps_avx(auVar380,local_340);
          auVar29 = vmaxps_avx(local_500,auVar29);
          auVar94._4_4_ = auVar29._4_4_ * 1.9073486e-06;
          auVar94._0_4_ = auVar29._0_4_ * 1.9073486e-06;
          auVar94._8_4_ = auVar29._8_4_ * 1.9073486e-06;
          auVar94._12_4_ = auVar29._12_4_ * 1.9073486e-06;
          auVar94._16_4_ = auVar29._16_4_ * 1.9073486e-06;
          auVar94._20_4_ = auVar29._20_4_ * 1.9073486e-06;
          auVar94._24_4_ = auVar29._24_4_ * 1.9073486e-06;
          auVar94._28_4_ = auVar29._28_4_;
          auVar29 = vandps_avx(auVar380,local_580);
          auVar29 = vcmpps_avx(auVar29,auVar94,1);
          auVar323._8_4_ = 0xff800000;
          auVar323._0_8_ = 0xff800000ff800000;
          auVar323._12_4_ = 0xff800000;
          auVar323._16_4_ = 0xff800000;
          auVar323._20_4_ = 0xff800000;
          auVar323._24_4_ = 0xff800000;
          auVar323._28_4_ = 0xff800000;
          auVar320 = vblendvps_avx(auVar323,auVar88,auVar30);
          auVar244 = auVar30 & auVar29;
          if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar244 >> 0x7f,0) != '\0') ||
                (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar244 >> 0xbf,0) != '\0') ||
              (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar244[0x1f] < '\0') {
            auVar175 = vandps_avx(auVar29,auVar30);
            auVar201 = vpackssdw_avx(auVar175._0_16_,auVar175._16_16_);
            auVar244 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar29 = vcmpps_avx(auVar28,auVar244,2);
            auVar468._8_4_ = 0xff800000;
            auVar468._0_8_ = 0xff800000ff800000;
            auVar468._12_4_ = 0xff800000;
            auVar468._16_4_ = 0xff800000;
            auVar468._20_4_ = 0xff800000;
            auVar468._24_4_ = 0xff800000;
            auVar468._28_4_ = 0xff800000;
            auVar470._8_4_ = 0x7f800000;
            auVar470._0_8_ = 0x7f8000007f800000;
            auVar470._12_4_ = 0x7f800000;
            auVar470._16_4_ = 0x7f800000;
            auVar470._20_4_ = 0x7f800000;
            auVar470._24_4_ = 0x7f800000;
            auVar470._28_4_ = 0x7f800000;
            auVar28 = vblendvps_avx(auVar470,auVar468,auVar29);
            auVar198 = vpmovsxwd_avx(auVar201);
            auVar201 = vpunpckhwd_avx(auVar201,auVar201);
            auVar381._16_16_ = auVar201;
            auVar381._0_16_ = auVar198;
            auVar298 = vblendvps_avx(auVar298,auVar28,auVar381);
            auVar28 = vblendvps_avx(auVar468,auVar470,auVar29);
            auVar320 = vblendvps_avx(auVar320,auVar28,auVar381);
            auVar28 = vcmpps_avx(auVar244,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar142._0_4_ = auVar28._0_4_ ^ auVar175._0_4_;
            auVar142._4_4_ = auVar28._4_4_ ^ auVar175._4_4_;
            auVar142._8_4_ = auVar28._8_4_ ^ auVar175._8_4_;
            auVar142._12_4_ = auVar28._12_4_ ^ auVar175._12_4_;
            auVar142._16_4_ = auVar28._16_4_ ^ auVar175._16_4_;
            auVar142._20_4_ = auVar28._20_4_ ^ auVar175._20_4_;
            auVar142._24_4_ = auVar28._24_4_ ^ auVar175._24_4_;
            auVar142._28_4_ = auVar28._28_4_ ^ auVar175._28_4_;
            auVar175 = vorps_avx(auVar29,auVar142);
            auVar175 = vandps_avx(auVar30,auVar175);
          }
          auVar238 = auVar32._0_28_;
          _local_ae0 = auVar166;
        }
        _local_3c0 = _local_7a0;
        local_3a0 = vminps_avx(local_360,auVar298);
        _local_7c0 = vmaxps_avx(_local_7a0,auVar320);
        auVar392 = ZEXT3264(_local_7c0);
        local_380 = _local_7c0;
        auVar28 = vcmpps_avx(_local_7a0,local_3a0,2);
        local_720 = vandps_avx(auVar28,auVar128);
        auVar28 = vcmpps_avx(_local_7c0,local_360,2);
        local_7e0 = vandps_avx(auVar28,auVar128);
        auVar128 = vorps_avx(local_7e0,local_720);
        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar128 >> 0x7f,0) != '\0') ||
              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar128 >> 0xbf,0) != '\0') ||
            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar128[0x1f] < '\0') {
          local_940 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_800._0_4_ = auVar175._0_4_ ^ local_940._0_4_;
          local_800._4_4_ = auVar175._4_4_ ^ local_940._4_4_;
          local_800._8_4_ = auVar175._8_4_ ^ local_940._8_4_;
          local_800._12_4_ = auVar175._12_4_ ^ local_940._12_4_;
          local_800._16_4_ = auVar175._16_4_ ^ local_940._16_4_;
          local_800._20_4_ = auVar175._20_4_ ^ local_940._20_4_;
          local_800._24_4_ = auVar175._24_4_ ^ local_940._24_4_;
          local_800._28_4_ = (uint)auVar175._28_4_ ^ local_940._28_4_;
          auVar136._0_4_ =
               auVar166._0_4_ * (float)local_aa0._0_4_ +
               (float)local_860._0_4_ * auVar238._0_4_ + (float)local_a20._0_4_ * auVar261._0_4_;
          auVar136._4_4_ =
               auVar166._4_4_ * (float)local_aa0._4_4_ +
               (float)local_860._4_4_ * auVar238._4_4_ + (float)local_a20._4_4_ * auVar261._4_4_;
          auVar136._8_4_ =
               auVar166._8_4_ * fStack_a98 +
               fStack_858 * auVar238._8_4_ + fStack_a18 * auVar261._8_4_;
          auVar136._12_4_ =
               auVar166._12_4_ * fStack_a94 +
               fStack_854 * auVar238._12_4_ + fStack_a14 * auVar261._12_4_;
          auVar136._16_4_ =
               auVar166._16_4_ * fStack_a90 +
               fStack_850 * auVar238._16_4_ + fStack_a10 * auVar261._16_4_;
          auVar136._20_4_ =
               auVar166._20_4_ * fStack_a8c +
               fStack_84c * auVar238._20_4_ + fStack_a0c * auVar261._20_4_;
          auVar136._24_4_ =
               auVar166._24_4_ * fStack_a88 +
               fStack_848 * auVar238._24_4_ + fStack_a08 * auVar261._24_4_;
          auVar136._28_4_ = auVar175._28_4_ + auVar166._28_4_ + fStack_844;
          auVar169._8_4_ = 0x7fffffff;
          auVar169._0_8_ = 0x7fffffff7fffffff;
          auVar169._12_4_ = 0x7fffffff;
          auVar169._16_4_ = 0x7fffffff;
          auVar169._20_4_ = 0x7fffffff;
          auVar169._24_4_ = 0x7fffffff;
          auVar169._28_4_ = 0x7fffffff;
          auVar128 = vandps_avx(auVar136,auVar169);
          auVar170._8_4_ = 0x3e99999a;
          auVar170._0_8_ = 0x3e99999a3e99999a;
          auVar170._12_4_ = 0x3e99999a;
          auVar170._16_4_ = 0x3e99999a;
          auVar170._20_4_ = 0x3e99999a;
          auVar170._24_4_ = 0x3e99999a;
          auVar170._28_4_ = 0x3e99999a;
          auVar128 = vcmpps_avx(auVar128,auVar170,1);
          auVar128 = vorps_avx(auVar128,local_800);
          auVar171._8_4_ = 3;
          auVar171._0_8_ = 0x300000003;
          auVar171._12_4_ = 3;
          auVar171._16_4_ = 3;
          auVar171._20_4_ = 3;
          auVar171._24_4_ = 3;
          auVar171._28_4_ = 3;
          auVar209._8_4_ = 2;
          auVar209._0_8_ = 0x200000002;
          auVar209._12_4_ = 2;
          auVar209._16_4_ = 2;
          auVar209._20_4_ = 2;
          auVar209._24_4_ = 2;
          auVar209._28_4_ = 2;
          auVar128 = vblendvps_avx(auVar209,auVar171,auVar128);
          local_760 = ZEXT432(local_ce4);
          local_780 = vpshufd_avx(ZEXT416(local_ce4),0);
          fVar148 = 0.0;
          auVar201 = vpcmpgtd_avx(auVar128._16_16_,local_780);
          auStack_770 = auVar31._16_16_;
          auVar198 = vpcmpgtd_avx(auVar128._0_16_,local_780);
          auVar172._16_16_ = auVar201;
          auVar172._0_16_ = auVar198;
          local_740 = vblendps_avx(ZEXT1632(auVar198),auVar172,0xf0);
          local_6e0 = vandnps_avx(local_740,local_720);
          auVar178 = ZEXT3264(local_6e0);
          auVar128 = local_720 & ~local_740;
          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar128 >> 0x7f,0) == '\0') &&
                (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar128 >> 0xbf,0) == '\0') &&
              (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar128[0x1f]) {
            auVar201 = vshufps_avx(local_6c0,local_6c0,0);
            auVar137._16_16_ = auVar201;
            auVar137._0_16_ = auVar201;
            auVar261 = local_aa0._0_28_;
            fVar248 = (float)local_a20._0_4_;
            fVar223 = (float)local_a20._4_4_;
            fVar186 = fStack_a18;
            fVar146 = fStack_a14;
            fVar250 = fStack_a10;
            fVar251 = fStack_a0c;
            fVar252 = fStack_a08;
          }
          else {
            local_920._4_4_ = (float)local_b00._4_4_ + (float)local_7a0._4_4_;
            local_920._0_4_ = (float)local_b00._0_4_ + (float)local_7a0._0_4_;
            fStack_918 = fStack_af8 + fStack_798;
            fStack_914 = fStack_af4 + fStack_794;
            fStack_910 = fStack_af0 + fStack_790;
            fStack_90c = fStack_aec + fStack_78c;
            fStack_908 = fStack_ae8 + fStack_788;
            fStack_904 = fStack_ae4 + fStack_784;
            do {
              auVar138._8_4_ = 0x7f800000;
              auVar138._0_8_ = 0x7f8000007f800000;
              auVar138._12_4_ = 0x7f800000;
              auVar138._16_4_ = 0x7f800000;
              auVar138._20_4_ = 0x7f800000;
              auVar138._24_4_ = 0x7f800000;
              auVar138._28_4_ = 0x7f800000;
              auVar128 = auVar178._0_32_;
              auVar175 = vblendvps_avx(auVar138,_local_7a0,auVar128);
              auVar28 = vshufps_avx(auVar175,auVar175,0xb1);
              auVar28 = vminps_avx(auVar175,auVar28);
              auVar29 = vshufpd_avx(auVar28,auVar28,5);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar29 = vperm2f128_avx(auVar28,auVar28,1);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar175 = vcmpps_avx(auVar175,auVar28,0);
              auVar28 = auVar128 & auVar175;
              if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar28 >> 0x7f,0) != '\0') ||
                    (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0xbf,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar28[0x1f] < '\0') {
                auVar128 = vandps_avx(auVar175,auVar128);
              }
              uVar110 = vmovmskps_avx(auVar128);
              uVar106 = 0;
              if (uVar110 != 0) {
                for (; (uVar110 >> uVar106 & 1) == 0; uVar106 = uVar106 + 1) {
                }
              }
              uVar108 = (ulong)uVar106;
              *(undefined4 *)(local_6e0 + uVar108 * 4) = 0;
              fVar148 = local_1a0[uVar108];
              uVar106 = *(uint *)(local_3c0 + uVar108 * 4);
              fVar248 = auVar152._0_4_;
              if ((float)local_960._0_4_ < 0.0) {
                fVar248 = sqrtf((float)local_960._0_4_);
              }
              auVar198 = vminps_avx(_local_b10,_local_b30);
              auVar201 = vmaxps_avx(_local_b10,_local_b30);
              auVar125 = vminps_avx(_local_b20,_local_b40);
              auVar157 = vminps_avx(auVar198,auVar125);
              auVar198 = vmaxps_avx(_local_b20,_local_b40);
              auVar125 = vmaxps_avx(auVar201,auVar198);
              auVar228._8_4_ = 0x7fffffff;
              auVar228._0_8_ = 0x7fffffff7fffffff;
              auVar228._12_4_ = 0x7fffffff;
              auVar201 = vandps_avx(auVar157,auVar228);
              auVar198 = vandps_avx(auVar125,auVar228);
              auVar201 = vmaxps_avx(auVar201,auVar198);
              auVar198 = vmovshdup_avx(auVar201);
              auVar198 = vmaxss_avx(auVar198,auVar201);
              auVar201 = vshufpd_avx(auVar201,auVar201,1);
              auVar201 = vmaxss_avx(auVar201,auVar198);
              fVar182 = auVar201._0_4_ * 1.9073486e-06;
              local_9a0._0_4_ = fVar248 * 1.9073486e-06;
              local_840._0_16_ = vshufps_avx(auVar125,auVar125,0xff);
              auVar201 = vinsertps_avx(ZEXT416(uVar106),ZEXT416((uint)fVar148),0x10);
              auVar392 = ZEXT1664(auVar201);
              bVar117 = true;
              uVar108 = 0;
              do {
                auVar385 = auVar392._0_16_;
                auVar201 = vshufps_avx(auVar385,auVar385,0);
                auVar122._0_4_ = auVar201._0_4_ * (float)local_950._0_4_ + 0.0;
                auVar122._4_4_ = auVar201._4_4_ * (float)local_950._4_4_ + 0.0;
                auVar122._8_4_ = auVar201._8_4_ * fStack_948 + 0.0;
                auVar122._12_4_ = auVar201._12_4_ * fStack_944 + 0.0;
                auVar201 = vmovshdup_avx(auVar385);
                fVar146 = auVar201._0_4_;
                fVar186 = 1.0 - fVar146;
                fVar248 = fVar146 * fVar146;
                fVar223 = fVar146 * 3.0;
                fVar148 = fVar223 + -5.0;
                auVar201 = ZEXT416((uint)(fVar146 * fVar146 * -fVar186 * 0.5));
                auVar201 = vshufps_avx(auVar201,auVar201,0);
                auVar198 = ZEXT416((uint)((fVar186 * fVar186 * (fVar186 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                auVar125 = ZEXT416((uint)((fVar248 * fVar148 + 2.0) * 0.5));
                auVar125 = vshufps_avx(auVar125,auVar125,0);
                auVar157 = ZEXT416((uint)(fVar186 * fVar186 * -fVar146 * 0.5));
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar192._0_4_ =
                     auVar157._0_4_ * (float)local_b10._0_4_ +
                     auVar125._0_4_ * (float)local_b30._0_4_ +
                     auVar198._0_4_ * (float)local_b20._0_4_ +
                     auVar201._0_4_ * (float)local_b40._0_4_;
                auVar192._4_4_ =
                     auVar157._4_4_ * (float)local_b10._4_4_ +
                     auVar125._4_4_ * (float)local_b30._4_4_ +
                     auVar198._4_4_ * (float)local_b20._4_4_ +
                     auVar201._4_4_ * (float)local_b40._4_4_;
                auVar192._8_4_ =
                     auVar157._8_4_ * fStack_b08 +
                     auVar125._8_4_ * fStack_b28 +
                     auVar198._8_4_ * fStack_b18 + auVar201._8_4_ * fStack_b38;
                auVar192._12_4_ =
                     auVar157._12_4_ * fStack_b04 +
                     auVar125._12_4_ * fStack_b24 +
                     auVar198._12_4_ * fStack_b14 + auVar201._12_4_ * fStack_b34;
                local_900._0_16_ = auVar192;
                auVar201 = vsubps_avx(auVar122,auVar192);
                _local_ae0 = auVar201;
                auVar201 = vdpps_avx(auVar201,auVar201,0x7f);
                local_ac0 = fVar146 * -9.0 + 4.0;
                fStack_abc = 0.0;
                fStack_ab8 = 0.0;
                fStack_ab4 = 0.0;
                fVar249 = auVar201._0_4_;
                if (fVar249 < 0.0) {
                  local_980._0_4_ = fVar248;
                  local_9c0._0_4_ = fVar223;
                  local_9e0._0_4_ = fVar146 * 9.0;
                  local_a00._0_4_ = fVar148;
                  local_820._0_4_ = fVar186 * -2.0;
                  fVar250 = sqrtf(fVar249);
                  fVar251 = (float)local_820._0_4_;
                  fVar248 = (float)local_9c0._0_4_;
                  fVar252 = (float)local_9e0._0_4_;
                  fVar148 = (float)local_a00._0_4_;
                }
                else {
                  auVar198 = vsqrtss_avx(auVar201,auVar201);
                  fVar250 = auVar198._0_4_;
                  fVar251 = fVar186 * -2.0;
                  local_980._0_4_ = fVar248;
                  fVar248 = fVar223;
                  fVar252 = fVar146 * 9.0;
                }
                auVar198 = ZEXT416((uint)(((float)local_980._0_4_ + fVar146 * fVar251) * 0.5));
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                auVar125 = ZEXT416((uint)(((fVar186 + fVar186) * (fVar248 + 2.0) +
                                          fVar186 * fVar186 * -3.0) * 0.5));
                auVar125 = vshufps_avx(auVar125,auVar125,0);
                auVar157 = ZEXT416((uint)((fVar148 * (fVar146 + fVar146) + fVar146 * fVar248) * 0.5)
                                  );
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar158 = ZEXT416((uint)((fVar146 * (fVar186 + fVar186) - fVar186 * fVar186) * 0.5)
                                  );
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar372._0_4_ =
                     (float)local_b10._0_4_ * auVar158._0_4_ +
                     (float)local_b30._0_4_ * auVar157._0_4_ +
                     (float)local_b40._0_4_ * auVar198._0_4_ +
                     (float)local_b20._0_4_ * auVar125._0_4_;
                auVar372._4_4_ =
                     (float)local_b10._4_4_ * auVar158._4_4_ +
                     (float)local_b30._4_4_ * auVar157._4_4_ +
                     (float)local_b40._4_4_ * auVar198._4_4_ +
                     (float)local_b20._4_4_ * auVar125._4_4_;
                auVar372._8_4_ =
                     fStack_b08 * auVar158._8_4_ +
                     fStack_b28 * auVar157._8_4_ +
                     fStack_b38 * auVar198._8_4_ + fStack_b18 * auVar125._8_4_;
                auVar372._12_4_ =
                     fStack_b04 * auVar158._12_4_ +
                     fStack_b24 * auVar157._12_4_ +
                     fStack_b34 * auVar198._12_4_ + fStack_b14 * auVar125._12_4_;
                auVar158 = vpermilps_avx(ZEXT416((uint)(fVar223 + -1.0)),0);
                auVar100._4_4_ = fStack_abc;
                auVar100._0_4_ = local_ac0;
                auVar100._8_4_ = fStack_ab8;
                auVar100._12_4_ = fStack_ab4;
                auVar10 = vpermilps_avx(auVar100,0);
                auVar198 = vshufps_avx(ZEXT416((uint)(fVar252 + -5.0)),
                                       ZEXT416((uint)(fVar252 + -5.0)),0);
                auVar125 = ZEXT416((uint)(fVar146 * -3.0 + 2.0));
                auVar157 = vshufps_avx(auVar125,auVar125,0);
                auVar125 = vdpps_avx(auVar372,auVar372,0x7f);
                auVar153._0_4_ =
                     (float)local_b10._0_4_ * auVar157._0_4_ +
                     (float)local_b30._0_4_ * auVar198._0_4_ +
                     (float)local_b20._0_4_ * auVar10._0_4_ +
                     (float)local_b40._0_4_ * auVar158._0_4_;
                auVar153._4_4_ =
                     (float)local_b10._4_4_ * auVar157._4_4_ +
                     (float)local_b30._4_4_ * auVar198._4_4_ +
                     (float)local_b20._4_4_ * auVar10._4_4_ +
                     (float)local_b40._4_4_ * auVar158._4_4_;
                auVar153._8_4_ =
                     fStack_b08 * auVar157._8_4_ +
                     fStack_b28 * auVar198._8_4_ +
                     fStack_b18 * auVar10._8_4_ + fStack_b38 * auVar158._8_4_;
                auVar153._12_4_ =
                     fStack_b04 * auVar157._12_4_ +
                     fStack_b24 * auVar198._12_4_ +
                     fStack_b14 * auVar10._12_4_ + fStack_b34 * auVar158._12_4_;
                auVar198 = vblendps_avx(auVar125,_DAT_01f7aa10,0xe);
                auVar157 = vrsqrtss_avx(auVar198,auVar198);
                fVar248 = auVar157._0_4_;
                fVar148 = auVar125._0_4_;
                auVar157 = vdpps_avx(auVar372,auVar153,0x7f);
                auVar158 = vshufps_avx(auVar125,auVar125,0);
                auVar154._0_4_ = auVar153._0_4_ * auVar158._0_4_;
                auVar154._4_4_ = auVar153._4_4_ * auVar158._4_4_;
                auVar154._8_4_ = auVar153._8_4_ * auVar158._8_4_;
                auVar154._12_4_ = auVar153._12_4_ * auVar158._12_4_;
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar257._0_4_ = auVar372._0_4_ * auVar157._0_4_;
                auVar257._4_4_ = auVar372._4_4_ * auVar157._4_4_;
                auVar257._8_4_ = auVar372._8_4_ * auVar157._8_4_;
                auVar257._12_4_ = auVar372._12_4_ * auVar157._12_4_;
                auVar158 = vsubps_avx(auVar154,auVar257);
                auVar157 = vrcpss_avx(auVar198,auVar198);
                auVar198 = vmaxss_avx(ZEXT416((uint)fVar182),
                                      ZEXT416((uint)(auVar392._0_4_ * (float)local_9a0._0_4_)));
                local_ac0 = auVar198._0_4_;
                auVar198 = ZEXT416((uint)(auVar157._0_4_ * (2.0 - fVar148 * auVar157._0_4_)));
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                uVar95 = CONCAT44(auVar372._4_4_,auVar372._0_4_);
                auVar311._0_8_ = uVar95 ^ 0x8000000080000000;
                auVar311._8_4_ = -auVar372._8_4_;
                auVar311._12_4_ = -auVar372._12_4_;
                auVar157 = ZEXT416((uint)(fVar248 * 1.5 +
                                         fVar148 * -0.5 * fVar248 * fVar248 * fVar248));
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar229._0_4_ = auVar157._0_4_ * auVar158._0_4_ * auVar198._0_4_;
                auVar229._4_4_ = auVar157._4_4_ * auVar158._4_4_ * auVar198._4_4_;
                auVar229._8_4_ = auVar157._8_4_ * auVar158._8_4_ * auVar198._8_4_;
                auVar229._12_4_ = auVar157._12_4_ * auVar158._12_4_ * auVar198._12_4_;
                local_980._0_4_ = auVar372._0_4_ * auVar157._0_4_;
                local_980._4_4_ = auVar372._4_4_ * auVar157._4_4_;
                local_980._8_4_ = auVar372._8_4_ * auVar157._8_4_;
                local_980._12_4_ = auVar372._12_4_ * auVar157._12_4_;
                if (fVar148 < 0.0) {
                  fVar148 = sqrtf(fVar148);
                }
                else {
                  auVar198 = vsqrtss_avx(auVar125,auVar125);
                  fVar148 = auVar198._0_4_;
                }
                auVar198 = vdpps_avx(_local_ae0,local_980._0_16_,0x7f);
                fVar148 = (fVar182 / fVar148) * (fVar250 + 1.0) + fVar250 * fVar182 + local_ac0;
                auVar125 = vdpps_avx(auVar311,local_980._0_16_,0x7f);
                auVar157 = vdpps_avx(_local_ae0,auVar229,0x7f);
                auVar158 = vdpps_avx(_local_950,local_980._0_16_,0x7f);
                auVar10 = vdpps_avx(_local_ae0,auVar311,0x7f);
                fVar248 = auVar125._0_4_ + auVar157._0_4_;
                fVar223 = auVar198._0_4_;
                auVar123._0_4_ = fVar223 * fVar223;
                auVar123._4_4_ = auVar198._4_4_ * auVar198._4_4_;
                auVar123._8_4_ = auVar198._8_4_ * auVar198._8_4_;
                auVar123._12_4_ = auVar198._12_4_ * auVar198._12_4_;
                auVar157 = vsubps_avx(auVar201,auVar123);
                local_980._0_16_ = ZEXT416((uint)fVar248);
                auVar125 = vdpps_avx(_local_ae0,_local_950,0x7f);
                fVar186 = auVar10._0_4_ - fVar223 * fVar248;
                fVar223 = auVar125._0_4_ - fVar223 * auVar158._0_4_;
                auVar125 = vrsqrtss_avx(auVar157,auVar157);
                fVar146 = auVar157._0_4_;
                fVar248 = auVar125._0_4_;
                fVar248 = fVar248 * 1.5 + fVar146 * -0.5 * fVar248 * fVar248 * fVar248;
                if (fVar146 < 0.0) {
                  local_9c0._0_4_ = fVar186;
                  local_9e0._0_4_ = fVar223;
                  local_a00._0_4_ = fVar248;
                  fVar146 = sqrtf(fVar146);
                  fVar248 = (float)local_a00._0_4_;
                  fVar186 = (float)local_9c0._0_4_;
                  fVar223 = (float)local_9e0._0_4_;
                }
                else {
                  auVar125 = vsqrtss_avx(auVar157,auVar157);
                  fVar146 = auVar125._0_4_;
                }
                auVar10 = vpermilps_avx(local_900._0_16_,0xff);
                auVar11 = vshufps_avx(auVar372,auVar372,0xff);
                fVar186 = fVar186 * fVar248 - auVar11._0_4_;
                auVar258._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
                auVar258._8_4_ = auVar158._8_4_ ^ 0x80000000;
                auVar258._12_4_ = auVar158._12_4_ ^ 0x80000000;
                auVar279._0_4_ = -fVar186;
                auVar279._4_4_ = 0x80000000;
                auVar279._8_4_ = 0x80000000;
                auVar279._12_4_ = 0x80000000;
                auVar345 = ZEXT1664(local_980._0_16_);
                auVar125 = vinsertps_avx(auVar279,ZEXT416((uint)(fVar223 * fVar248)),0x1c);
                auVar158 = vmovsldup_avx(ZEXT416((uint)(local_980._0_4_ * fVar223 * fVar248 -
                                                       auVar158._0_4_ * fVar186)));
                auVar125 = vdivps_avx(auVar125,auVar158);
                auVar157 = vinsertps_avx(local_980._0_16_,auVar258,0x10);
                auVar157 = vdivps_avx(auVar157,auVar158);
                auVar158 = vmovsldup_avx(auVar198);
                auVar127 = ZEXT416((uint)(fVar146 - auVar10._0_4_));
                auVar10 = vmovsldup_avx(auVar127);
                auVar193._0_4_ = auVar158._0_4_ * auVar125._0_4_ + auVar10._0_4_ * auVar157._0_4_;
                auVar193._4_4_ = auVar158._4_4_ * auVar125._4_4_ + auVar10._4_4_ * auVar157._4_4_;
                auVar193._8_4_ = auVar158._8_4_ * auVar125._8_4_ + auVar10._8_4_ * auVar157._8_4_;
                auVar193._12_4_ =
                     auVar158._12_4_ * auVar125._12_4_ + auVar10._12_4_ * auVar157._12_4_;
                auVar125 = vsubps_avx(auVar385,auVar193);
                auVar392 = ZEXT1664(auVar125);
                auVar194._8_4_ = 0x7fffffff;
                auVar194._0_8_ = 0x7fffffff7fffffff;
                auVar194._12_4_ = 0x7fffffff;
                auVar198 = vandps_avx(auVar198,auVar194);
                auVar261 = local_aa0._0_28_;
                fVar248 = (float)local_a20._0_4_;
                fVar223 = (float)local_a20._4_4_;
                fVar186 = fStack_a18;
                fVar146 = fStack_a14;
                fVar250 = fStack_a10;
                fVar251 = fStack_a0c;
                fVar252 = fStack_a08;
                fVar384 = (float)local_b00._0_4_;
                fVar393 = (float)local_b00._4_4_;
                fVar291 = fStack_af8;
                fVar302 = fStack_af4;
                fVar303 = fStack_af0;
                fVar304 = fStack_aec;
                fVar305 = fStack_ae8;
                fVar306 = fStack_ae4;
                if (auVar198._0_4_ < fVar148) {
                  auVar230._8_4_ = 0x7fffffff;
                  auVar230._0_8_ = 0x7fffffff7fffffff;
                  auVar230._12_4_ = 0x7fffffff;
                  auVar198 = vandps_avx(auVar127,auVar230);
                  if (auVar198._0_4_ < (float)local_840._0_4_ * 1.9073486e-06 + fVar148 + local_ac0)
                  {
                    fVar148 = auVar125._0_4_ + (float)local_8e0._0_4_;
                    if (fVar148 < fVar225) {
                      bVar105 = 0;
                      goto LAB_011b0c60;
                    }
                    fVar182 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar182 < fVar148) {
                      bVar105 = 0;
                      goto LAB_011b0c60;
                    }
                    auVar198 = vmovshdup_avx(auVar125);
                    bVar105 = 0;
                    if ((auVar198._0_4_ < 0.0) || (bVar105 = 0, 1.0 < auVar198._0_4_))
                    goto LAB_011b0c60;
                    auVar201 = vrsqrtss_avx(auVar201,auVar201);
                    fVar254 = auVar201._0_4_;
                    pGVar23 = (context->scene->geometries).items[local_a58].ptr;
                    if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar105 = 0;
                      goto LAB_011b0c60;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar105 = 1, pGVar23->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_011b0c60;
                    auVar201 = ZEXT416((uint)(fVar254 * 1.5 +
                                             fVar249 * -0.5 * fVar254 * fVar254 * fVar254));
                    auVar201 = vshufps_avx(auVar201,auVar201,0);
                    auVar195._0_4_ = auVar201._0_4_ * (float)local_ae0._0_4_;
                    auVar195._4_4_ = auVar201._4_4_ * (float)local_ae0._4_4_;
                    auVar195._8_4_ = auVar201._8_4_ * fStack_ad8;
                    auVar195._12_4_ = auVar201._12_4_ * fStack_ad4;
                    auVar155._0_4_ = auVar372._0_4_ + auVar11._0_4_ * auVar195._0_4_;
                    auVar155._4_4_ = auVar372._4_4_ + auVar11._4_4_ * auVar195._4_4_;
                    auVar155._8_4_ = auVar372._8_4_ + auVar11._8_4_ * auVar195._8_4_;
                    auVar155._12_4_ = auVar372._12_4_ + auVar11._12_4_ * auVar195._12_4_;
                    auVar201 = vshufps_avx(auVar195,auVar195,0xc9);
                    auVar198 = vshufps_avx(auVar372,auVar372,0xc9);
                    auVar196._0_4_ = auVar198._0_4_ * auVar195._0_4_;
                    auVar196._4_4_ = auVar198._4_4_ * auVar195._4_4_;
                    auVar196._8_4_ = auVar198._8_4_ * auVar195._8_4_;
                    auVar196._12_4_ = auVar198._12_4_ * auVar195._12_4_;
                    auVar231._0_4_ = auVar372._0_4_ * auVar201._0_4_;
                    auVar231._4_4_ = auVar372._4_4_ * auVar201._4_4_;
                    auVar231._8_4_ = auVar372._8_4_ * auVar201._8_4_;
                    auVar231._12_4_ = auVar372._12_4_ * auVar201._12_4_;
                    auVar157 = vsubps_avx(auVar231,auVar196);
                    auVar201 = vshufps_avx(auVar157,auVar157,0xc9);
                    auVar198 = vshufps_avx(auVar155,auVar155,0xc9);
                    auVar232._0_4_ = auVar198._0_4_ * auVar201._0_4_;
                    auVar232._4_4_ = auVar198._4_4_ * auVar201._4_4_;
                    auVar232._8_4_ = auVar198._8_4_ * auVar201._8_4_;
                    auVar232._12_4_ = auVar198._12_4_ * auVar201._12_4_;
                    auVar201 = vshufps_avx(auVar157,auVar157,0xd2);
                    auVar156._0_4_ = auVar155._0_4_ * auVar201._0_4_;
                    auVar156._4_4_ = auVar155._4_4_ * auVar201._4_4_;
                    auVar156._8_4_ = auVar155._8_4_ * auVar201._8_4_;
                    auVar156._12_4_ = auVar155._12_4_ * auVar201._12_4_;
                    auVar201 = vsubps_avx(auVar232,auVar156);
                    pRVar26 = context->user;
                    local_640 = vshufps_avx(auVar125,auVar125,0x55);
                    auStack_690 = vshufps_avx(auVar201,auVar201,0x55);
                    local_680 = vshufps_avx(auVar201,auVar201,0xaa);
                    local_660 = vshufps_avx(auVar201,auVar201,0);
                    local_6a0 = (RTCHitN  [16])auStack_690;
                    local_620 = ZEXT832(0) << 0x20;
                    local_600 = local_540._0_8_;
                    uStack_5f8 = local_540._8_8_;
                    uStack_5f0 = local_540._16_8_;
                    uStack_5e8 = local_540._24_8_;
                    local_5e0 = local_520._0_8_;
                    uStack_5d8 = local_520._8_8_;
                    uStack_5d0 = local_520._16_8_;
                    uStack_5c8 = local_520._24_8_;
                    *(undefined8 *)(local_a60 + 8) = local_940._0_8_;
                    *(undefined8 *)(local_a60 + 10) = local_940._8_8_;
                    *(undefined8 *)(local_a60 + 0xc) = local_940._16_8_;
                    *(undefined8 *)(local_a60 + 0xe) = local_940._24_8_;
                    *(undefined8 *)local_a60 = local_940._0_8_;
                    *(undefined8 *)(local_a60 + 2) = local_940._8_8_;
                    *(undefined8 *)(local_a60 + 4) = local_940._16_8_;
                    *(undefined8 *)(local_a60 + 6) = local_940._24_8_;
                    local_5c0 = pRVar26->instID[0];
                    local_5a0 = pRVar26->instPrimID[0];
                    *(float *)(ray + k * 4 + 0x100) = fVar148;
                    local_b60 = *local_a68;
                    local_b50 = *local_a70;
                    local_a50.valid = (int *)local_b60;
                    local_a50.geometryUserPtr = pGVar23->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_6a0;
                    local_a50.N = 8;
                    local_a50.ray = (RTCRayN *)ray;
                    local_670 = local_680;
                    local_650 = local_660;
                    local_630 = local_640;
                    uStack_5bc = local_5c0;
                    uStack_5b8 = local_5c0;
                    uStack_5b4 = local_5c0;
                    uStack_5b0 = local_5c0;
                    uStack_5ac = local_5c0;
                    uStack_5a8 = local_5c0;
                    uStack_5a4 = local_5c0;
                    uStack_59c = local_5a0;
                    uStack_598 = local_5a0;
                    uStack_594 = local_5a0;
                    uStack_590 = local_5a0;
                    uStack_58c = local_5a0;
                    uStack_588 = local_5a0;
                    uStack_584 = local_5a0;
                    if (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar345 = ZEXT1664(local_980._0_16_);
                      auVar392 = ZEXT1664(auVar125);
                      (*pGVar23->occlusionFilterN)(&local_a50);
                    }
                    auVar201 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                    auVar198 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                    auVar210._16_16_ = auVar198;
                    auVar210._0_16_ = auVar201;
                    auVar128 = local_940 & ~auVar210;
                    fVar248 = (float)local_a20._0_4_;
                    fVar223 = (float)local_a20._4_4_;
                    fVar186 = fStack_a18;
                    fVar146 = fStack_a14;
                    fVar250 = fStack_a10;
                    fVar251 = fStack_a0c;
                    fVar252 = fStack_a08;
                    fVar384 = (float)local_b00._0_4_;
                    fVar393 = (float)local_b00._4_4_;
                    fVar291 = fStack_af8;
                    fVar302 = fStack_af4;
                    fVar303 = fStack_af0;
                    fVar304 = fStack_aec;
                    fVar305 = fStack_ae8;
                    fVar306 = fStack_ae4;
                    if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar128 >> 0x7f,0) == '\0') &&
                          (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar128 >> 0xbf,0) == '\0') &&
                        (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar128[0x1f]) {
                      auVar261 = local_aa0._0_28_;
                    }
                    else {
                      p_Var27 = context->args->filter;
                      if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar345 = ZEXT1664(auVar345._0_16_);
                        auVar392 = ZEXT1664(auVar392._0_16_);
                        (*p_Var27)(&local_a50);
                        fVar248 = (float)local_a20._0_4_;
                        fVar223 = (float)local_a20._4_4_;
                        fVar186 = fStack_a18;
                        fVar146 = fStack_a14;
                        fVar250 = fStack_a10;
                        fVar251 = fStack_a0c;
                        fVar252 = fStack_a08;
                        fVar384 = (float)local_b00._0_4_;
                        fVar393 = (float)local_b00._4_4_;
                        fVar291 = fStack_af8;
                        fVar302 = fStack_af4;
                        fVar303 = fStack_af0;
                        fVar304 = fStack_aec;
                        fVar305 = fStack_ae8;
                        fVar306 = fStack_ae4;
                      }
                      auVar201 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                      auVar198 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                      auVar139._16_16_ = auVar198;
                      auVar139._0_16_ = auVar201;
                      auVar173._8_4_ = 0xff800000;
                      auVar173._0_8_ = 0xff800000ff800000;
                      auVar173._12_4_ = 0xff800000;
                      auVar173._16_4_ = 0xff800000;
                      auVar173._20_4_ = 0xff800000;
                      auVar173._24_4_ = 0xff800000;
                      auVar173._28_4_ = 0xff800000;
                      auVar128 = vblendvps_avx(auVar173,*(undefined1 (*) [32])
                                                         (local_a50.ray + 0x100),auVar139);
                      *(undefined1 (*) [32])(local_a50.ray + 0x100) = auVar128;
                      auVar128 = local_940 & ~auVar139;
                      auVar261 = local_aa0._0_28_;
                      if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar128 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar128 >> 0x7f,0) != '\0') ||
                            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar128 >> 0xbf,0) != '\0') ||
                          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar128[0x1f] < '\0') {
                        bVar105 = 1;
                        goto LAB_011b0c60;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar182;
                    bVar105 = 0;
                    goto LAB_011b0c60;
                  }
                }
                bVar117 = uVar108 < 4;
                uVar108 = uVar108 + 1;
              } while (uVar108 != 5);
              bVar117 = false;
              bVar105 = 5;
LAB_011b0c60:
              bVar116 = (bool)(bVar116 | bVar117 & bVar105);
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar137._4_4_ = uVar7;
              auVar137._0_4_ = uVar7;
              auVar137._8_4_ = uVar7;
              auVar137._12_4_ = uVar7;
              auVar137._16_4_ = uVar7;
              auVar137._20_4_ = uVar7;
              auVar137._24_4_ = uVar7;
              auVar137._28_4_ = uVar7;
              auVar175 = vcmpps_avx(_local_920,auVar137,2);
              fVar148 = auVar175._28_4_;
              auVar128 = vandps_avx(auVar175,local_6e0);
              auVar178 = ZEXT3264(auVar128);
              auVar175 = local_6e0 & auVar175;
              local_6e0 = auVar128;
            } while ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar175 >> 0x7f,0) != '\0') ||
                       (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar175 >> 0xbf,0) != '\0') ||
                     (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar175[0x1f] < '\0');
            auVar178 = ZEXT3264(local_380);
          }
          auVar174._0_4_ =
               auVar261._0_4_ * (float)local_880._0_4_ +
               (float)local_860._0_4_ * (float)local_8a0._0_4_ + fVar248 * (float)local_8c0._0_4_;
          auVar174._4_4_ =
               auVar261._4_4_ * (float)local_880._4_4_ +
               (float)local_860._4_4_ * (float)local_8a0._4_4_ + fVar223 * (float)local_8c0._4_4_;
          auVar174._8_4_ =
               auVar261._8_4_ * fStack_878 + fStack_858 * fStack_898 + fVar186 * fStack_8b8;
          auVar174._12_4_ =
               auVar261._12_4_ * fStack_874 + fStack_854 * fStack_894 + fVar146 * fStack_8b4;
          auVar174._16_4_ =
               auVar261._16_4_ * fStack_870 + fStack_850 * fStack_890 + fVar250 * fStack_8b0;
          auVar174._20_4_ =
               auVar261._20_4_ * fStack_86c + fStack_84c * fStack_88c + fVar251 * fStack_8ac;
          auVar174._24_4_ =
               auVar261._24_4_ * fStack_868 + fStack_848 * fStack_888 + fVar252 * fStack_8a8;
          auVar174._28_4_ = fVar148 + fVar148 + auVar178._28_4_;
          auVar211._8_4_ = 0x7fffffff;
          auVar211._0_8_ = 0x7fffffff7fffffff;
          auVar211._12_4_ = 0x7fffffff;
          auVar211._16_4_ = 0x7fffffff;
          auVar211._20_4_ = 0x7fffffff;
          auVar211._24_4_ = 0x7fffffff;
          auVar211._28_4_ = 0x7fffffff;
          auVar128 = vandps_avx(auVar174,auVar211);
          auVar212._8_4_ = 0x3e99999a;
          auVar212._0_8_ = 0x3e99999a3e99999a;
          auVar212._12_4_ = 0x3e99999a;
          auVar212._16_4_ = 0x3e99999a;
          auVar212._20_4_ = 0x3e99999a;
          auVar212._24_4_ = 0x3e99999a;
          auVar212._28_4_ = 0x3e99999a;
          auVar128 = vcmpps_avx(auVar128,auVar212,1);
          auVar175 = vorps_avx(auVar128,local_800);
          auVar213._0_4_ = (float)local_7c0._0_4_ + fVar384;
          auVar213._4_4_ = (float)local_7c0._4_4_ + fVar393;
          auVar213._8_4_ = fStack_7b8 + fVar291;
          auVar213._12_4_ = fStack_7b4 + fVar302;
          auVar213._16_4_ = fStack_7b0 + fVar303;
          auVar213._20_4_ = fStack_7ac + fVar304;
          auVar213._24_4_ = fStack_7a8 + fVar305;
          auVar213._28_4_ = fStack_7a4 + fVar306;
          auVar128 = vcmpps_avx(auVar213,auVar137,2);
          _local_8c0 = vandps_avx(auVar128,local_7e0);
          auVar214._8_4_ = 3;
          auVar214._0_8_ = 0x300000003;
          auVar214._12_4_ = 3;
          auVar214._16_4_ = 3;
          auVar214._20_4_ = 3;
          auVar214._24_4_ = 3;
          auVar214._28_4_ = 3;
          auVar247._8_4_ = 2;
          auVar247._0_8_ = 0x200000002;
          auVar247._12_4_ = 2;
          auVar247._16_4_ = 2;
          auVar247._20_4_ = 2;
          auVar247._24_4_ = 2;
          auVar247._28_4_ = 2;
          auVar128 = vblendvps_avx(auVar247,auVar214,auVar175);
          auVar201 = vpcmpgtd_avx(auVar128._16_16_,local_780);
          auVar198 = vpshufd_avx(local_760._0_16_,0);
          auVar198 = vpcmpgtd_avx(auVar128._0_16_,auVar198);
          auVar215._16_16_ = auVar201;
          auVar215._0_16_ = auVar137._0_16_;
          _local_8a0 = vblendps_avx(ZEXT1632(auVar198),auVar215,0xf0);
          auVar128 = vandnps_avx(_local_8a0,_local_8c0);
          auVar175 = _local_8c0 & ~_local_8a0;
          local_700 = auVar128;
          if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar175 >> 0x7f,0) != '\0') ||
                (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar175 >> 0xbf,0) != '\0') ||
              (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar175[0x1f] < '\0') {
            local_880._4_4_ = fVar393 + local_380._4_4_;
            local_880._0_4_ = fVar384 + local_380._0_4_;
            fStack_878 = fVar291 + local_380._8_4_;
            fStack_874 = fVar302 + local_380._12_4_;
            fStack_870 = fVar303 + local_380._16_4_;
            fStack_86c = fVar304 + local_380._20_4_;
            fStack_868 = fVar305 + local_380._24_4_;
            fStack_864 = fVar306 + local_380._28_4_;
            _local_920 = local_380;
            do {
              auVar140._8_4_ = 0x7f800000;
              auVar140._0_8_ = 0x7f8000007f800000;
              auVar140._12_4_ = 0x7f800000;
              auVar140._16_4_ = 0x7f800000;
              auVar140._20_4_ = 0x7f800000;
              auVar140._24_4_ = 0x7f800000;
              auVar140._28_4_ = 0x7f800000;
              auVar175 = vblendvps_avx(auVar140,_local_920,auVar128);
              auVar28 = vshufps_avx(auVar175,auVar175,0xb1);
              auVar28 = vminps_avx(auVar175,auVar28);
              auVar29 = vshufpd_avx(auVar28,auVar28,5);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar29 = vperm2f128_avx(auVar28,auVar28,1);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar28 = vcmpps_avx(auVar175,auVar28,0);
              auVar29 = auVar128 & auVar28;
              auVar175 = auVar128;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                auVar175 = vandps_avx(auVar28,auVar128);
              }
              uVar110 = vmovmskps_avx(auVar175);
              uVar106 = 0;
              if (uVar110 != 0) {
                for (; (uVar110 >> uVar106 & 1) == 0; uVar106 = uVar106 + 1) {
                }
              }
              uVar108 = (ulong)uVar106;
              local_700 = auVar128;
              *(undefined4 *)(local_700 + uVar108 * 4) = 0;
              fVar148 = local_1c0[uVar108];
              uVar106 = *(uint *)(local_360 + uVar108 * 4);
              fVar248 = auVar36._0_4_;
              if ((float)local_960._0_4_ < 0.0) {
                fVar248 = sqrtf((float)local_960._0_4_);
              }
              auVar198 = vminps_avx(_local_b10,_local_b30);
              auVar201 = vmaxps_avx(_local_b10,_local_b30);
              auVar125 = vminps_avx(_local_b20,_local_b40);
              auVar157 = vminps_avx(auVar198,auVar125);
              auVar198 = vmaxps_avx(_local_b20,_local_b40);
              auVar125 = vmaxps_avx(auVar201,auVar198);
              auVar233._8_4_ = 0x7fffffff;
              auVar233._0_8_ = 0x7fffffff7fffffff;
              auVar233._12_4_ = 0x7fffffff;
              auVar201 = vandps_avx(auVar157,auVar233);
              auVar198 = vandps_avx(auVar125,auVar233);
              auVar201 = vmaxps_avx(auVar201,auVar198);
              auVar198 = vmovshdup_avx(auVar201);
              auVar198 = vmaxss_avx(auVar198,auVar201);
              auVar201 = vshufpd_avx(auVar201,auVar201,1);
              auVar201 = vmaxss_avx(auVar201,auVar198);
              fVar182 = auVar201._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar248 * 1.9073486e-06;
              local_840._0_16_ = vshufps_avx(auVar125,auVar125,0xff);
              auVar201 = vinsertps_avx(ZEXT416(uVar106),ZEXT416((uint)fVar148),0x10);
              auVar392 = ZEXT1664(auVar201);
              bVar117 = true;
              uVar108 = 0;
              do {
                auVar385 = auVar392._0_16_;
                auVar201 = vshufps_avx(auVar385,auVar385,0);
                auVar124._0_4_ = auVar201._0_4_ * (float)local_950._0_4_ + 0.0;
                auVar124._4_4_ = auVar201._4_4_ * (float)local_950._4_4_ + 0.0;
                auVar124._8_4_ = auVar201._8_4_ * fStack_948 + 0.0;
                auVar124._12_4_ = auVar201._12_4_ * fStack_944 + 0.0;
                auVar201 = vmovshdup_avx(auVar385);
                fVar146 = auVar201._0_4_;
                fVar186 = 1.0 - fVar146;
                fVar248 = fVar146 * fVar146;
                fVar223 = fVar146 * 3.0;
                fVar148 = fVar223 + -5.0;
                auVar201 = ZEXT416((uint)(fVar146 * fVar146 * -fVar186 * 0.5));
                auVar201 = vshufps_avx(auVar201,auVar201,0);
                auVar198 = ZEXT416((uint)((fVar186 * fVar186 * (fVar186 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                auVar125 = ZEXT416((uint)((fVar248 * fVar148 + 2.0) * 0.5));
                auVar125 = vshufps_avx(auVar125,auVar125,0);
                auVar157 = ZEXT416((uint)(fVar186 * fVar186 * -fVar146 * 0.5));
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar197._0_4_ =
                     auVar157._0_4_ * (float)local_b10._0_4_ +
                     auVar125._0_4_ * (float)local_b30._0_4_ +
                     auVar198._0_4_ * (float)local_b20._0_4_ +
                     auVar201._0_4_ * (float)local_b40._0_4_;
                auVar197._4_4_ =
                     auVar157._4_4_ * (float)local_b10._4_4_ +
                     auVar125._4_4_ * (float)local_b30._4_4_ +
                     auVar198._4_4_ * (float)local_b20._4_4_ +
                     auVar201._4_4_ * (float)local_b40._4_4_;
                auVar197._8_4_ =
                     auVar157._8_4_ * fStack_b08 +
                     auVar125._8_4_ * fStack_b28 +
                     auVar198._8_4_ * fStack_b18 + auVar201._8_4_ * fStack_b38;
                auVar197._12_4_ =
                     auVar157._12_4_ * fStack_b04 +
                     auVar125._12_4_ * fStack_b24 +
                     auVar198._12_4_ * fStack_b14 + auVar201._12_4_ * fStack_b34;
                local_900._0_16_ = auVar197;
                auVar201 = vsubps_avx(auVar124,auVar197);
                _local_ae0 = auVar201;
                auVar201 = vdpps_avx(auVar201,auVar201,0x7f);
                local_ac0 = fVar146 * -9.0 + 4.0;
                fStack_abc = 0.0;
                fStack_ab8 = 0.0;
                fStack_ab4 = 0.0;
                fVar249 = auVar201._0_4_;
                if (fVar249 < 0.0) {
                  local_9a0._0_4_ = fVar248;
                  local_9c0._0_4_ = fVar223;
                  local_9e0._0_4_ = fVar146 * 9.0;
                  local_a00._0_4_ = fVar148;
                  local_820._0_4_ = fVar186 * -2.0;
                  fVar250 = sqrtf(fVar249);
                  fVar148 = (float)local_a00._0_4_;
                  fVar251 = (float)local_820._0_4_;
                  fVar248 = (float)local_9a0._0_4_;
                  fVar252 = (float)local_9c0._0_4_;
                  fVar254 = (float)local_9e0._0_4_;
                }
                else {
                  auVar198 = vsqrtss_avx(auVar201,auVar201);
                  fVar250 = auVar198._0_4_;
                  fVar251 = fVar186 * -2.0;
                  fVar252 = fVar223;
                  fVar254 = fVar146 * 9.0;
                }
                auVar198 = ZEXT416((uint)((fVar248 + fVar146 * fVar251) * 0.5));
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                auVar125 = ZEXT416((uint)(((fVar186 + fVar186) * (fVar252 + 2.0) +
                                          fVar186 * fVar186 * -3.0) * 0.5));
                auVar125 = vshufps_avx(auVar125,auVar125,0);
                auVar157 = ZEXT416((uint)((fVar148 * (fVar146 + fVar146) + fVar146 * fVar252) * 0.5)
                                  );
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar345 = ZEXT1664(_local_b30);
                auVar158 = ZEXT416((uint)((fVar146 * (fVar186 + fVar186) - fVar186 * fVar186) * 0.5)
                                  );
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar373._0_4_ =
                     (float)local_b10._0_4_ * auVar158._0_4_ +
                     local_b30._0_4_ * auVar157._0_4_ +
                     (float)local_b40._0_4_ * auVar198._0_4_ +
                     (float)local_b20._0_4_ * auVar125._0_4_;
                auVar373._4_4_ =
                     (float)local_b10._4_4_ * auVar158._4_4_ +
                     local_b30._4_4_ * auVar157._4_4_ +
                     (float)local_b40._4_4_ * auVar198._4_4_ +
                     (float)local_b20._4_4_ * auVar125._4_4_;
                auVar373._8_4_ =
                     fStack_b08 * auVar158._8_4_ +
                     local_b30._8_4_ * auVar157._8_4_ +
                     fStack_b38 * auVar198._8_4_ + fStack_b18 * auVar125._8_4_;
                auVar373._12_4_ =
                     fStack_b04 * auVar158._12_4_ +
                     local_b30._12_4_ * auVar157._12_4_ +
                     fStack_b34 * auVar198._12_4_ + fStack_b14 * auVar125._12_4_;
                auVar158 = vpermilps_avx(ZEXT416((uint)(fVar223 + -1.0)),0);
                auVar101._4_4_ = fStack_abc;
                auVar101._0_4_ = local_ac0;
                auVar101._8_4_ = fStack_ab8;
                auVar101._12_4_ = fStack_ab4;
                auVar10 = vpermilps_avx(auVar101,0);
                auVar198 = vshufps_avx(ZEXT416((uint)(fVar254 + -5.0)),
                                       ZEXT416((uint)(fVar254 + -5.0)),0);
                auVar125 = ZEXT416((uint)(fVar146 * -3.0 + 2.0));
                auVar157 = vshufps_avx(auVar125,auVar125,0);
                auVar125 = vdpps_avx(auVar373,auVar373,0x7f);
                auVar159._0_4_ =
                     (float)local_b10._0_4_ * auVar157._0_4_ +
                     local_b30._0_4_ * auVar198._0_4_ +
                     (float)local_b20._0_4_ * auVar10._0_4_ +
                     (float)local_b40._0_4_ * auVar158._0_4_;
                auVar159._4_4_ =
                     (float)local_b10._4_4_ * auVar157._4_4_ +
                     local_b30._4_4_ * auVar198._4_4_ +
                     (float)local_b20._4_4_ * auVar10._4_4_ +
                     (float)local_b40._4_4_ * auVar158._4_4_;
                auVar159._8_4_ =
                     fStack_b08 * auVar157._8_4_ +
                     local_b30._8_4_ * auVar198._8_4_ +
                     fStack_b18 * auVar10._8_4_ + fStack_b38 * auVar158._8_4_;
                auVar159._12_4_ =
                     fStack_b04 * auVar157._12_4_ +
                     local_b30._12_4_ * auVar198._12_4_ +
                     fStack_b14 * auVar10._12_4_ + fStack_b34 * auVar158._12_4_;
                auVar198 = vblendps_avx(auVar125,_DAT_01f7aa10,0xe);
                auVar157 = vrsqrtss_avx(auVar198,auVar198);
                fVar248 = auVar157._0_4_;
                fVar148 = auVar125._0_4_;
                auVar157 = vdpps_avx(auVar373,auVar159,0x7f);
                auVar158 = vshufps_avx(auVar125,auVar125,0);
                auVar160._0_4_ = auVar159._0_4_ * auVar158._0_4_;
                auVar160._4_4_ = auVar159._4_4_ * auVar158._4_4_;
                auVar160._8_4_ = auVar159._8_4_ * auVar158._8_4_;
                auVar160._12_4_ = auVar159._12_4_ * auVar158._12_4_;
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar259._0_4_ = auVar373._0_4_ * auVar157._0_4_;
                auVar259._4_4_ = auVar373._4_4_ * auVar157._4_4_;
                auVar259._8_4_ = auVar373._8_4_ * auVar157._8_4_;
                auVar259._12_4_ = auVar373._12_4_ * auVar157._12_4_;
                auVar158 = vsubps_avx(auVar160,auVar259);
                auVar157 = vrcpss_avx(auVar198,auVar198);
                auVar198 = vmaxss_avx(ZEXT416((uint)fVar182),
                                      ZEXT416((uint)(auVar392._0_4_ * (float)local_980._0_4_)));
                local_ac0 = auVar198._0_4_;
                auVar198 = ZEXT416((uint)(auVar157._0_4_ * (2.0 - fVar148 * auVar157._0_4_)));
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                uVar95 = CONCAT44(auVar373._4_4_,auVar373._0_4_);
                auVar312._0_8_ = uVar95 ^ 0x8000000080000000;
                auVar312._8_4_ = -auVar373._8_4_;
                auVar312._12_4_ = -auVar373._12_4_;
                auVar157 = ZEXT416((uint)(fVar248 * 1.5 +
                                         fVar148 * -0.5 * fVar248 * fVar248 * fVar248));
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar234._0_4_ = auVar157._0_4_ * auVar158._0_4_ * auVar198._0_4_;
                auVar234._4_4_ = auVar157._4_4_ * auVar158._4_4_ * auVar198._4_4_;
                auVar234._8_4_ = auVar157._8_4_ * auVar158._8_4_ * auVar198._8_4_;
                auVar234._12_4_ = auVar157._12_4_ * auVar158._12_4_ * auVar198._12_4_;
                auVar294._0_4_ = auVar373._0_4_ * auVar157._0_4_;
                auVar294._4_4_ = auVar373._4_4_ * auVar157._4_4_;
                auVar294._8_4_ = auVar373._8_4_ * auVar157._8_4_;
                auVar294._12_4_ = auVar373._12_4_ * auVar157._12_4_;
                if (fVar148 < 0.0) {
                  local_9a0._0_16_ = auVar294;
                  auVar345 = ZEXT1664(_local_b30);
                  fVar148 = sqrtf(fVar148);
                  auVar294 = local_9a0._0_16_;
                }
                else {
                  auVar198 = vsqrtss_avx(auVar125,auVar125);
                  fVar148 = auVar198._0_4_;
                }
                auVar198 = vdpps_avx(_local_ae0,auVar294,0x7f);
                fVar148 = (fVar182 / fVar148) * (fVar250 + 1.0) + fVar250 * fVar182 + local_ac0;
                auVar125 = vdpps_avx(auVar312,auVar294,0x7f);
                auVar157 = vdpps_avx(_local_ae0,auVar234,0x7f);
                auVar158 = vdpps_avx(_local_950,auVar294,0x7f);
                auVar10 = vdpps_avx(_local_ae0,auVar312,0x7f);
                fVar248 = auVar125._0_4_ + auVar157._0_4_;
                fVar223 = auVar198._0_4_;
                auVar126._0_4_ = fVar223 * fVar223;
                auVar126._4_4_ = auVar198._4_4_ * auVar198._4_4_;
                auVar126._8_4_ = auVar198._8_4_ * auVar198._8_4_;
                auVar126._12_4_ = auVar198._12_4_ * auVar198._12_4_;
                auVar157 = vsubps_avx(auVar201,auVar126);
                auVar125 = vdpps_avx(_local_ae0,_local_950,0x7f);
                fVar186 = auVar10._0_4_ - fVar248 * fVar223;
                fVar146 = auVar125._0_4_ - fVar223 * auVar158._0_4_;
                auVar125 = vrsqrtss_avx(auVar157,auVar157);
                fVar250 = auVar157._0_4_;
                fVar223 = auVar125._0_4_;
                fVar223 = fVar223 * 1.5 + fVar250 * -0.5 * fVar223 * fVar223 * fVar223;
                if (fVar250 < 0.0) {
                  local_9a0._0_16_ = auVar158;
                  local_9c0._0_4_ = fVar186;
                  local_9e0._0_4_ = fVar146;
                  local_a00._0_4_ = fVar223;
                  auVar345 = ZEXT1664(auVar345._0_16_);
                  fVar250 = sqrtf(fVar250);
                  fVar223 = (float)local_a00._0_4_;
                  fVar186 = (float)local_9c0._0_4_;
                  fVar146 = (float)local_9e0._0_4_;
                  auVar158 = local_9a0._0_16_;
                }
                else {
                  auVar125 = vsqrtss_avx(auVar157,auVar157);
                  fVar250 = auVar125._0_4_;
                }
                auVar10 = vpermilps_avx(local_900._0_16_,0xff);
                auVar11 = vshufps_avx(auVar373,auVar373,0xff);
                fVar186 = fVar186 * fVar223 - auVar11._0_4_;
                auVar260._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
                auVar260._8_4_ = auVar158._8_4_ ^ 0x80000000;
                auVar260._12_4_ = auVar158._12_4_ ^ 0x80000000;
                auVar280._0_4_ = -fVar186;
                auVar280._4_4_ = 0x80000000;
                auVar280._8_4_ = 0x80000000;
                auVar280._12_4_ = 0x80000000;
                auVar125 = vinsertps_avx(auVar280,ZEXT416((uint)(fVar146 * fVar223)),0x1c);
                auVar158 = vmovsldup_avx(ZEXT416((uint)(fVar248 * fVar146 * fVar223 -
                                                       auVar158._0_4_ * fVar186)));
                auVar125 = vdivps_avx(auVar125,auVar158);
                auVar157 = vinsertps_avx(ZEXT416((uint)fVar248),auVar260,0x10);
                auVar157 = vdivps_avx(auVar157,auVar158);
                auVar158 = vmovsldup_avx(auVar198);
                auVar127 = ZEXT416((uint)(fVar250 - auVar10._0_4_));
                auVar10 = vmovsldup_avx(auVar127);
                auVar199._0_4_ = auVar158._0_4_ * auVar125._0_4_ + auVar10._0_4_ * auVar157._0_4_;
                auVar199._4_4_ = auVar158._4_4_ * auVar125._4_4_ + auVar10._4_4_ * auVar157._4_4_;
                auVar199._8_4_ = auVar158._8_4_ * auVar125._8_4_ + auVar10._8_4_ * auVar157._8_4_;
                auVar199._12_4_ =
                     auVar158._12_4_ * auVar125._12_4_ + auVar10._12_4_ * auVar157._12_4_;
                auVar125 = vsubps_avx(auVar385,auVar199);
                auVar392 = ZEXT1664(auVar125);
                auVar200._8_4_ = 0x7fffffff;
                auVar200._0_8_ = 0x7fffffff7fffffff;
                auVar200._12_4_ = 0x7fffffff;
                auVar198 = vandps_avx(auVar198,auVar200);
                fVar384 = (float)local_b00._0_4_;
                fVar393 = (float)local_b00._4_4_;
                fVar291 = fStack_af8;
                fVar302 = fStack_af4;
                fVar303 = fStack_af0;
                fVar304 = fStack_aec;
                fVar305 = fStack_ae8;
                fVar306 = fStack_ae4;
                if (auVar198._0_4_ < fVar148) {
                  auVar235._8_4_ = 0x7fffffff;
                  auVar235._0_8_ = 0x7fffffff7fffffff;
                  auVar235._12_4_ = 0x7fffffff;
                  auVar198 = vandps_avx(auVar127,auVar235);
                  if (auVar198._0_4_ < (float)local_840._0_4_ * 1.9073486e-06 + fVar148 + local_ac0)
                  {
                    fVar148 = auVar125._0_4_ + (float)local_8e0._0_4_;
                    if (fVar148 < fVar225) {
LAB_011b1920:
                      bVar105 = 0;
                      goto LAB_011b1940;
                    }
                    fVar248 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar148 <= fVar248) {
                      auVar198 = vmovshdup_avx(auVar125);
                      bVar105 = 0;
                      if ((auVar198._0_4_ < 0.0) || (1.0 < auVar198._0_4_)) goto LAB_011b1940;
                      auVar201 = vrsqrtss_avx(auVar201,auVar201);
                      fVar182 = auVar201._0_4_;
                      pGVar23 = (context->scene->geometries).items[local_a58].ptr;
                      if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_011b1920;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar105 = 1, pGVar23->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_011b1940;
                      auVar201 = ZEXT416((uint)(fVar182 * 1.5 +
                                               fVar249 * -0.5 * fVar182 * fVar182 * fVar182));
                      auVar201 = vshufps_avx(auVar201,auVar201,0);
                      auVar202._0_4_ = auVar201._0_4_ * (float)local_ae0._0_4_;
                      auVar202._4_4_ = auVar201._4_4_ * (float)local_ae0._4_4_;
                      auVar202._8_4_ = auVar201._8_4_ * fStack_ad8;
                      auVar202._12_4_ = auVar201._12_4_ * fStack_ad4;
                      auVar161._0_4_ = auVar373._0_4_ + auVar11._0_4_ * auVar202._0_4_;
                      auVar161._4_4_ = auVar373._4_4_ + auVar11._4_4_ * auVar202._4_4_;
                      auVar161._8_4_ = auVar373._8_4_ + auVar11._8_4_ * auVar202._8_4_;
                      auVar161._12_4_ = auVar373._12_4_ + auVar11._12_4_ * auVar202._12_4_;
                      auVar201 = vshufps_avx(auVar202,auVar202,0xc9);
                      auVar198 = vshufps_avx(auVar373,auVar373,0xc9);
                      auVar203._0_4_ = auVar198._0_4_ * auVar202._0_4_;
                      auVar203._4_4_ = auVar198._4_4_ * auVar202._4_4_;
                      auVar203._8_4_ = auVar198._8_4_ * auVar202._8_4_;
                      auVar203._12_4_ = auVar198._12_4_ * auVar202._12_4_;
                      auVar236._0_4_ = auVar373._0_4_ * auVar201._0_4_;
                      auVar236._4_4_ = auVar373._4_4_ * auVar201._4_4_;
                      auVar236._8_4_ = auVar373._8_4_ * auVar201._8_4_;
                      auVar236._12_4_ = auVar373._12_4_ * auVar201._12_4_;
                      auVar157 = vsubps_avx(auVar236,auVar203);
                      auVar201 = vshufps_avx(auVar157,auVar157,0xc9);
                      auVar198 = vshufps_avx(auVar161,auVar161,0xc9);
                      auVar237._0_4_ = auVar198._0_4_ * auVar201._0_4_;
                      auVar237._4_4_ = auVar198._4_4_ * auVar201._4_4_;
                      auVar237._8_4_ = auVar198._8_4_ * auVar201._8_4_;
                      auVar237._12_4_ = auVar198._12_4_ * auVar201._12_4_;
                      auVar201 = vshufps_avx(auVar157,auVar157,0xd2);
                      auVar162._0_4_ = auVar161._0_4_ * auVar201._0_4_;
                      auVar162._4_4_ = auVar161._4_4_ * auVar201._4_4_;
                      auVar162._8_4_ = auVar161._8_4_ * auVar201._8_4_;
                      auVar162._12_4_ = auVar161._12_4_ * auVar201._12_4_;
                      auVar201 = vsubps_avx(auVar237,auVar162);
                      pRVar26 = context->user;
                      local_640 = vshufps_avx(auVar125,auVar125,0x55);
                      auStack_690 = vshufps_avx(auVar201,auVar201,0x55);
                      local_680 = vshufps_avx(auVar201,auVar201,0xaa);
                      local_660 = vshufps_avx(auVar201,auVar201,0);
                      local_6a0 = (RTCHitN  [16])auStack_690;
                      local_620 = ZEXT832(0) << 0x20;
                      local_600 = local_540._0_8_;
                      uStack_5f8 = local_540._8_8_;
                      uStack_5f0 = local_540._16_8_;
                      uStack_5e8 = local_540._24_8_;
                      local_5e0 = local_520._0_8_;
                      uStack_5d8 = local_520._8_8_;
                      uStack_5d0 = local_520._16_8_;
                      uStack_5c8 = local_520._24_8_;
                      *(undefined8 *)(local_a60 + 8) = local_940._0_8_;
                      *(undefined8 *)(local_a60 + 10) = local_940._8_8_;
                      *(undefined8 *)(local_a60 + 0xc) = local_940._16_8_;
                      *(undefined8 *)(local_a60 + 0xe) = local_940._24_8_;
                      *(undefined8 *)local_a60 = local_940._0_8_;
                      *(undefined8 *)(local_a60 + 2) = local_940._8_8_;
                      *(undefined8 *)(local_a60 + 4) = local_940._16_8_;
                      *(undefined8 *)(local_a60 + 6) = local_940._24_8_;
                      local_5c0 = pRVar26->instID[0];
                      local_5a0 = pRVar26->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar148;
                      local_b60 = *local_a68;
                      local_b50 = *local_a70;
                      local_a50.valid = (int *)local_b60;
                      local_a50.geometryUserPtr = pGVar23->userPtr;
                      local_a50.context = context->user;
                      local_a50.hit = local_6a0;
                      local_a50.N = 8;
                      local_a50.ray = (RTCRayN *)ray;
                      local_670 = local_680;
                      local_650 = local_660;
                      local_630 = local_640;
                      uStack_5bc = local_5c0;
                      uStack_5b8 = local_5c0;
                      uStack_5b4 = local_5c0;
                      uStack_5b0 = local_5c0;
                      uStack_5ac = local_5c0;
                      uStack_5a8 = local_5c0;
                      uStack_5a4 = local_5c0;
                      uStack_59c = local_5a0;
                      uStack_598 = local_5a0;
                      uStack_594 = local_5a0;
                      uStack_590 = local_5a0;
                      uStack_58c = local_5a0;
                      uStack_588 = local_5a0;
                      uStack_584 = local_5a0;
                      if (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar345 = ZEXT1664(auVar345._0_16_);
                        auVar392 = ZEXT1664(auVar125);
                        (*pGVar23->occlusionFilterN)(&local_a50);
                      }
                      auVar201 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                      auVar198 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                      auVar216._16_16_ = auVar198;
                      auVar216._0_16_ = auVar201;
                      auVar128 = local_940 & ~auVar216;
                      fVar384 = (float)local_b00._0_4_;
                      fVar393 = (float)local_b00._4_4_;
                      fVar291 = fStack_af8;
                      fVar302 = fStack_af4;
                      fVar303 = fStack_af0;
                      fVar304 = fStack_aec;
                      fVar305 = fStack_ae8;
                      fVar306 = fStack_ae4;
                      if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar128 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar128 >> 0x7f,0) != '\0') ||
                            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar128 >> 0xbf,0) != '\0') ||
                          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar128[0x1f] < '\0') {
                        p_Var27 = context->args->filter;
                        if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar345 = ZEXT1664(auVar345._0_16_);
                          auVar392 = ZEXT1664(auVar392._0_16_);
                          (*p_Var27)(&local_a50);
                          fVar384 = (float)local_b00._0_4_;
                          fVar393 = (float)local_b00._4_4_;
                          fVar291 = fStack_af8;
                          fVar302 = fStack_af4;
                          fVar303 = fStack_af0;
                          fVar304 = fStack_aec;
                          fVar305 = fStack_ae8;
                          fVar306 = fStack_ae4;
                        }
                        auVar201 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                        auVar198 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                        auVar141._16_16_ = auVar198;
                        auVar141._0_16_ = auVar201;
                        auVar176._8_4_ = 0xff800000;
                        auVar176._0_8_ = 0xff800000ff800000;
                        auVar176._12_4_ = 0xff800000;
                        auVar176._16_4_ = 0xff800000;
                        auVar176._20_4_ = 0xff800000;
                        auVar176._24_4_ = 0xff800000;
                        auVar176._28_4_ = 0xff800000;
                        auVar128 = vblendvps_avx(auVar176,*(undefined1 (*) [32])
                                                           (local_a50.ray + 0x100),auVar141);
                        *(undefined1 (*) [32])(local_a50.ray + 0x100) = auVar128;
                        auVar128 = local_940 & ~auVar141;
                        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar128 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar128 >> 0x7f,0) != '\0')
                              || (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar128 >> 0xbf,0) != '\0') ||
                            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar128[0x1f] < '\0') {
                          bVar105 = 1;
                          goto LAB_011b1940;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar248;
                    }
                    bVar105 = 0;
                    goto LAB_011b1940;
                  }
                }
                bVar117 = uVar108 < 4;
                uVar108 = uVar108 + 1;
              } while (uVar108 != 5);
              bVar117 = false;
              bVar105 = 5;
LAB_011b1940:
              bVar116 = (bool)(bVar116 | bVar117 & bVar105);
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar137._4_4_ = uVar7;
              auVar137._0_4_ = uVar7;
              auVar137._8_4_ = uVar7;
              auVar137._12_4_ = uVar7;
              auVar137._16_4_ = uVar7;
              auVar137._20_4_ = uVar7;
              auVar137._24_4_ = uVar7;
              auVar137._28_4_ = uVar7;
              auVar175 = vcmpps_avx(_local_880,auVar137,2);
              auVar128 = vandps_avx(auVar175,local_700);
              auVar175 = local_700 & auVar175;
              local_700 = auVar128;
            } while ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar175 >> 0x7f,0) != '\0') ||
                       (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar175 >> 0xbf,0) != '\0') ||
                     (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar175[0x1f] < '\0');
          }
          auVar128 = vandps_avx(local_740,local_720);
          auVar175 = vandps_avx(_local_8c0,_local_8a0);
          auVar266._0_4_ = fVar384 + local_3c0._0_4_;
          auVar266._4_4_ = fVar393 + local_3c0._4_4_;
          auVar266._8_4_ = fVar291 + local_3c0._8_4_;
          auVar266._12_4_ = fVar302 + local_3c0._12_4_;
          auVar266._16_4_ = fVar303 + local_3c0._16_4_;
          auVar266._20_4_ = fVar304 + local_3c0._20_4_;
          auVar266._24_4_ = fVar305 + local_3c0._24_4_;
          auVar266._28_4_ = fVar306 + local_3c0._28_4_;
          auVar28 = vcmpps_avx(auVar266,auVar137,2);
          auVar128 = vandps_avx(auVar28,auVar128);
          auVar267._0_4_ = local_380._0_4_ + fVar384;
          auVar267._4_4_ = local_380._4_4_ + fVar393;
          auVar267._8_4_ = local_380._8_4_ + fVar291;
          auVar267._12_4_ = local_380._12_4_ + fVar302;
          auVar267._16_4_ = local_380._16_4_ + fVar303;
          auVar267._20_4_ = local_380._20_4_ + fVar304;
          auVar267._24_4_ = local_380._24_4_ + fVar305;
          auVar267._28_4_ = local_380._28_4_ + fVar306;
          auVar28 = vcmpps_avx(auVar267,auVar137,2);
          auVar175 = vandps_avx(auVar28,auVar175);
          auVar175 = vorps_avx(auVar128,auVar175);
          if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar175 >> 0x7f,0) != '\0') ||
                (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar175 >> 0xbf,0) != '\0') ||
              (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar175[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar112 * 0x60) = auVar175;
            auVar128 = vblendvps_avx(local_380,_local_3c0,auVar128);
            *(undefined1 (*) [32])(auStack_160 + uVar112 * 0x60) = auVar128;
            uVar8 = vmovlps_avx(local_6b0);
            (&uStack_140)[uVar112 * 0xc] = uVar8;
            aiStack_138[uVar112 * 0x18] = local_ce4 + 1;
            iVar111 = iVar111 + 1;
          }
        }
      }
    }
    if (iVar111 == 0) break;
    uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar134._4_4_ = uVar7;
    auVar134._0_4_ = uVar7;
    auVar134._8_4_ = uVar7;
    auVar134._12_4_ = uVar7;
    auVar134._16_4_ = uVar7;
    auVar134._20_4_ = uVar7;
    auVar134._24_4_ = uVar7;
    auVar134._28_4_ = uVar7;
    uVar106 = -iVar111;
    pauVar107 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar111 - 1) * 0x60);
    while( true ) {
      auVar128 = pauVar107[1];
      auVar168._0_4_ = fVar384 + auVar128._0_4_;
      auVar168._4_4_ = fVar393 + auVar128._4_4_;
      auVar168._8_4_ = fVar291 + auVar128._8_4_;
      auVar168._12_4_ = fVar302 + auVar128._12_4_;
      auVar168._16_4_ = fVar303 + auVar128._16_4_;
      auVar168._20_4_ = fVar304 + auVar128._20_4_;
      auVar168._24_4_ = fVar305 + auVar128._24_4_;
      auVar168._28_4_ = fVar306 + auVar128._28_4_;
      auVar175 = vcmpps_avx(auVar168,auVar134,2);
      _local_6a0 = vandps_avx(auVar175,*pauVar107);
      auVar175 = *pauVar107 & auVar175;
      if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar175 >> 0x7f,0) != '\0') ||
            (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar175 >> 0xbf,0) != '\0') ||
          (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar175[0x1f] < '\0') break;
      pauVar107 = pauVar107 + -3;
      uVar106 = uVar106 + 1;
      if (uVar106 == 0) goto LAB_011b1ea8;
    }
    auVar135._8_4_ = 0x7f800000;
    auVar135._0_8_ = 0x7f8000007f800000;
    auVar135._12_4_ = 0x7f800000;
    auVar135._16_4_ = 0x7f800000;
    auVar135._20_4_ = 0x7f800000;
    auVar135._24_4_ = 0x7f800000;
    auVar135._28_4_ = 0x7f800000;
    auVar128 = vblendvps_avx(auVar135,auVar128,_local_6a0);
    auVar175 = vshufps_avx(auVar128,auVar128,0xb1);
    auVar175 = vminps_avx(auVar128,auVar175);
    auVar28 = vshufpd_avx(auVar175,auVar175,5);
    auVar175 = vminps_avx(auVar175,auVar28);
    auVar28 = vperm2f128_avx(auVar175,auVar175,1);
    auVar175 = vminps_avx(auVar175,auVar28);
    auVar175 = vcmpps_avx(auVar128,auVar175,0);
    auVar28 = _local_6a0 & auVar175;
    auVar128 = _local_6a0;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar28 >> 0x7f,0) != '\0') ||
          (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar28 >> 0xbf,0) != '\0') ||
        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar28[0x1f] < '\0')
    {
      auVar128 = vandps_avx(auVar175,_local_6a0);
    }
    auVar121._8_8_ = 0;
    auVar121._0_8_ = *(ulong *)pauVar107[2];
    local_ce4 = *(uint *)(pauVar107[2] + 8);
    uVar109 = vmovmskps_avx(auVar128);
    uVar110 = 0;
    if (uVar109 != 0) {
      for (; (uVar109 >> uVar110 & 1) == 0; uVar110 = uVar110 + 1) {
      }
    }
    *(undefined4 *)(local_6a0 + (ulong)uVar110 * 4) = 0;
    *pauVar107 = _local_6a0;
    uVar109 = ~uVar106;
    if ((((((((_local_6a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_6a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_6a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_6a0 >> 0x7f,0) != '\0') ||
          (_local_6a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_6a0 >> 0xbf,0) != '\0') ||
        (_local_6a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_6a0[0x1f] < '\0') {
      uVar109 = -uVar106;
    }
    uVar112 = (ulong)uVar109;
    auVar201 = vshufps_avx(auVar121,auVar121,0);
    auVar198 = vshufps_avx(auVar121,auVar121,0x55);
    auVar198 = vsubps_avx(auVar198,auVar201);
    local_3c0._4_4_ = auVar201._4_4_ + auVar198._4_4_ * 0.14285715;
    local_3c0._0_4_ = auVar201._0_4_ + auVar198._0_4_ * 0.0;
    fStack_3b8 = auVar201._8_4_ + auVar198._8_4_ * 0.2857143;
    fStack_3b4 = auVar201._12_4_ + auVar198._12_4_ * 0.42857146;
    fStack_3b0 = auVar201._0_4_ + auVar198._0_4_ * 0.5714286;
    fStack_3ac = auVar201._4_4_ + auVar198._4_4_ * 0.71428573;
    fStack_3a8 = auVar201._8_4_ + auVar198._8_4_ * 0.8571429;
    fStack_3a4 = auVar201._12_4_ + auVar198._12_4_;
    local_6b0._8_8_ = 0;
    local_6b0._0_8_ = *(ulong *)(local_3c0 + (ulong)uVar110 * 4);
  } while( true );
LAB_011b1ea8:
  if (bVar116 != false) {
    return bVar116;
  }
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar143._4_4_ = uVar7;
  auVar143._0_4_ = uVar7;
  auVar143._8_4_ = uVar7;
  auVar143._12_4_ = uVar7;
  auVar143._16_4_ = uVar7;
  auVar143._20_4_ = uVar7;
  auVar143._24_4_ = uVar7;
  auVar143._28_4_ = uVar7;
  auVar128 = vcmpps_avx(local_2e0,auVar143,2);
  uVar106 = vmovmskps_avx(auVar128);
  uVar106 = (uint)local_8c8 - 1 & (uint)local_8c8 & uVar106;
  if (uVar106 == 0) {
    return false;
  }
  goto LAB_011aefa9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }